

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Primitive PVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  __int_type_conflict _Var37;
  RTCFilterFunctionN p_Var38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [24];
  undefined1 auVar143 [28];
  undefined1 auVar144 [28];
  uint uVar145;
  int iVar146;
  ulong uVar147;
  RTCIntersectArguments *pRVar148;
  uint uVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  bool bVar153;
  long lVar154;
  Geometry *pGVar155;
  ulong uVar156;
  long lVar157;
  undefined1 auVar160 [16];
  float fVar159;
  float fVar174;
  float fVar177;
  float fVar179;
  float fVar180;
  undefined1 auVar161 [16];
  float fVar158;
  undefined1 auVar162 [16];
  float fVar173;
  float fVar176;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar175;
  float fVar178;
  float fVar181;
  float fVar185;
  float fVar186;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar187;
  float fVar203;
  float fVar204;
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar205;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar207 [16];
  float fVar206;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar219;
  float fVar220;
  undefined1 auVar213 [32];
  float fVar222;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar224;
  undefined1 auVar217 [32];
  float fVar221;
  float fVar223;
  undefined1 auVar218 [64];
  float fVar225;
  float fVar243;
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar241;
  float fVar242;
  float fVar245;
  float fVar247;
  float fVar250;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar227 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar244;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  float fVar253;
  float fVar254;
  float fVar262;
  float fVar264;
  float fVar266;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar271;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar261 [64];
  float fVar272;
  float fVar282;
  float fVar283;
  undefined1 auVar273 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar274 [32];
  float fVar284;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  float fVar288;
  undefined1 auVar289 [16];
  float fVar295;
  float fVar296;
  undefined1 auVar290 [32];
  float fVar297;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar298;
  float fVar299;
  undefined1 auVar294 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar307 [16];
  float fVar306;
  float fVar316;
  float fVar317;
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar318;
  undefined1 auVar314 [32];
  float fVar319;
  float fVar321;
  float fVar325;
  undefined1 auVar315 [32];
  float fVar326;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar341;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar353;
  float fVar354;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float in_register_0000151c;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar375;
  float fVar383;
  float fVar384;
  float fVar386;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar385;
  float fVar387;
  undefined1 auVar382 [64];
  float fVar388;
  float fVar391;
  float fVar392;
  float fVar393;
  float in_register_0000159c;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar394;
  float fVar398;
  float fVar399;
  float fVar400;
  float in_register_000015dc;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_800;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint local_7e0;
  undefined4 uStack_7dc;
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 (*local_700) [16];
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [4];
  undefined1 auStack_5bc [8];
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar33 = prim[1];
  uVar147 = (ulong)(byte)PVar33;
  lVar151 = uVar147 * 0x25;
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar228 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar228 = vinsertps_avx(auVar228,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar161 = vsubps_avx(auVar161,*(undefined1 (*) [16])(prim + lVar151 + 6));
  fVar225 = *(float *)(prim + lVar151 + 0x12);
  auVar188._0_4_ = fVar225 * auVar161._0_4_;
  auVar188._4_4_ = fVar225 * auVar161._4_4_;
  auVar188._8_4_ = fVar225 * auVar161._8_4_;
  auVar188._12_4_ = fVar225 * auVar161._12_4_;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 4 + 6)));
  auVar273._0_4_ = fVar225 * auVar228._0_4_;
  auVar273._4_4_ = fVar225 * auVar228._4_4_;
  auVar273._8_4_ = fVar225 * auVar228._8_4_;
  auVar273._12_4_ = fVar225 * auVar228._12_4_;
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 4 + 10)));
  auVar163._16_16_ = auVar228;
  auVar163._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar163);
  lVar150 = uVar147 * 5;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar150 + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar150 + 10)));
  auVar213._16_16_ = auVar228;
  auVar213._0_16_ = auVar161;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 6 + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 6 + 10)));
  auVar378 = vcvtdq2ps_avx(auVar213);
  auVar230._16_16_ = auVar228;
  auVar230._0_16_ = auVar161;
  auVar40 = vcvtdq2ps_avx(auVar230);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0xf + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0xf + 10)));
  auVar231._16_16_ = auVar228;
  auVar231._0_16_ = auVar161;
  auVar278 = vcvtdq2ps_avx(auVar231);
  lVar157 = (ulong)(byte)PVar33 * 0x10;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + 10)));
  auVar290._16_16_ = auVar228;
  auVar290._0_16_ = auVar161;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + uVar147 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar290);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar157 + uVar147 + 10)));
  auVar301._16_16_ = auVar228;
  auVar301._0_16_ = auVar161;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1a + 6)));
  auVar42 = vcvtdq2ps_avx(auVar301);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1a + 10)));
  auVar302._16_16_ = auVar228;
  auVar302._0_16_ = auVar161;
  auVar43 = vcvtdq2ps_avx(auVar302);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1b + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1b + 10)));
  auVar327._16_16_ = auVar228;
  auVar327._0_16_ = auVar161;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1c + 6)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 * 0x1c + 10)));
  auVar44 = vcvtdq2ps_avx(auVar327);
  auVar342._16_16_ = auVar228;
  auVar342._0_16_ = auVar161;
  auVar45 = vcvtdq2ps_avx(auVar342);
  auVar161 = vshufps_avx(auVar273,auVar273,0);
  auVar228 = vshufps_avx(auVar273,auVar273,0x55);
  auVar229 = vshufps_avx(auVar273,auVar273,0xaa);
  fVar225 = auVar229._0_4_;
  fVar223 = auVar229._4_4_;
  fVar241 = auVar229._8_4_;
  fVar354 = auVar229._12_4_;
  fVar222 = auVar228._0_4_;
  fVar362 = auVar228._4_4_;
  fVar243 = auVar228._8_4_;
  fVar364 = auVar228._12_4_;
  fVar245 = auVar161._0_4_;
  fVar247 = auVar161._4_4_;
  fVar250 = auVar161._8_4_;
  fVar253 = auVar161._12_4_;
  auVar365._0_4_ = fVar245 * auVar163._0_4_ + fVar222 * auVar378._0_4_ + fVar225 * auVar40._0_4_;
  auVar365._4_4_ = fVar247 * auVar163._4_4_ + fVar362 * auVar378._4_4_ + fVar223 * auVar40._4_4_;
  auVar365._8_4_ = fVar250 * auVar163._8_4_ + fVar243 * auVar378._8_4_ + fVar241 * auVar40._8_4_;
  auVar365._12_4_ = fVar253 * auVar163._12_4_ + fVar364 * auVar378._12_4_ + fVar354 * auVar40._12_4_
  ;
  auVar365._16_4_ = fVar245 * auVar163._16_4_ + fVar222 * auVar378._16_4_ + fVar225 * auVar40._16_4_
  ;
  auVar365._20_4_ = fVar247 * auVar163._20_4_ + fVar362 * auVar378._20_4_ + fVar223 * auVar40._20_4_
  ;
  auVar365._24_4_ = fVar250 * auVar163._24_4_ + fVar243 * auVar378._24_4_ + fVar241 * auVar40._24_4_
  ;
  auVar365._28_4_ = fVar364 + in_register_000015dc + in_register_0000151c;
  auVar355._0_4_ = fVar245 * auVar278._0_4_ + fVar222 * auVar41._0_4_ + auVar42._0_4_ * fVar225;
  auVar355._4_4_ = fVar247 * auVar278._4_4_ + fVar362 * auVar41._4_4_ + auVar42._4_4_ * fVar223;
  auVar355._8_4_ = fVar250 * auVar278._8_4_ + fVar243 * auVar41._8_4_ + auVar42._8_4_ * fVar241;
  auVar355._12_4_ = fVar253 * auVar278._12_4_ + fVar364 * auVar41._12_4_ + auVar42._12_4_ * fVar354;
  auVar355._16_4_ = fVar245 * auVar278._16_4_ + fVar222 * auVar41._16_4_ + auVar42._16_4_ * fVar225;
  auVar355._20_4_ = fVar247 * auVar278._20_4_ + fVar362 * auVar41._20_4_ + auVar42._20_4_ * fVar223;
  auVar355._24_4_ = fVar250 * auVar278._24_4_ + fVar243 * auVar41._24_4_ + auVar42._24_4_ * fVar241;
  auVar355._28_4_ = fVar364 + in_register_000015dc + in_register_0000159c;
  auVar274._0_4_ = fVar245 * auVar43._0_4_ + fVar222 * auVar44._0_4_ + auVar45._0_4_ * fVar225;
  auVar274._4_4_ = fVar247 * auVar43._4_4_ + fVar362 * auVar44._4_4_ + auVar45._4_4_ * fVar223;
  auVar274._8_4_ = fVar250 * auVar43._8_4_ + fVar243 * auVar44._8_4_ + auVar45._8_4_ * fVar241;
  auVar274._12_4_ = fVar253 * auVar43._12_4_ + fVar364 * auVar44._12_4_ + auVar45._12_4_ * fVar354;
  auVar274._16_4_ = fVar245 * auVar43._16_4_ + fVar222 * auVar44._16_4_ + auVar45._16_4_ * fVar225;
  auVar274._20_4_ = fVar247 * auVar43._20_4_ + fVar362 * auVar44._20_4_ + auVar45._20_4_ * fVar223;
  auVar274._24_4_ = fVar250 * auVar43._24_4_ + fVar243 * auVar44._24_4_ + auVar45._24_4_ * fVar241;
  auVar274._28_4_ = fVar253 + fVar364 + fVar354;
  auVar161 = vshufps_avx(auVar188,auVar188,0);
  auVar228 = vshufps_avx(auVar188,auVar188,0x55);
  auVar229 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar225 = auVar229._0_4_;
  fVar223 = auVar229._4_4_;
  fVar241 = auVar229._8_4_;
  fVar354 = auVar229._12_4_;
  fVar247 = auVar228._0_4_;
  fVar250 = auVar228._4_4_;
  fVar253 = auVar228._8_4_;
  fVar262 = auVar228._12_4_;
  fVar222 = auVar378._28_4_ + auVar40._28_4_;
  fVar362 = auVar161._0_4_;
  fVar243 = auVar161._4_4_;
  fVar364 = auVar161._8_4_;
  fVar245 = auVar161._12_4_;
  auVar194._0_4_ = fVar362 * auVar163._0_4_ + fVar247 * auVar378._0_4_ + fVar225 * auVar40._0_4_;
  auVar194._4_4_ = fVar243 * auVar163._4_4_ + fVar250 * auVar378._4_4_ + fVar223 * auVar40._4_4_;
  auVar194._8_4_ = fVar364 * auVar163._8_4_ + fVar253 * auVar378._8_4_ + fVar241 * auVar40._8_4_;
  auVar194._12_4_ = fVar245 * auVar163._12_4_ + fVar262 * auVar378._12_4_ + fVar354 * auVar40._12_4_
  ;
  auVar194._16_4_ = fVar362 * auVar163._16_4_ + fVar247 * auVar378._16_4_ + fVar225 * auVar40._16_4_
  ;
  auVar194._20_4_ = fVar243 * auVar163._20_4_ + fVar250 * auVar378._20_4_ + fVar223 * auVar40._20_4_
  ;
  auVar194._24_4_ = fVar364 * auVar163._24_4_ + fVar253 * auVar378._24_4_ + fVar241 * auVar40._24_4_
  ;
  auVar194._28_4_ = auVar163._28_4_ + fVar222;
  auVar164._0_4_ = fVar362 * auVar278._0_4_ + auVar42._0_4_ * fVar225 + fVar247 * auVar41._0_4_;
  auVar164._4_4_ = fVar243 * auVar278._4_4_ + auVar42._4_4_ * fVar223 + fVar250 * auVar41._4_4_;
  auVar164._8_4_ = fVar364 * auVar278._8_4_ + auVar42._8_4_ * fVar241 + fVar253 * auVar41._8_4_;
  auVar164._12_4_ = fVar245 * auVar278._12_4_ + auVar42._12_4_ * fVar354 + fVar262 * auVar41._12_4_;
  auVar164._16_4_ = fVar362 * auVar278._16_4_ + auVar42._16_4_ * fVar225 + fVar247 * auVar41._16_4_;
  auVar164._20_4_ = fVar243 * auVar278._20_4_ + auVar42._20_4_ * fVar223 + fVar250 * auVar41._20_4_;
  auVar164._24_4_ = fVar364 * auVar278._24_4_ + auVar42._24_4_ * fVar241 + fVar253 * auVar41._24_4_;
  auVar164._28_4_ = auVar163._28_4_ + auVar42._28_4_ + auVar40._28_4_;
  auVar308._8_4_ = 0x7fffffff;
  auVar308._0_8_ = 0x7fffffff7fffffff;
  auVar308._12_4_ = 0x7fffffff;
  auVar308._16_4_ = 0x7fffffff;
  auVar308._20_4_ = 0x7fffffff;
  auVar308._24_4_ = 0x7fffffff;
  auVar308._28_4_ = 0x7fffffff;
  auVar232._8_4_ = 0x219392ef;
  auVar232._0_8_ = 0x219392ef219392ef;
  auVar232._12_4_ = 0x219392ef;
  auVar232._16_4_ = 0x219392ef;
  auVar232._20_4_ = 0x219392ef;
  auVar232._24_4_ = 0x219392ef;
  auVar232._28_4_ = 0x219392ef;
  auVar163 = vandps_avx(auVar365,auVar308);
  auVar163 = vcmpps_avx(auVar163,auVar232,1);
  auVar378 = vblendvps_avx(auVar365,auVar232,auVar163);
  auVar163 = vandps_avx(auVar355,auVar308);
  auVar163 = vcmpps_avx(auVar163,auVar232,1);
  auVar40 = vblendvps_avx(auVar355,auVar232,auVar163);
  auVar163 = vandps_avx(auVar308,auVar274);
  auVar163 = vcmpps_avx(auVar163,auVar232,1);
  auVar163 = vblendvps_avx(auVar274,auVar232,auVar163);
  auVar214._0_4_ = fVar362 * auVar43._0_4_ + fVar247 * auVar44._0_4_ + auVar45._0_4_ * fVar225;
  auVar214._4_4_ = fVar243 * auVar43._4_4_ + fVar250 * auVar44._4_4_ + auVar45._4_4_ * fVar223;
  auVar214._8_4_ = fVar364 * auVar43._8_4_ + fVar253 * auVar44._8_4_ + auVar45._8_4_ * fVar241;
  auVar214._12_4_ = fVar245 * auVar43._12_4_ + fVar262 * auVar44._12_4_ + auVar45._12_4_ * fVar354;
  auVar214._16_4_ = fVar362 * auVar43._16_4_ + fVar247 * auVar44._16_4_ + auVar45._16_4_ * fVar225;
  auVar214._20_4_ = fVar243 * auVar43._20_4_ + fVar250 * auVar44._20_4_ + auVar45._20_4_ * fVar223;
  auVar214._24_4_ = fVar364 * auVar43._24_4_ + fVar253 * auVar44._24_4_ + auVar45._24_4_ * fVar241;
  auVar214._28_4_ = fVar222 + auVar41._28_4_ + fVar354;
  auVar278 = vrcpps_avx(auVar378);
  fVar225 = auVar278._0_4_;
  fVar241 = auVar278._4_4_;
  auVar41._4_4_ = auVar378._4_4_ * fVar241;
  auVar41._0_4_ = auVar378._0_4_ * fVar225;
  fVar222 = auVar278._8_4_;
  auVar41._8_4_ = auVar378._8_4_ * fVar222;
  fVar243 = auVar278._12_4_;
  auVar41._12_4_ = auVar378._12_4_ * fVar243;
  fVar245 = auVar278._16_4_;
  auVar41._16_4_ = auVar378._16_4_ * fVar245;
  fVar247 = auVar278._20_4_;
  auVar41._20_4_ = auVar378._20_4_ * fVar247;
  fVar250 = auVar278._24_4_;
  auVar41._24_4_ = auVar378._24_4_ * fVar250;
  auVar41._28_4_ = auVar378._28_4_;
  auVar309._8_4_ = 0x3f800000;
  auVar309._0_8_ = 0x3f8000003f800000;
  auVar309._12_4_ = 0x3f800000;
  auVar309._16_4_ = 0x3f800000;
  auVar309._20_4_ = 0x3f800000;
  auVar309._24_4_ = 0x3f800000;
  auVar309._28_4_ = 0x3f800000;
  auVar42 = vsubps_avx(auVar309,auVar41);
  auVar41 = vrcpps_avx(auVar40);
  fVar225 = fVar225 + fVar225 * auVar42._0_4_;
  fVar241 = fVar241 + fVar241 * auVar42._4_4_;
  fVar222 = fVar222 + fVar222 * auVar42._8_4_;
  fVar243 = fVar243 + fVar243 * auVar42._12_4_;
  fVar245 = fVar245 + fVar245 * auVar42._16_4_;
  fVar247 = fVar247 + fVar247 * auVar42._20_4_;
  fVar250 = fVar250 + fVar250 * auVar42._24_4_;
  fVar253 = auVar41._0_4_;
  fVar262 = auVar41._4_4_;
  auVar378._4_4_ = fVar262 * auVar40._4_4_;
  auVar378._0_4_ = fVar253 * auVar40._0_4_;
  fVar264 = auVar41._8_4_;
  auVar378._8_4_ = fVar264 * auVar40._8_4_;
  fVar266 = auVar41._12_4_;
  auVar378._12_4_ = fVar266 * auVar40._12_4_;
  fVar268 = auVar41._16_4_;
  auVar378._16_4_ = fVar268 * auVar40._16_4_;
  fVar269 = auVar41._20_4_;
  auVar378._20_4_ = fVar269 * auVar40._20_4_;
  fVar270 = auVar41._24_4_;
  auVar378._24_4_ = fVar270 * auVar40._24_4_;
  auVar378._28_4_ = auVar42._28_4_;
  auVar40 = vsubps_avx(auVar309,auVar378);
  fVar253 = fVar253 + fVar253 * auVar40._0_4_;
  fVar262 = fVar262 + fVar262 * auVar40._4_4_;
  fVar264 = fVar264 + fVar264 * auVar40._8_4_;
  fVar266 = fVar266 + fVar266 * auVar40._12_4_;
  fVar268 = fVar268 + fVar268 * auVar40._16_4_;
  fVar269 = fVar269 + fVar269 * auVar40._20_4_;
  fVar270 = fVar270 + fVar270 * auVar40._24_4_;
  auVar378 = vrcpps_avx(auVar163);
  fVar272 = auVar378._0_4_;
  fVar282 = auVar378._4_4_;
  auVar43._4_4_ = fVar282 * auVar163._4_4_;
  auVar43._0_4_ = fVar272 * auVar163._0_4_;
  fVar283 = auVar378._8_4_;
  auVar43._8_4_ = fVar283 * auVar163._8_4_;
  fVar284 = auVar378._12_4_;
  auVar43._12_4_ = fVar284 * auVar163._12_4_;
  fVar285 = auVar378._16_4_;
  auVar43._16_4_ = fVar285 * auVar163._16_4_;
  fVar286 = auVar378._20_4_;
  auVar43._20_4_ = fVar286 * auVar163._20_4_;
  fVar287 = auVar378._24_4_;
  auVar43._24_4_ = fVar287 * auVar163._24_4_;
  auVar43._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar309,auVar43);
  fVar272 = fVar272 + fVar272 * auVar163._0_4_;
  fVar282 = fVar282 + fVar282 * auVar163._4_4_;
  fVar283 = fVar283 + fVar283 * auVar163._8_4_;
  fVar284 = fVar284 + fVar284 * auVar163._12_4_;
  fVar285 = fVar285 + fVar285 * auVar163._16_4_;
  fVar286 = fVar286 + fVar286 * auVar163._20_4_;
  fVar287 = fVar287 + fVar287 * auVar163._24_4_;
  auVar161 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar151 + 0x16)) *
                           *(float *)(prim + lVar151 + 0x1a)));
  auVar46 = vshufps_avx(auVar161,auVar161,0);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar147 * 7 + 6);
  auVar161 = vpmovsxwd_avx(auVar161);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar147 * 7 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar228);
  auVar303._16_16_ = auVar228;
  auVar303._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar303);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar147 * 0xb + 6);
  auVar161 = vpmovsxwd_avx(auVar229);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar147 * 0xb + 0xe);
  auVar228 = vpmovsxwd_avx(auVar13);
  auVar310._16_16_ = auVar228;
  auVar310._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar310);
  auVar378 = vsubps_avx(auVar378,auVar163);
  fVar223 = auVar46._0_4_;
  fVar354 = auVar46._4_4_;
  fVar362 = auVar46._8_4_;
  fVar364 = auVar46._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar147 * 9 + 6);
  auVar161 = vpmovsxwd_avx(auVar46);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar147 * 9 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar14);
  auVar304._0_4_ = auVar378._0_4_ * fVar223 + auVar163._0_4_;
  auVar304._4_4_ = auVar378._4_4_ * fVar354 + auVar163._4_4_;
  auVar304._8_4_ = auVar378._8_4_ * fVar362 + auVar163._8_4_;
  auVar304._12_4_ = auVar378._12_4_ * fVar364 + auVar163._12_4_;
  auVar304._16_4_ = auVar378._16_4_ * fVar223 + auVar163._16_4_;
  auVar304._20_4_ = auVar378._20_4_ * fVar354 + auVar163._20_4_;
  auVar304._24_4_ = auVar378._24_4_ * fVar362 + auVar163._24_4_;
  auVar304._28_4_ = auVar378._28_4_ + auVar163._28_4_;
  auVar311._16_16_ = auVar228;
  auVar311._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar311);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar147 * 0xd + 6);
  auVar161 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar147 * 0xd + 0xe);
  auVar228 = vpmovsxwd_avx(auVar16);
  auVar328._16_16_ = auVar228;
  auVar328._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar328);
  auVar378 = vsubps_avx(auVar378,auVar163);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar147 * 0x12 + 6);
  auVar161 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar147 * 0x12 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar18);
  auVar312._0_4_ = auVar163._0_4_ + auVar378._0_4_ * fVar223;
  auVar312._4_4_ = auVar163._4_4_ + auVar378._4_4_ * fVar354;
  auVar312._8_4_ = auVar163._8_4_ + auVar378._8_4_ * fVar362;
  auVar312._12_4_ = auVar163._12_4_ + auVar378._12_4_ * fVar364;
  auVar312._16_4_ = auVar163._16_4_ + auVar378._16_4_ * fVar223;
  auVar312._20_4_ = auVar163._20_4_ + auVar378._20_4_ * fVar354;
  auVar312._24_4_ = auVar163._24_4_ + auVar378._24_4_ * fVar362;
  auVar312._28_4_ = auVar163._28_4_ + auVar378._28_4_;
  auVar329._16_16_ = auVar228;
  auVar329._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar329);
  uVar156 = (ulong)(uint)((int)lVar150 << 2);
  lVar151 = uVar147 * 2 + uVar156;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar161 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar20);
  auVar343._16_16_ = auVar228;
  auVar343._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar343);
  auVar378 = vsubps_avx(auVar378,auVar163);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar156 + 6);
  auVar161 = vpmovsxwd_avx(auVar21);
  auVar330._0_4_ = auVar163._0_4_ + auVar378._0_4_ * fVar223;
  auVar330._4_4_ = auVar163._4_4_ + auVar378._4_4_ * fVar354;
  auVar330._8_4_ = auVar163._8_4_ + auVar378._8_4_ * fVar362;
  auVar330._12_4_ = auVar163._12_4_ + auVar378._12_4_ * fVar364;
  auVar330._16_4_ = auVar163._16_4_ + auVar378._16_4_ * fVar223;
  auVar330._20_4_ = auVar163._20_4_ + auVar378._20_4_ * fVar354;
  auVar330._24_4_ = auVar163._24_4_ + auVar378._24_4_ * fVar362;
  auVar330._28_4_ = auVar163._28_4_ + auVar378._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar156 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar22);
  auVar344._16_16_ = auVar228;
  auVar344._0_16_ = auVar161;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar147 * 0x18 + 6);
  auVar161 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar147 * 0x18 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar24);
  auVar163 = vcvtdq2ps_avx(auVar344);
  auVar356._16_16_ = auVar228;
  auVar356._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar356);
  auVar378 = vsubps_avx(auVar378,auVar163);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar147 * 0x1d + 6);
  auVar161 = vpmovsxwd_avx(auVar25);
  auVar345._0_4_ = auVar163._0_4_ + auVar378._0_4_ * fVar223;
  auVar345._4_4_ = auVar163._4_4_ + auVar378._4_4_ * fVar354;
  auVar345._8_4_ = auVar163._8_4_ + auVar378._8_4_ * fVar362;
  auVar345._12_4_ = auVar163._12_4_ + auVar378._12_4_ * fVar364;
  auVar345._16_4_ = auVar163._16_4_ + auVar378._16_4_ * fVar223;
  auVar345._20_4_ = auVar163._20_4_ + auVar378._20_4_ * fVar354;
  auVar345._24_4_ = auVar163._24_4_ + auVar378._24_4_ * fVar362;
  auVar345._28_4_ = auVar163._28_4_ + auVar378._28_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar147 * 0x1d + 0xe);
  auVar228 = vpmovsxwd_avx(auVar26);
  auVar357._16_16_ = auVar228;
  auVar357._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar357);
  lVar151 = uVar147 + (ulong)(byte)PVar33 * 0x20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar161 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar28);
  auVar366._16_16_ = auVar228;
  auVar366._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar366);
  auVar378 = vsubps_avx(auVar378,auVar163);
  auVar358._0_4_ = auVar163._0_4_ + auVar378._0_4_ * fVar223;
  auVar358._4_4_ = auVar163._4_4_ + auVar378._4_4_ * fVar354;
  auVar358._8_4_ = auVar163._8_4_ + auVar378._8_4_ * fVar362;
  auVar358._12_4_ = auVar163._12_4_ + auVar378._12_4_ * fVar364;
  auVar358._16_4_ = auVar163._16_4_ + auVar378._16_4_ * fVar223;
  auVar358._20_4_ = auVar163._20_4_ + auVar378._20_4_ * fVar354;
  auVar358._24_4_ = auVar163._24_4_ + auVar378._24_4_ * fVar362;
  auVar358._28_4_ = auVar163._28_4_ + auVar378._28_4_;
  lVar151 = (ulong)(byte)PVar33 * 0x20 - uVar147;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar161 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar30);
  auVar367._16_16_ = auVar228;
  auVar367._0_16_ = auVar161;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar147 * 0x23 + 6);
  auVar161 = vpmovsxwd_avx(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar147 * 0x23 + 0xe);
  auVar228 = vpmovsxwd_avx(auVar32);
  auVar376._16_16_ = auVar228;
  auVar376._0_16_ = auVar161;
  auVar163 = vcvtdq2ps_avx(auVar367);
  auVar378 = vcvtdq2ps_avx(auVar376);
  auVar378 = vsubps_avx(auVar378,auVar163);
  auVar368._0_4_ = auVar163._0_4_ + auVar378._0_4_ * fVar223;
  auVar368._4_4_ = auVar163._4_4_ + auVar378._4_4_ * fVar354;
  auVar368._8_4_ = auVar163._8_4_ + auVar378._8_4_ * fVar362;
  auVar368._12_4_ = auVar163._12_4_ + auVar378._12_4_ * fVar364;
  auVar368._16_4_ = auVar163._16_4_ + auVar378._16_4_ * fVar223;
  auVar368._20_4_ = auVar163._20_4_ + auVar378._20_4_ * fVar354;
  auVar368._24_4_ = auVar163._24_4_ + auVar378._24_4_ * fVar362;
  auVar368._28_4_ = auVar163._28_4_ + fVar364;
  auVar163 = vsubps_avx(auVar304,auVar194);
  auVar289._0_4_ = fVar225 * auVar163._0_4_;
  auVar289._4_4_ = fVar241 * auVar163._4_4_;
  auVar289._8_4_ = fVar222 * auVar163._8_4_;
  auVar289._12_4_ = fVar243 * auVar163._12_4_;
  auVar44._16_4_ = fVar245 * auVar163._16_4_;
  auVar44._0_16_ = auVar289;
  auVar44._20_4_ = fVar247 * auVar163._20_4_;
  auVar44._24_4_ = fVar250 * auVar163._24_4_;
  auVar44._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar312,auVar194);
  auVar226._0_4_ = fVar225 * auVar163._0_4_;
  auVar226._4_4_ = fVar241 * auVar163._4_4_;
  auVar226._8_4_ = fVar222 * auVar163._8_4_;
  auVar226._12_4_ = fVar243 * auVar163._12_4_;
  auVar45._16_4_ = fVar245 * auVar163._16_4_;
  auVar45._0_16_ = auVar226;
  auVar45._20_4_ = fVar247 * auVar163._20_4_;
  auVar45._24_4_ = fVar250 * auVar163._24_4_;
  auVar45._28_4_ = auVar278._28_4_ + auVar42._28_4_;
  auVar163 = vsubps_avx(auVar330,auVar164);
  auVar189._0_4_ = fVar253 * auVar163._0_4_;
  auVar189._4_4_ = fVar262 * auVar163._4_4_;
  auVar189._8_4_ = fVar264 * auVar163._8_4_;
  auVar189._12_4_ = fVar266 * auVar163._12_4_;
  auVar278._16_4_ = fVar268 * auVar163._16_4_;
  auVar278._0_16_ = auVar189;
  auVar278._20_4_ = fVar269 * auVar163._20_4_;
  auVar278._24_4_ = fVar270 * auVar163._24_4_;
  auVar278._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar345,auVar164);
  auVar255._0_4_ = fVar253 * auVar163._0_4_;
  auVar255._4_4_ = fVar262 * auVar163._4_4_;
  auVar255._8_4_ = fVar264 * auVar163._8_4_;
  auVar255._12_4_ = fVar266 * auVar163._12_4_;
  auVar42._16_4_ = fVar268 * auVar163._16_4_;
  auVar42._0_16_ = auVar255;
  auVar42._20_4_ = fVar269 * auVar163._20_4_;
  auVar42._24_4_ = fVar270 * auVar163._24_4_;
  auVar42._28_4_ = auVar41._28_4_ + auVar40._28_4_;
  auVar163 = vsubps_avx(auVar358,auVar214);
  auVar160._0_4_ = fVar272 * auVar163._0_4_;
  auVar160._4_4_ = fVar282 * auVar163._4_4_;
  auVar160._8_4_ = fVar283 * auVar163._8_4_;
  auVar160._12_4_ = fVar284 * auVar163._12_4_;
  auVar40._16_4_ = fVar285 * auVar163._16_4_;
  auVar40._0_16_ = auVar160;
  auVar40._20_4_ = fVar286 * auVar163._20_4_;
  auVar40._24_4_ = fVar287 * auVar163._24_4_;
  auVar40._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar368,auVar214);
  auVar207._0_4_ = fVar272 * auVar163._0_4_;
  auVar207._4_4_ = fVar282 * auVar163._4_4_;
  auVar207._8_4_ = fVar283 * auVar163._8_4_;
  auVar207._12_4_ = fVar284 * auVar163._12_4_;
  auVar47._16_4_ = fVar285 * auVar163._16_4_;
  auVar47._0_16_ = auVar207;
  auVar47._20_4_ = fVar286 * auVar163._20_4_;
  auVar47._24_4_ = fVar287 * auVar163._24_4_;
  auVar47._28_4_ = auVar163._28_4_;
  auVar161 = vpminsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar228 = vpminsd_avx(auVar289,auVar226);
  auVar313._16_16_ = auVar161;
  auVar313._0_16_ = auVar228;
  auVar161 = vpminsd_avx(auVar278._16_16_,auVar42._16_16_);
  auVar228 = vpminsd_avx(auVar189,auVar255);
  auVar359._16_16_ = auVar161;
  auVar359._0_16_ = auVar228;
  auVar163 = vmaxps_avx(auVar313,auVar359);
  auVar161 = vpminsd_avx(auVar40._16_16_,auVar47._16_16_);
  auVar228 = vpminsd_avx(auVar160,auVar207);
  auVar377._16_16_ = auVar161;
  auVar377._0_16_ = auVar228;
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar389._4_4_ = uVar12;
  auVar389._0_4_ = uVar12;
  auVar389._8_4_ = uVar12;
  auVar389._12_4_ = uVar12;
  auVar389._16_4_ = uVar12;
  auVar389._20_4_ = uVar12;
  auVar389._24_4_ = uVar12;
  auVar389._28_4_ = uVar12;
  auVar378 = vmaxps_avx(auVar377,auVar389);
  auVar163 = vmaxps_avx(auVar163,auVar378);
  local_80._4_4_ = auVar163._4_4_ * 0.99999964;
  local_80._0_4_ = auVar163._0_4_ * 0.99999964;
  local_80._8_4_ = auVar163._8_4_ * 0.99999964;
  local_80._12_4_ = auVar163._12_4_ * 0.99999964;
  local_80._16_4_ = auVar163._16_4_ * 0.99999964;
  local_80._20_4_ = auVar163._20_4_ * 0.99999964;
  local_80._24_4_ = auVar163._24_4_ * 0.99999964;
  local_80._28_4_ = auVar163._28_4_;
  auVar161 = vpmaxsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar228 = vpmaxsd_avx(auVar289,auVar226);
  auVar233._16_16_ = auVar161;
  auVar233._0_16_ = auVar228;
  auVar161 = vpmaxsd_avx(auVar278._16_16_,auVar42._16_16_);
  auVar228 = vpmaxsd_avx(auVar189,auVar255);
  auVar195._16_16_ = auVar161;
  auVar195._0_16_ = auVar228;
  auVar163 = vminps_avx(auVar233,auVar195);
  auVar161 = vpmaxsd_avx(auVar40._16_16_,auVar47._16_16_);
  auVar228 = vpmaxsd_avx(auVar160,auVar207);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar215._4_4_ = uVar12;
  auVar215._0_4_ = uVar12;
  auVar215._8_4_ = uVar12;
  auVar215._12_4_ = uVar12;
  auVar215._16_4_ = uVar12;
  auVar215._20_4_ = uVar12;
  auVar215._24_4_ = uVar12;
  auVar215._28_4_ = uVar12;
  auVar165._16_16_ = auVar161;
  auVar165._0_16_ = auVar228;
  auVar378 = vminps_avx(auVar165,auVar215);
  auVar163 = vminps_avx(auVar163,auVar378);
  auVar39._4_4_ = auVar163._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar163._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar163._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar163._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar163._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar163._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar163._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar163._28_4_;
  auVar163 = vcmpps_avx(local_80,auVar39,2);
  auVar161 = vpshufd_avx(ZEXT116((byte)PVar33),0);
  auVar196._16_16_ = auVar161;
  auVar196._0_16_ = auVar161;
  auVar378 = vcvtdq2ps_avx(auVar196);
  auVar378 = vcmpps_avx(_DAT_01faff40,auVar378,1);
  auVar163 = vandps_avx(auVar163,auVar378);
  uVar145 = vmovmskps_avx(auVar163);
  if (uVar145 != 0) {
    uVar145 = uVar145 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_530 = pre->ray_space + k;
    local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_6f8 = pre;
    local_528 = prim;
    do {
      lVar151 = 0;
      if (uVar145 != 0) {
        for (; (uVar145 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
        }
      }
      uVar34 = *(uint *)(local_528 + 2);
      local_7a8 = (ulong)uVar34;
      uVar35 = *(uint *)(local_528 + lVar151 * 4 + 6);
      pGVar155 = (context->scene->geometries).items[local_7a8].ptr;
      local_660._0_8_ = CONCAT44(0,uVar35);
      uVar147 = (ulong)*(uint *)(*(long *)&pGVar155->field_0x58 +
                                CONCAT44(0,uVar35) *
                                pGVar155[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar225 = (pGVar155->time_range).lower;
      fVar225 = pGVar155->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar225) /
                ((pGVar155->time_range).upper - fVar225));
      auVar161 = vroundss_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),9);
      auVar161 = vminss_avx(auVar161,ZEXT416((uint)(pGVar155->fnumTimeSegments + -1.0)));
      auVar161 = vmaxss_avx(ZEXT816(0) << 0x20,auVar161);
      fVar225 = fVar225 - auVar161._0_4_;
      _Var37 = pGVar155[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar152 = (long)(int)auVar161._0_4_ * 0x38;
      lVar151 = *(long *)(_Var37 + 0x10 + lVar152);
      lVar150 = *(long *)(_Var37 + 0x38 + lVar152);
      lVar157 = *(long *)(_Var37 + 0x48 + lVar152);
      auVar161 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
      pfVar1 = (float *)(lVar150 + uVar147 * lVar157);
      fVar223 = auVar161._0_4_;
      fVar241 = auVar161._4_4_;
      fVar354 = auVar161._8_4_;
      fVar222 = auVar161._12_4_;
      pfVar2 = (float *)(lVar150 + (uVar147 + 1) * lVar157);
      lVar154 = (uVar147 + 2) * lVar157;
      pfVar3 = (float *)(lVar150 + lVar154);
      pfVar4 = (float *)(lVar150 + lVar157 * (uVar147 + 3));
      lVar150 = *(long *)(_Var37 + lVar152);
      auVar161 = vshufps_avx(ZEXT416((uint)(1.0 - fVar225)),ZEXT416((uint)(1.0 - fVar225)),0);
      pfVar5 = (float *)(lVar150 + lVar151 * uVar147);
      fVar225 = auVar161._0_4_;
      fVar362 = auVar161._4_4_;
      fVar243 = auVar161._8_4_;
      fVar364 = auVar161._12_4_;
      pfVar6 = (float *)(lVar150 + lVar151 * (uVar147 + 1));
      pfVar7 = (float *)(lVar150 + lVar151 * (uVar147 + 2));
      pfVar8 = (float *)(lVar150 + lVar151 * (uVar147 + 3));
      uVar36 = (uint)pGVar155[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar151 = (long)(int)uVar36 * 0x44;
      local_710 = (undefined1  [8])
                  CONCAT44(fVar241 * pfVar1[1] + fVar362 * pfVar5[1],
                           fVar223 * *pfVar1 + fVar225 * *pfVar5);
      uStack_708._0_4_ = fVar354 * pfVar1[2] + fVar243 * pfVar5[2];
      uStack_708._4_4_ = fVar222 * pfVar1[3] + fVar364 * pfVar5[3];
      local_630 = (undefined1  [8])
                  CONCAT44(fVar362 * pfVar6[1] + fVar241 * pfVar2[1],
                           fVar225 * *pfVar6 + fVar223 * *pfVar2);
      uStack_628._0_4_ = fVar243 * pfVar6[2] + fVar354 * pfVar2[2];
      uStack_628._4_4_ = fVar364 * pfVar6[3] + fVar222 * pfVar2[3];
      local_640 = (undefined1  [8])
                  CONCAT44(fVar362 * pfVar7[1] + fVar241 * pfVar3[1],
                           fVar225 * *pfVar7 + fVar223 * *pfVar3);
      uStack_638._0_4_ = fVar243 * pfVar7[2] + fVar354 * pfVar3[2];
      uStack_638._4_4_ = fVar364 * pfVar7[3] + fVar222 * pfVar3[3];
      local_650._0_4_ = fVar225 * *pfVar8 + fVar223 * *pfVar4;
      local_650._4_4_ = fVar362 * pfVar8[1] + fVar241 * pfVar4[1];
      fStack_648 = fVar243 * pfVar8[2] + fVar354 * pfVar4[2];
      fStack_644 = fVar364 * pfVar8[3] + fVar222 * pfVar4[3];
      auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar13 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar229 = vsubps_avx(_local_710,auVar13);
      auVar161 = vshufps_avx(auVar229,auVar229,0);
      auVar228 = vshufps_avx(auVar229,auVar229,0x55);
      auVar229 = vshufps_avx(auVar229,auVar229,0xaa);
      fVar225 = (local_530->vx).field_0.m128[0];
      fVar223 = (local_530->vx).field_0.m128[1];
      fVar241 = (local_530->vx).field_0.m128[2];
      fVar354 = (local_530->vx).field_0.m128[3];
      fVar222 = (local_530->vy).field_0.m128[0];
      fVar362 = (local_530->vy).field_0.m128[1];
      fVar243 = (local_530->vy).field_0.m128[2];
      fVar364 = (local_530->vy).field_0.m128[3];
      fVar245 = (local_530->vz).field_0.m128[0];
      fVar247 = (local_530->vz).field_0.m128[1];
      fVar250 = (local_530->vz).field_0.m128[2];
      fVar253 = (local_530->vz).field_0.m128[3];
      auVar227._0_8_ =
           CONCAT44(auVar161._4_4_ * fVar223 + auVar228._4_4_ * fVar362 + fVar247 * auVar229._4_4_,
                    auVar161._0_4_ * fVar225 + auVar228._0_4_ * fVar222 + fVar245 * auVar229._0_4_);
      auVar227._8_4_ =
           auVar161._8_4_ * fVar241 + auVar228._8_4_ * fVar243 + fVar250 * auVar229._8_4_;
      auVar227._12_4_ =
           auVar161._12_4_ * fVar354 + auVar228._12_4_ * fVar364 + fVar253 * auVar229._12_4_;
      auVar161 = vblendps_avx(auVar227,_local_710,8);
      auVar46 = vsubps_avx(_local_630,auVar13);
      auVar228 = vshufps_avx(auVar46,auVar46,0);
      auVar229 = vshufps_avx(auVar46,auVar46,0x55);
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar300._0_4_ = auVar228._0_4_ * fVar225 + auVar229._0_4_ * fVar222 + fVar245 * auVar46._0_4_
      ;
      auVar300._4_4_ = auVar228._4_4_ * fVar223 + auVar229._4_4_ * fVar362 + fVar247 * auVar46._4_4_
      ;
      auVar300._8_4_ = auVar228._8_4_ * fVar241 + auVar229._8_4_ * fVar243 + fVar250 * auVar46._8_4_
      ;
      auVar300._12_4_ =
           auVar228._12_4_ * fVar354 + auVar229._12_4_ * fVar364 + fVar253 * auVar46._12_4_;
      auVar228 = vblendps_avx(auVar300,_local_630,8);
      auVar14 = vsubps_avx(_local_640,auVar13);
      auVar229 = vshufps_avx(auVar14,auVar14,0);
      auVar46 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar307._0_4_ = auVar229._0_4_ * fVar225 + auVar46._0_4_ * fVar222 + auVar14._0_4_ * fVar245;
      auVar307._4_4_ = auVar229._4_4_ * fVar223 + auVar46._4_4_ * fVar362 + auVar14._4_4_ * fVar247;
      auVar307._8_4_ = auVar229._8_4_ * fVar241 + auVar46._8_4_ * fVar243 + auVar14._8_4_ * fVar250;
      auVar307._12_4_ =
           auVar229._12_4_ * fVar354 + auVar46._12_4_ * fVar364 + auVar14._12_4_ * fVar253;
      auVar229 = vblendps_avx(auVar307,_local_640,8);
      auVar14 = vsubps_avx(_local_650,auVar13);
      auVar13 = vshufps_avx(auVar14,auVar14,0);
      auVar46 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar190._0_4_ = auVar13._0_4_ * fVar225 + auVar46._0_4_ * fVar222 + fVar245 * auVar14._0_4_;
      auVar190._4_4_ = auVar13._4_4_ * fVar223 + auVar46._4_4_ * fVar362 + fVar247 * auVar14._4_4_;
      auVar190._8_4_ = auVar13._8_4_ * fVar241 + auVar46._8_4_ * fVar243 + fVar250 * auVar14._8_4_;
      auVar190._12_4_ =
           auVar13._12_4_ * fVar354 + auVar46._12_4_ * fVar364 + fVar253 * auVar14._12_4_;
      auVar13 = vblendps_avx(auVar190,_local_650,8);
      auVar256._8_4_ = 0x7fffffff;
      auVar256._0_8_ = 0x7fffffff7fffffff;
      auVar256._12_4_ = 0x7fffffff;
      auVar161 = vandps_avx(auVar161,auVar256);
      auVar228 = vandps_avx(auVar228,auVar256);
      auVar46 = vmaxps_avx(auVar161,auVar228);
      auVar161 = vandps_avx(auVar229,auVar256);
      auVar228 = vandps_avx(auVar13,auVar256);
      auVar161 = vmaxps_avx(auVar161,auVar228);
      auVar161 = vmaxps_avx(auVar46,auVar161);
      auVar228 = vmovshdup_avx(auVar161);
      auVar228 = vmaxss_avx(auVar228,auVar161);
      auVar161 = vshufpd_avx(auVar161,auVar161,1);
      auVar161 = vmaxss_avx(auVar161,auVar228);
      fVar266 = *(float *)(catmullrom_basis0 + lVar151 + 0x908);
      fVar268 = *(float *)(catmullrom_basis0 + lVar151 + 0x90c);
      fVar269 = *(float *)(catmullrom_basis0 + lVar151 + 0x910);
      fVar270 = *(float *)(catmullrom_basis0 + lVar151 + 0x914);
      fVar272 = *(float *)(catmullrom_basis0 + lVar151 + 0x918);
      fVar282 = *(float *)(catmullrom_basis0 + lVar151 + 0x91c);
      fVar283 = *(float *)(catmullrom_basis0 + lVar151 + 0x920);
      auVar228 = vshufps_avx(auVar307,auVar307,0);
      register0x00001250 = auVar228;
      _local_6a0 = auVar228;
      auVar229 = vshufps_avx(auVar307,auVar307,0x55);
      fVar225 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0xd8c);
      fVar223 = *(float *)(catmullrom_basis0 + lVar151 + 0xd90);
      fVar241 = *(float *)(catmullrom_basis0 + lVar151 + 0xd94);
      fVar354 = *(float *)(catmullrom_basis0 + lVar151 + 0xd98);
      fVar222 = *(float *)(catmullrom_basis0 + lVar151 + 0xd9c);
      fVar362 = *(float *)(catmullrom_basis0 + lVar151 + 0xda0);
      fVar243 = *(float *)(catmullrom_basis0 + lVar151 + 0xda4);
      auVar139 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0xd8c);
      auVar13 = vshufps_avx(auVar190,auVar190,0);
      register0x00001210 = auVar13;
      _local_4e0 = auVar13;
      fVar158 = auVar13._0_4_;
      fVar173 = auVar13._4_4_;
      fVar176 = auVar13._8_4_;
      fVar179 = auVar13._12_4_;
      fVar187 = auVar228._0_4_;
      fVar203 = auVar228._4_4_;
      fVar204 = auVar228._8_4_;
      fVar205 = auVar228._12_4_;
      auVar228 = vshufps_avx(auVar190,auVar190,0x55);
      register0x00001550 = auVar228;
      _local_7a0 = auVar228;
      fVar375 = auVar228._0_4_;
      fVar383 = auVar228._4_4_;
      fVar384 = auVar228._8_4_;
      fVar386 = auVar228._12_4_;
      fVar206 = auVar229._0_4_;
      fVar219 = auVar229._4_4_;
      fVar220 = auVar229._8_4_;
      fVar221 = auVar229._12_4_;
      auVar228 = vshufps_avx(_local_640,_local_640,0xff);
      register0x000014d0 = auVar228;
      _local_a0 = auVar228;
      auVar229 = vshufps_avx(_local_650,_local_650,0xff);
      register0x00001390 = auVar229;
      _local_140 = auVar229;
      fVar288 = auVar229._0_4_;
      fVar295 = auVar229._4_4_;
      fVar296 = auVar229._8_4_;
      fVar297 = auVar229._12_4_;
      fVar353 = auVar228._0_4_;
      fVar361 = auVar228._4_4_;
      fVar363 = auVar228._8_4_;
      auVar229 = vshufps_avx(auVar300,auVar300,0);
      register0x00001410 = auVar229;
      _local_360 = auVar229;
      pauVar10 = (undefined1 (*) [32])(catmullrom_basis0 + lVar151 + 0x484);
      fVar364 = *(float *)*pauVar10;
      fVar245 = *(float *)(catmullrom_basis0 + lVar151 + 0x488);
      fVar247 = *(float *)(catmullrom_basis0 + lVar151 + 0x48c);
      fVar250 = *(float *)(catmullrom_basis0 + lVar151 + 0x490);
      fVar253 = *(float *)(catmullrom_basis0 + lVar151 + 0x494);
      fVar262 = *(float *)(catmullrom_basis0 + lVar151 + 0x498);
      fVar264 = *(float *)(catmullrom_basis0 + lVar151 + 0x49c);
      auVar140 = *(undefined1 (*) [28])*pauVar10;
      fVar284 = *(float *)(catmullrom_basis0 + lVar151 + 0x4a0);
      _auStack_610 = SUB3216(*pauVar10,0x10);
      fVar306 = auVar229._0_4_;
      fVar316 = auVar229._4_4_;
      fVar317 = auVar229._8_4_;
      fVar318 = auVar229._12_4_;
      auVar229 = vshufps_avx(auVar300,auVar300,0x55);
      register0x00001310 = auVar229;
      _local_120 = auVar229;
      fVar254 = auVar229._0_4_;
      fVar263 = auVar229._4_4_;
      fVar265 = auVar229._8_4_;
      fVar267 = auVar229._12_4_;
      auVar229 = vshufps_avx(_local_630,_local_630,0xff);
      register0x00001590 = auVar229;
      _local_160 = auVar229;
      fVar385 = auVar229._0_4_;
      fVar387 = auVar229._4_4_;
      fVar388 = auVar229._8_4_;
      fVar391 = auVar229._12_4_;
      auVar131._8_4_ = auVar227._8_4_;
      auVar131._0_8_ = auVar227._0_8_;
      auVar131._12_4_ = auVar227._12_4_;
      auVar229 = vshufps_avx(auVar131,auVar131,0);
      register0x00001210 = auVar229;
      _local_380 = auVar229;
      fVar285 = *(float *)(catmullrom_basis0 + lVar151);
      fVar286 = *(float *)(catmullrom_basis0 + lVar151 + 4);
      fVar287 = *(float *)(catmullrom_basis0 + lVar151 + 8);
      fVar321 = *(float *)(catmullrom_basis0 + lVar151 + 0xc);
      fVar249 = *(float *)(catmullrom_basis0 + lVar151 + 0x10);
      fVar352 = *(float *)(catmullrom_basis0 + lVar151 + 0x14);
      fVar323 = *(float *)(catmullrom_basis0 + lVar151 + 0x18);
      fVar159 = auVar229._0_4_;
      fVar174 = auVar229._4_4_;
      fVar177 = auVar229._8_4_;
      fVar180 = auVar229._12_4_;
      auVar331._0_4_ = fVar159 * fVar285 + fVar306 * fVar364 + fVar187 * fVar266 + fVar158 * fVar225
      ;
      auVar331._4_4_ = fVar174 * fVar286 + fVar316 * fVar245 + fVar203 * fVar268 + fVar173 * fVar223
      ;
      auVar331._8_4_ = fVar177 * fVar287 + fVar317 * fVar247 + fVar204 * fVar269 + fVar176 * fVar241
      ;
      auVar331._12_4_ =
           fVar180 * fVar321 + fVar318 * fVar250 + fVar205 * fVar270 + fVar179 * fVar354;
      auVar331._16_4_ =
           fVar159 * fVar249 + fVar306 * fVar253 + fVar187 * fVar272 + fVar158 * fVar222;
      auVar331._20_4_ =
           fVar174 * fVar352 + fVar316 * fVar262 + fVar203 * fVar282 + fVar173 * fVar362;
      auVar331._24_4_ =
           fVar177 * fVar323 + fVar317 * fVar264 + fVar204 * fVar283 + fVar176 * fVar243;
      auVar331._28_4_ = fVar284 + fVar205 + fVar179 + 0.0;
      auVar229 = vshufps_avx(auVar131,auVar131,0x55);
      fVar394 = auVar229._0_4_;
      fVar398 = auVar229._4_4_;
      fVar399 = auVar229._8_4_;
      fVar400 = auVar229._12_4_;
      auVar369._0_4_ = fVar394 * fVar285 + fVar254 * fVar364 + fVar206 * fVar266 + fVar375 * fVar225
      ;
      auVar369._4_4_ = fVar398 * fVar286 + fVar263 * fVar245 + fVar219 * fVar268 + fVar383 * fVar223
      ;
      auVar369._8_4_ = fVar399 * fVar287 + fVar265 * fVar247 + fVar220 * fVar269 + fVar384 * fVar241
      ;
      auVar369._12_4_ =
           fVar400 * fVar321 + fVar267 * fVar250 + fVar221 * fVar270 + fVar386 * fVar354;
      auVar369._16_4_ =
           fVar394 * fVar249 + fVar254 * fVar253 + fVar206 * fVar272 + fVar375 * fVar222;
      auVar369._20_4_ =
           fVar398 * fVar352 + fVar263 * fVar262 + fVar219 * fVar282 + fVar383 * fVar362;
      auVar369._24_4_ =
           fVar399 * fVar323 + fVar265 * fVar264 + fVar220 * fVar283 + fVar384 * fVar243;
      auVar369._28_4_ = fVar221 + 0.0 + 0.0 + 0.0;
      auVar229 = vpermilps_avx(_local_710,0xff);
      register0x00001490 = auVar229;
      _local_180 = auVar229;
      fVar341 = auVar229._0_4_;
      fVar350 = auVar229._4_4_;
      fVar351 = auVar229._8_4_;
      auVar197._0_4_ = fVar341 * fVar285 + fVar385 * fVar364 + fVar353 * fVar266 + fVar288 * fVar225
      ;
      auVar197._4_4_ = fVar350 * fVar286 + fVar387 * fVar245 + fVar361 * fVar268 + fVar295 * fVar223
      ;
      auVar197._8_4_ = fVar351 * fVar287 + fVar388 * fVar247 + fVar363 * fVar269 + fVar296 * fVar241
      ;
      auVar197._12_4_ =
           auVar229._12_4_ * fVar321 +
           fVar391 * fVar250 + auVar228._12_4_ * fVar270 + fVar297 * fVar354;
      auVar197._16_4_ =
           fVar341 * fVar249 + fVar385 * fVar253 + fVar353 * fVar272 + fVar288 * fVar222;
      auVar197._20_4_ =
           fVar350 * fVar352 + fVar387 * fVar262 + fVar361 * fVar282 + fVar295 * fVar362;
      auVar197._24_4_ =
           fVar351 * fVar323 + fVar388 * fVar264 + fVar363 * fVar283 + fVar296 * fVar243;
      auVar197._28_4_ = 0;
      fVar325 = *(float *)(catmullrom_basis1 + lVar151 + 0x908);
      fVar252 = *(float *)(catmullrom_basis1 + lVar151 + 0x90c);
      fVar224 = *(float *)(catmullrom_basis1 + lVar151 + 0x910);
      fVar175 = *(float *)(catmullrom_basis1 + lVar151 + 0x914);
      fVar178 = *(float *)(catmullrom_basis1 + lVar151 + 0x918);
      fVar181 = *(float *)(catmullrom_basis1 + lVar151 + 0x91c);
      fVar182 = *(float *)(catmullrom_basis1 + lVar151 + 0x920);
      fVar183 = *(float *)(catmullrom_basis1 + lVar151 + 0xd8c);
      fVar184 = *(float *)(catmullrom_basis1 + lVar151 + 0xd90);
      fVar185 = *(float *)(catmullrom_basis1 + lVar151 + 0xd94);
      fVar271 = *(float *)(catmullrom_basis1 + lVar151 + 0xd98);
      fVar298 = *(float *)(catmullrom_basis1 + lVar151 + 0xd9c);
      fVar242 = *(float *)(catmullrom_basis1 + lVar151 + 0xda0);
      fVar244 = *(float *)(catmullrom_basis1 + lVar151 + 0xda4);
      fVar246 = *(float *)(catmullrom_basis1 + lVar151 + 0x484);
      fVar248 = *(float *)(catmullrom_basis1 + lVar151 + 0x488);
      fVar251 = *(float *)(catmullrom_basis1 + lVar151 + 0x48c);
      fVar186 = *(float *)(catmullrom_basis1 + lVar151 + 0x490);
      fVar299 = *(float *)(catmullrom_basis1 + lVar151 + 0x494);
      fVar319 = *(float *)(catmullrom_basis1 + lVar151 + 0x498);
      fVar320 = *(float *)(catmullrom_basis1 + lVar151 + 0x49c);
      fVar223 = fVar386 + 0.0;
      fVar322 = *(float *)(catmullrom_basis1 + lVar151);
      fVar324 = *(float *)(catmullrom_basis1 + lVar151 + 4);
      fVar326 = *(float *)(catmullrom_basis1 + lVar151 + 8);
      fVar337 = *(float *)(catmullrom_basis1 + lVar151 + 0xc);
      fVar338 = *(float *)(catmullrom_basis1 + lVar151 + 0x10);
      fVar339 = *(float *)(catmullrom_basis1 + lVar151 + 0x14);
      fVar340 = *(float *)(catmullrom_basis1 + lVar151 + 0x18);
      auVar314._0_4_ = fVar159 * fVar322 + fVar306 * fVar246 + fVar325 * fVar187 + fVar183 * fVar158
      ;
      auVar314._4_4_ = fVar174 * fVar324 + fVar316 * fVar248 + fVar252 * fVar203 + fVar184 * fVar173
      ;
      auVar314._8_4_ = fVar177 * fVar326 + fVar317 * fVar251 + fVar224 * fVar204 + fVar185 * fVar176
      ;
      auVar314._12_4_ =
           fVar180 * fVar337 + fVar318 * fVar186 + fVar175 * fVar205 + fVar271 * fVar179;
      auVar314._16_4_ =
           fVar159 * fVar338 + fVar306 * fVar299 + fVar178 * fVar187 + fVar298 * fVar158;
      auVar314._20_4_ =
           fVar174 * fVar339 + fVar316 * fVar319 + fVar181 * fVar203 + fVar242 * fVar173;
      auVar314._24_4_ =
           fVar177 * fVar340 + fVar317 * fVar320 + fVar182 * fVar204 + fVar244 * fVar176;
      auVar314._28_4_ = fVar391 + fVar223;
      auVar234._0_4_ = fVar394 * fVar322 + fVar254 * fVar246 + fVar325 * fVar206 + fVar375 * fVar183
      ;
      auVar234._4_4_ = fVar398 * fVar324 + fVar263 * fVar248 + fVar252 * fVar219 + fVar383 * fVar184
      ;
      auVar234._8_4_ = fVar399 * fVar326 + fVar265 * fVar251 + fVar224 * fVar220 + fVar384 * fVar185
      ;
      auVar234._12_4_ =
           fVar400 * fVar337 + fVar267 * fVar186 + fVar175 * fVar221 + fVar386 * fVar271;
      auVar234._16_4_ =
           fVar394 * fVar338 + fVar254 * fVar299 + fVar178 * fVar206 + fVar375 * fVar298;
      auVar234._20_4_ =
           fVar398 * fVar339 + fVar263 * fVar319 + fVar181 * fVar219 + fVar383 * fVar242;
      auVar234._24_4_ =
           fVar399 * fVar340 + fVar265 * fVar320 + fVar182 * fVar220 + fVar384 * fVar244;
      auVar234._28_4_ = fVar223 + fVar386 + fVar284 + 0.0;
      auVar346._0_4_ = fVar385 * fVar246 + fVar353 * fVar325 + fVar288 * fVar183 + fVar341 * fVar322
      ;
      auVar346._4_4_ = fVar387 * fVar248 + fVar361 * fVar252 + fVar295 * fVar184 + fVar350 * fVar324
      ;
      auVar346._8_4_ = fVar388 * fVar251 + fVar363 * fVar224 + fVar296 * fVar185 + fVar351 * fVar326
      ;
      auVar346._12_4_ =
           fVar391 * fVar186 + auVar228._12_4_ * fVar175 + fVar297 * fVar271 +
           auVar229._12_4_ * fVar337;
      auVar346._16_4_ =
           fVar385 * fVar299 + fVar353 * fVar178 + fVar288 * fVar298 + fVar341 * fVar338;
      auVar346._20_4_ =
           fVar387 * fVar319 + fVar361 * fVar181 + fVar295 * fVar242 + fVar350 * fVar339;
      auVar346._24_4_ =
           fVar388 * fVar320 + fVar363 * fVar182 + fVar296 * fVar244 + fVar351 * fVar340;
      auVar346._28_4_ = fVar386 + fVar297 + fVar284 + fVar223;
      auVar40 = vsubps_avx(auVar314,auVar331);
      auVar278 = vsubps_avx(auVar234,auVar369);
      fVar225 = auVar40._0_4_;
      fVar241 = auVar40._4_4_;
      auVar48._4_4_ = auVar369._4_4_ * fVar241;
      auVar48._0_4_ = auVar369._0_4_ * fVar225;
      fVar222 = auVar40._8_4_;
      auVar48._8_4_ = auVar369._8_4_ * fVar222;
      fVar243 = auVar40._12_4_;
      auVar48._12_4_ = auVar369._12_4_ * fVar243;
      fVar245 = auVar40._16_4_;
      auVar48._16_4_ = auVar369._16_4_ * fVar245;
      fVar250 = auVar40._20_4_;
      auVar48._20_4_ = auVar369._20_4_ * fVar250;
      fVar262 = auVar40._24_4_;
      auVar48._24_4_ = auVar369._24_4_ * fVar262;
      auVar48._28_4_ = fVar223;
      fVar223 = auVar278._0_4_;
      fVar354 = auVar278._4_4_;
      auVar49._4_4_ = auVar331._4_4_ * fVar354;
      auVar49._0_4_ = auVar331._0_4_ * fVar223;
      fVar362 = auVar278._8_4_;
      auVar49._8_4_ = auVar331._8_4_ * fVar362;
      fVar364 = auVar278._12_4_;
      auVar49._12_4_ = auVar331._12_4_ * fVar364;
      fVar247 = auVar278._16_4_;
      auVar49._16_4_ = auVar331._16_4_ * fVar247;
      fVar253 = auVar278._20_4_;
      auVar49._20_4_ = auVar331._20_4_ * fVar253;
      fVar264 = auVar278._24_4_;
      auVar49._24_4_ = auVar331._24_4_ * fVar264;
      auVar49._28_4_ = auVar234._28_4_;
      auVar378 = vsubps_avx(auVar48,auVar49);
      auVar163 = vmaxps_avx(auVar197,auVar346);
      auVar50._4_4_ = auVar163._4_4_ * auVar163._4_4_ * (fVar241 * fVar241 + fVar354 * fVar354);
      auVar50._0_4_ = auVar163._0_4_ * auVar163._0_4_ * (fVar225 * fVar225 + fVar223 * fVar223);
      auVar50._8_4_ = auVar163._8_4_ * auVar163._8_4_ * (fVar222 * fVar222 + fVar362 * fVar362);
      auVar50._12_4_ = auVar163._12_4_ * auVar163._12_4_ * (fVar243 * fVar243 + fVar364 * fVar364);
      auVar50._16_4_ = auVar163._16_4_ * auVar163._16_4_ * (fVar245 * fVar245 + fVar247 * fVar247);
      auVar50._20_4_ = auVar163._20_4_ * auVar163._20_4_ * (fVar250 * fVar250 + fVar253 * fVar253);
      auVar50._24_4_ = auVar163._24_4_ * auVar163._24_4_ * (fVar262 * fVar262 + fVar264 * fVar264);
      auVar50._28_4_ = fVar267 + auVar234._28_4_;
      auVar51._4_4_ = auVar378._4_4_ * auVar378._4_4_;
      auVar51._0_4_ = auVar378._0_4_ * auVar378._0_4_;
      auVar51._8_4_ = auVar378._8_4_ * auVar378._8_4_;
      auVar51._12_4_ = auVar378._12_4_ * auVar378._12_4_;
      auVar51._16_4_ = auVar378._16_4_ * auVar378._16_4_;
      auVar51._20_4_ = auVar378._20_4_ * auVar378._20_4_;
      auVar51._24_4_ = auVar378._24_4_ * auVar378._24_4_;
      auVar51._28_4_ = auVar378._28_4_;
      auVar163 = vcmpps_avx(auVar51,auVar50,2);
      auVar218 = ZEXT3264(auVar163);
      local_4c0 = (float)(int)uVar36;
      fStack_4bc = 0.0;
      fStack_4b8 = 0.0;
      fStack_4b4 = 0.0;
      auVar228 = vshufps_avx(ZEXT416((uint)local_4c0),ZEXT416((uint)local_4c0),0);
      auVar235._16_16_ = auVar228;
      auVar235._0_16_ = auVar228;
      auVar378 = vcmpps_avx(_DAT_01faff40,auVar235,1);
      auVar240 = ZEXT3264(auVar378);
      auVar132._8_4_ = auVar227._8_4_;
      auVar132._0_8_ = auVar227._0_8_;
      auVar132._12_4_ = auVar227._12_4_;
      auVar228 = vpermilps_avx(auVar132,0xaa);
      register0x00001490 = auVar228;
      _local_3a0 = auVar228;
      auVar229 = vpermilps_avx(auVar300,0xaa);
      register0x00001550 = auVar229;
      _local_340 = auVar229;
      auVar13 = vpermilps_avx(auVar307,0xaa);
      register0x00001590 = auVar13;
      _local_c0 = auVar13;
      auVar46 = vpermilps_avx(auVar190,0xaa);
      register0x00001510 = auVar46;
      _local_740 = auVar46;
      auVar41 = auVar378 & auVar163;
      uVar149 = *(uint *)(ray + k * 4 + 0x30);
      auVar261 = ZEXT464(uVar149);
      auVar161 = ZEXT416((uint)(auVar161._0_4_ * 4.7683716e-07));
      local_780._0_16_ = auVar161;
      fVar225 = fVar375;
      fVar223 = fVar383;
      fVar241 = fVar384;
      if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar41 >> 0x7f,0) == '\0') &&
            (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar41 >> 0xbf,0) == '\0') &&
          (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar41[0x1f])
      {
        bVar153 = false;
        auVar163 = local_580;
        auVar378 = local_560;
      }
      else {
        auVar163 = vandps_avx(auVar163,auVar378);
        fVar288 = auVar228._0_4_;
        fVar295 = auVar228._4_4_;
        fVar296 = auVar228._8_4_;
        fVar297 = auVar228._12_4_;
        fVar361 = auVar229._0_4_;
        fVar363 = auVar229._4_4_;
        fVar385 = auVar229._8_4_;
        fVar387 = auVar229._12_4_;
        fVar388 = auVar13._0_4_;
        fVar391 = auVar13._4_4_;
        fVar392 = auVar13._8_4_;
        fVar393 = auVar13._12_4_;
        fVar341 = auVar46._0_4_;
        fVar350 = auVar46._4_4_;
        fVar351 = auVar46._8_4_;
        fVar353 = auVar46._12_4_;
        fVar354 = auVar378._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar151 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar151 + 0x4a0);
        local_3c0._0_4_ =
             fVar288 * fVar322 + fVar361 * fVar246 + fVar388 * fVar325 + fVar341 * fVar183;
        local_3c0._4_4_ =
             fVar295 * fVar324 + fVar363 * fVar248 + fVar391 * fVar252 + fVar350 * fVar184;
        fStack_3b8 = fVar296 * fVar326 + fVar385 * fVar251 + fVar392 * fVar224 + fVar351 * fVar185;
        fStack_3b4 = fVar297 * fVar337 + fVar387 * fVar186 + fVar393 * fVar175 + fVar353 * fVar271;
        fStack_3b0 = fVar288 * fVar338 + fVar361 * fVar299 + fVar388 * fVar178 + fVar341 * fVar298;
        fStack_3ac = fVar295 * fVar339 + fVar363 * fVar319 + fVar391 * fVar181 + fVar350 * fVar242;
        fStack_3a8 = fVar296 * fVar340 + fVar385 * fVar320 + fVar392 * fVar182 + fVar351 * fVar244;
        fStack_3a4 = auVar163._28_4_ + fVar354;
        local_620._0_4_ = auVar140._0_4_;
        local_620._4_4_ = auVar140._4_4_;
        fStack_618 = auVar140._8_4_;
        fStack_614 = auVar140._12_4_;
        auStack_610._0_4_ = auVar140._16_4_;
        auStack_610._4_4_ = auVar140._20_4_;
        fStack_608 = auVar140._24_4_;
        local_5e0._0_4_ = auVar139._0_4_;
        local_5e0._4_4_ = auVar139._4_4_;
        fStack_5d8 = auVar139._8_4_;
        fStack_5d4 = auVar139._12_4_;
        fStack_5d0 = auVar139._16_4_;
        fStack_5cc = auVar139._20_4_;
        fStack_5c8 = auVar139._24_4_;
        local_680 = fVar288 * fVar285 +
                    fVar361 * (float)local_620._0_4_ +
                    fVar388 * fVar266 + fVar341 * (float)local_5e0._0_4_;
        fStack_67c = fVar295 * fVar286 +
                     fVar363 * (float)local_620._4_4_ +
                     fVar391 * fVar268 + fVar350 * (float)local_5e0._4_4_;
        fStack_678 = fVar296 * fVar287 +
                     fVar385 * fStack_618 + fVar392 * fVar269 + fVar351 * fStack_5d8;
        fStack_674 = fVar297 * fVar321 +
                     fVar387 * fStack_614 + fVar393 * fVar270 + fVar353 * fStack_5d4;
        fStack_670 = fVar288 * fVar249 +
                     fVar361 * (float)auStack_610._0_4_ + fVar388 * fVar272 + fVar341 * fStack_5d0;
        fStack_66c = fVar295 * fVar352 +
                     fVar363 * (float)auStack_610._4_4_ + fVar391 * fVar282 + fVar350 * fStack_5cc;
        fStack_668 = fVar296 * fVar323 +
                     fVar385 * fStack_608 + fVar392 * fVar283 + fVar351 * fStack_5c8;
        fStack_664 = fStack_3a4 + fVar354 + auVar163._28_4_ + auVar378._28_4_;
        fVar354 = *(float *)(catmullrom_basis0 + lVar151 + 0x1210);
        fVar222 = *(float *)(catmullrom_basis0 + lVar151 + 0x1214);
        fVar362 = *(float *)(catmullrom_basis0 + lVar151 + 0x1218);
        fVar243 = *(float *)(catmullrom_basis0 + lVar151 + 0x121c);
        fVar364 = *(float *)(catmullrom_basis0 + lVar151 + 0x1220);
        fVar245 = *(float *)(catmullrom_basis0 + lVar151 + 0x1224);
        fVar247 = *(float *)(catmullrom_basis0 + lVar151 + 0x1228);
        fVar250 = *(float *)(catmullrom_basis0 + lVar151 + 0x1694);
        fVar253 = *(float *)(catmullrom_basis0 + lVar151 + 0x1698);
        fVar262 = *(float *)(catmullrom_basis0 + lVar151 + 0x169c);
        fVar264 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a0);
        fVar266 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a4);
        fVar268 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a8);
        fVar269 = *(float *)(catmullrom_basis0 + lVar151 + 0x16ac);
        fVar270 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b18);
        fVar272 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b1c);
        fVar282 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b20);
        fVar283 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b24);
        fVar284 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b28);
        fVar285 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b2c);
        fVar286 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b30);
        fVar287 = *(float *)(catmullrom_basis0 + lVar151 + 0x1f9c);
        fVar321 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa0);
        fVar249 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa4);
        fVar352 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa8);
        fVar323 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fac);
        fVar325 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fb0);
        fVar252 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fb4);
        fVar175 = *(float *)(catmullrom_basis1 + lVar151 + 0x4a0) + 0.0;
        fVar224 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar151 + 0x1fb8);
        fVar178 = *(float *)(catmullrom_basis0 + lVar151 + 0x16b0) + fVar224;
        local_500 = fVar159 * fVar354 + fVar306 * fVar250 + fVar187 * fVar270 + fVar158 * fVar287;
        fStack_4fc = fVar174 * fVar222 + fVar316 * fVar253 + fVar203 * fVar272 + fVar173 * fVar321;
        fStack_4f8 = fVar177 * fVar362 + fVar317 * fVar262 + fVar204 * fVar282 + fVar176 * fVar249;
        fStack_4f4 = fVar180 * fVar243 + fVar318 * fVar264 + fVar205 * fVar283 + fVar179 * fVar352;
        fStack_4f0 = fVar159 * fVar364 + fVar306 * fVar266 + fVar187 * fVar284 + fVar158 * fVar323;
        fStack_4ec = fVar174 * fVar245 + fVar316 * fVar268 + fVar203 * fVar285 + fVar173 * fVar325;
        fStack_4e8 = fVar177 * fVar247 + fVar317 * fVar269 + fVar204 * fVar286 + fVar176 * fVar252;
        fStack_4e4 = *(float *)(catmullrom_basis0 + lVar151 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar151 + 0x1fb8) + fVar175;
        auVar198._0_4_ =
             fVar206 * fVar270 + fVar375 * fVar287 + fVar254 * fVar250 + fVar354 * fVar394;
        auVar198._4_4_ =
             fVar219 * fVar272 + fVar383 * fVar321 + fVar263 * fVar253 + fVar222 * fVar398;
        auVar198._8_4_ =
             fVar220 * fVar282 + fVar384 * fVar249 + fVar265 * fVar262 + fVar362 * fVar399;
        auVar198._12_4_ =
             fVar221 * fVar283 + fVar386 * fVar352 + fVar267 * fVar264 + fVar243 * fVar400;
        auVar198._16_4_ =
             fVar206 * fVar284 + fVar375 * fVar323 + fVar254 * fVar266 + fVar364 * fVar394;
        auVar198._20_4_ =
             fVar219 * fVar285 + fVar383 * fVar325 + fVar263 * fVar268 + fVar245 * fVar398;
        auVar198._24_4_ =
             fVar220 * fVar286 + fVar384 * fVar252 + fVar265 * fVar269 + fVar247 * fVar399;
        auVar198._28_4_ = *(float *)(catmullrom_basis1 + lVar151 + 0xda8) + 0.0 + fVar175 + fVar224;
        auVar395._0_4_ =
             fVar361 * fVar250 + fVar388 * fVar270 + fVar341 * fVar287 + fVar288 * fVar354;
        auVar395._4_4_ =
             fVar363 * fVar253 + fVar391 * fVar272 + fVar350 * fVar321 + fVar295 * fVar222;
        auVar395._8_4_ =
             fVar385 * fVar262 + fVar392 * fVar282 + fVar351 * fVar249 + fVar296 * fVar362;
        auVar395._12_4_ =
             fVar387 * fVar264 + fVar393 * fVar283 + fVar353 * fVar352 + fVar297 * fVar243;
        auVar395._16_4_ =
             fVar361 * fVar266 + fVar388 * fVar284 + fVar341 * fVar323 + fVar288 * fVar364;
        auVar395._20_4_ =
             fVar363 * fVar268 + fVar391 * fVar285 + fVar350 * fVar325 + fVar295 * fVar245;
        auVar395._24_4_ =
             fVar385 * fVar269 + fVar392 * fVar286 + fVar351 * fVar252 + fVar296 * fVar247;
        auVar395._28_4_ = fVar178 + *(float *)(catmullrom_basis0 + lVar151 + 0x122c);
        fVar354 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b18);
        fVar222 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b1c);
        fVar362 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b20);
        fVar243 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b24);
        fVar364 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b28);
        fVar245 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b2c);
        fVar247 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b30);
        fVar250 = *(float *)(catmullrom_basis1 + lVar151 + 0x1f9c);
        fVar253 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa0);
        fVar262 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa4);
        fVar264 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa8);
        fVar266 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fac);
        fVar268 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fb0);
        fVar269 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fb4);
        fVar270 = *(float *)(catmullrom_basis1 + lVar151 + 0x1694);
        fVar272 = *(float *)(catmullrom_basis1 + lVar151 + 0x1698);
        fVar282 = *(float *)(catmullrom_basis1 + lVar151 + 0x169c);
        fVar283 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a0);
        fVar284 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a4);
        fVar285 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a8);
        fVar286 = *(float *)(catmullrom_basis1 + lVar151 + 0x16ac);
        fVar287 = *(float *)(catmullrom_basis1 + lVar151 + 0x1210);
        fVar321 = *(float *)(catmullrom_basis1 + lVar151 + 0x1214);
        fVar249 = *(float *)(catmullrom_basis1 + lVar151 + 0x1218);
        fVar352 = *(float *)(catmullrom_basis1 + lVar151 + 0x121c);
        fVar323 = *(float *)(catmullrom_basis1 + lVar151 + 0x1220);
        fVar325 = *(float *)(catmullrom_basis1 + lVar151 + 0x1224);
        fVar252 = *(float *)(catmullrom_basis1 + lVar151 + 0x1228);
        auVar291._0_4_ =
             fVar159 * fVar287 + fVar306 * fVar270 + fVar187 * fVar354 + fVar158 * fVar250;
        auVar291._4_4_ =
             fVar174 * fVar321 + fVar316 * fVar272 + fVar203 * fVar222 + fVar173 * fVar253;
        auVar291._8_4_ =
             fVar177 * fVar249 + fVar317 * fVar282 + fVar204 * fVar362 + fVar176 * fVar262;
        auVar291._12_4_ =
             fVar180 * fVar352 + fVar318 * fVar283 + fVar205 * fVar243 + fVar179 * fVar264;
        auVar291._16_4_ =
             fVar159 * fVar323 + fVar306 * fVar284 + fVar187 * fVar364 + fVar158 * fVar266;
        auVar291._20_4_ =
             fVar174 * fVar325 + fVar316 * fVar285 + fVar203 * fVar245 + fVar173 * fVar268;
        auVar291._24_4_ =
             fVar177 * fVar252 + fVar317 * fVar286 + fVar204 * fVar247 + fVar176 * fVar269;
        auVar291._28_4_ = fVar297 + fVar297 + fVar178 + fVar179;
        auVar332._0_4_ =
             fVar287 * fVar394 + fVar254 * fVar270 + fVar206 * fVar354 + fVar375 * fVar250;
        auVar332._4_4_ =
             fVar321 * fVar398 + fVar263 * fVar272 + fVar219 * fVar222 + fVar383 * fVar253;
        auVar332._8_4_ =
             fVar249 * fVar399 + fVar265 * fVar282 + fVar220 * fVar362 + fVar384 * fVar262;
        auVar332._12_4_ =
             fVar352 * fVar400 + fVar267 * fVar283 + fVar221 * fVar243 + fVar386 * fVar264;
        auVar332._16_4_ =
             fVar323 * fVar394 + fVar254 * fVar284 + fVar206 * fVar364 + fVar375 * fVar266;
        auVar332._20_4_ =
             fVar325 * fVar398 + fVar263 * fVar285 + fVar219 * fVar245 + fVar383 * fVar268;
        auVar332._24_4_ =
             fVar252 * fVar399 + fVar265 * fVar286 + fVar220 * fVar247 + fVar384 * fVar269;
        auVar332._28_4_ = fVar297 + fVar297 + fVar297 + fVar178;
        auVar216._0_4_ =
             fVar288 * fVar287 + fVar361 * fVar270 + fVar388 * fVar354 + fVar250 * fVar341;
        auVar216._4_4_ =
             fVar295 * fVar321 + fVar363 * fVar272 + fVar391 * fVar222 + fVar253 * fVar350;
        auVar216._8_4_ =
             fVar296 * fVar249 + fVar385 * fVar282 + fVar392 * fVar362 + fVar262 * fVar351;
        auVar216._12_4_ =
             fVar297 * fVar352 + fVar387 * fVar283 + fVar393 * fVar243 + fVar264 * fVar353;
        auVar216._16_4_ =
             fVar288 * fVar323 + fVar361 * fVar284 + fVar388 * fVar364 + fVar266 * fVar341;
        auVar216._20_4_ =
             fVar295 * fVar325 + fVar363 * fVar285 + fVar391 * fVar245 + fVar268 * fVar350;
        auVar216._24_4_ =
             fVar296 * fVar252 + fVar385 * fVar286 + fVar392 * fVar247 + fVar269 * fVar351;
        auVar216._28_4_ =
             *(float *)(catmullrom_basis1 + lVar151 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x1fb8);
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar257._12_4_ = 0x7fffffff;
        auVar257._16_4_ = 0x7fffffff;
        auVar257._20_4_ = 0x7fffffff;
        auVar257._24_4_ = 0x7fffffff;
        auVar257._28_4_ = 0x7fffffff;
        auVar136._4_4_ = fStack_4fc;
        auVar136._0_4_ = local_500;
        auVar136._8_4_ = fStack_4f8;
        auVar136._12_4_ = fStack_4f4;
        auVar136._16_4_ = fStack_4f0;
        auVar136._20_4_ = fStack_4ec;
        auVar136._24_4_ = fStack_4e8;
        auVar136._28_4_ = fStack_4e4;
        auVar378 = vandps_avx(auVar136,auVar257);
        auVar41 = vandps_avx(auVar198,auVar257);
        auVar41 = vmaxps_avx(auVar378,auVar41);
        auVar378 = vandps_avx(auVar395,auVar257);
        auVar378 = vmaxps_avx(auVar41,auVar378);
        auVar161 = vpermilps_avx(auVar161,0);
        auVar275._16_16_ = auVar161;
        auVar275._0_16_ = auVar161;
        auVar378 = vcmpps_avx(auVar378,auVar275,1);
        auVar42 = vblendvps_avx(auVar136,auVar40,auVar378);
        auVar43 = vblendvps_avx(auVar198,auVar278,auVar378);
        auVar378 = vandps_avx(auVar291,auVar257);
        auVar41 = vandps_avx(auVar332,auVar257);
        auVar44 = vmaxps_avx(auVar378,auVar41);
        auVar378 = vandps_avx(auVar216,auVar257);
        auVar378 = vmaxps_avx(auVar44,auVar378);
        auVar44 = vcmpps_avx(auVar378,auVar275,1);
        auVar378 = vblendvps_avx(auVar291,auVar40,auVar44);
        auVar40 = vblendvps_avx(auVar332,auVar278,auVar44);
        fVar175 = auVar42._0_4_;
        fVar178 = auVar42._4_4_;
        fVar181 = auVar42._8_4_;
        fVar182 = auVar42._12_4_;
        fVar183 = auVar42._16_4_;
        fVar184 = auVar42._20_4_;
        fVar185 = auVar42._24_4_;
        fVar186 = -auVar42._28_4_;
        fVar271 = auVar378._0_4_;
        fVar298 = auVar378._4_4_;
        fVar242 = auVar378._8_4_;
        fVar244 = auVar378._12_4_;
        fVar246 = auVar378._16_4_;
        fVar248 = auVar378._20_4_;
        fVar251 = auVar378._24_4_;
        fVar354 = auVar43._0_4_;
        fVar364 = auVar43._4_4_;
        fVar253 = auVar43._8_4_;
        fVar268 = auVar43._12_4_;
        fVar282 = auVar43._16_4_;
        fVar286 = auVar43._20_4_;
        fVar352 = auVar43._24_4_;
        auVar166._0_4_ = fVar354 * fVar354 + fVar175 * fVar175;
        auVar166._4_4_ = fVar364 * fVar364 + fVar178 * fVar178;
        auVar166._8_4_ = fVar253 * fVar253 + fVar181 * fVar181;
        auVar166._12_4_ = fVar268 * fVar268 + fVar182 * fVar182;
        auVar166._16_4_ = fVar282 * fVar282 + fVar183 * fVar183;
        auVar166._20_4_ = fVar286 * fVar286 + fVar184 * fVar184;
        auVar166._24_4_ = fVar352 * fVar352 + fVar185 * fVar185;
        auVar166._28_4_ = auVar332._28_4_ + auVar42._28_4_;
        auVar278 = vrsqrtps_avx(auVar166);
        fVar222 = auVar278._0_4_;
        fVar362 = auVar278._4_4_;
        auVar52._4_4_ = fVar362 * 1.5;
        auVar52._0_4_ = fVar222 * 1.5;
        fVar243 = auVar278._8_4_;
        auVar52._8_4_ = fVar243 * 1.5;
        fVar245 = auVar278._12_4_;
        auVar52._12_4_ = fVar245 * 1.5;
        fVar247 = auVar278._16_4_;
        auVar52._16_4_ = fVar247 * 1.5;
        fVar250 = auVar278._20_4_;
        auVar52._20_4_ = fVar250 * 1.5;
        fVar262 = auVar278._24_4_;
        fVar224 = auVar41._28_4_;
        auVar52._24_4_ = fVar262 * 1.5;
        auVar52._28_4_ = fVar224;
        auVar53._4_4_ = fVar362 * fVar362 * fVar362 * auVar166._4_4_ * 0.5;
        auVar53._0_4_ = fVar222 * fVar222 * fVar222 * auVar166._0_4_ * 0.5;
        auVar53._8_4_ = fVar243 * fVar243 * fVar243 * auVar166._8_4_ * 0.5;
        auVar53._12_4_ = fVar245 * fVar245 * fVar245 * auVar166._12_4_ * 0.5;
        auVar53._16_4_ = fVar247 * fVar247 * fVar247 * auVar166._16_4_ * 0.5;
        auVar53._20_4_ = fVar250 * fVar250 * fVar250 * auVar166._20_4_ * 0.5;
        auVar53._24_4_ = fVar262 * fVar262 * fVar262 * auVar166._24_4_ * 0.5;
        auVar53._28_4_ = auVar166._28_4_;
        auVar278 = vsubps_avx(auVar52,auVar53);
        fVar222 = auVar278._0_4_;
        fVar245 = auVar278._4_4_;
        fVar262 = auVar278._8_4_;
        fVar269 = auVar278._12_4_;
        fVar283 = auVar278._16_4_;
        fVar287 = auVar278._20_4_;
        fVar323 = auVar278._24_4_;
        fVar362 = auVar40._0_4_;
        fVar247 = auVar40._4_4_;
        fVar264 = auVar40._8_4_;
        fVar270 = auVar40._12_4_;
        fVar284 = auVar40._16_4_;
        fVar321 = auVar40._20_4_;
        fVar325 = auVar40._24_4_;
        auVar167._0_4_ = fVar362 * fVar362 + fVar271 * fVar271;
        auVar167._4_4_ = fVar247 * fVar247 + fVar298 * fVar298;
        auVar167._8_4_ = fVar264 * fVar264 + fVar242 * fVar242;
        auVar167._12_4_ = fVar270 * fVar270 + fVar244 * fVar244;
        auVar167._16_4_ = fVar284 * fVar284 + fVar246 * fVar246;
        auVar167._20_4_ = fVar321 * fVar321 + fVar248 * fVar248;
        auVar167._24_4_ = fVar325 * fVar325 + fVar251 * fVar251;
        auVar167._28_4_ = auVar378._28_4_ + auVar278._28_4_;
        auVar378 = vrsqrtps_avx(auVar167);
        fVar243 = auVar378._0_4_;
        fVar250 = auVar378._4_4_;
        auVar54._4_4_ = fVar250 * 1.5;
        auVar54._0_4_ = fVar243 * 1.5;
        fVar266 = auVar378._8_4_;
        auVar54._8_4_ = fVar266 * 1.5;
        fVar272 = auVar378._12_4_;
        auVar54._12_4_ = fVar272 * 1.5;
        fVar285 = auVar378._16_4_;
        auVar54._16_4_ = fVar285 * 1.5;
        fVar249 = auVar378._20_4_;
        auVar54._20_4_ = fVar249 * 1.5;
        fVar252 = auVar378._24_4_;
        auVar54._24_4_ = fVar252 * 1.5;
        auVar54._28_4_ = fVar224;
        auVar55._4_4_ = fVar250 * fVar250 * fVar250 * auVar167._4_4_ * 0.5;
        auVar55._0_4_ = fVar243 * fVar243 * fVar243 * auVar167._0_4_ * 0.5;
        auVar55._8_4_ = fVar266 * fVar266 * fVar266 * auVar167._8_4_ * 0.5;
        auVar55._12_4_ = fVar272 * fVar272 * fVar272 * auVar167._12_4_ * 0.5;
        auVar55._16_4_ = fVar285 * fVar285 * fVar285 * auVar167._16_4_ * 0.5;
        auVar55._20_4_ = fVar249 * fVar249 * fVar249 * auVar167._20_4_ * 0.5;
        auVar55._24_4_ = fVar252 * fVar252 * fVar252 * auVar167._24_4_ * 0.5;
        auVar55._28_4_ = auVar167._28_4_;
        auVar378 = vsubps_avx(auVar54,auVar55);
        fVar243 = auVar378._0_4_;
        fVar250 = auVar378._4_4_;
        fVar266 = auVar378._8_4_;
        fVar272 = auVar378._12_4_;
        fVar285 = auVar378._16_4_;
        fVar249 = auVar378._20_4_;
        fVar252 = auVar378._24_4_;
        fVar354 = auVar197._0_4_ * fVar354 * fVar222;
        fVar364 = auVar197._4_4_ * fVar364 * fVar245;
        auVar56._4_4_ = fVar364;
        auVar56._0_4_ = fVar354;
        fVar253 = auVar197._8_4_ * fVar253 * fVar262;
        auVar56._8_4_ = fVar253;
        fVar268 = auVar197._12_4_ * fVar268 * fVar269;
        auVar56._12_4_ = fVar268;
        fVar282 = auVar197._16_4_ * fVar282 * fVar283;
        auVar56._16_4_ = fVar282;
        fVar286 = auVar197._20_4_ * fVar286 * fVar287;
        auVar56._20_4_ = fVar286;
        fVar352 = auVar197._24_4_ * fVar352 * fVar323;
        auVar56._24_4_ = fVar352;
        auVar56._28_4_ = fVar224;
        local_600._4_4_ = fVar364 + auVar331._4_4_;
        local_600._0_4_ = fVar354 + auVar331._0_4_;
        fStack_5f8 = fVar253 + auVar331._8_4_;
        fStack_5f4 = fVar268 + auVar331._12_4_;
        fStack_5f0 = fVar282 + auVar331._16_4_;
        fStack_5ec = fVar286 + auVar331._20_4_;
        fStack_5e8 = fVar352 + auVar331._24_4_;
        fStack_5e4 = fVar224 + auVar331._28_4_;
        fVar354 = auVar197._0_4_ * fVar222 * -fVar175;
        fVar364 = auVar197._4_4_ * fVar245 * -fVar178;
        auVar57._4_4_ = fVar364;
        auVar57._0_4_ = fVar354;
        fVar253 = auVar197._8_4_ * fVar262 * -fVar181;
        auVar57._8_4_ = fVar253;
        fVar268 = auVar197._12_4_ * fVar269 * -fVar182;
        auVar57._12_4_ = fVar268;
        fVar282 = auVar197._16_4_ * fVar283 * -fVar183;
        auVar57._16_4_ = fVar282;
        fVar286 = auVar197._20_4_ * fVar287 * -fVar184;
        auVar57._20_4_ = fVar286;
        fVar352 = auVar197._24_4_ * fVar323 * -fVar185;
        auVar57._24_4_ = fVar352;
        auVar57._28_4_ = fVar186;
        local_620._4_4_ = auVar369._4_4_ + fVar364;
        local_620._0_4_ = auVar369._0_4_ + fVar354;
        fStack_618 = auVar369._8_4_ + fVar253;
        fStack_614 = auVar369._12_4_ + fVar268;
        auStack_610._0_4_ = auVar369._16_4_ + fVar282;
        auStack_610._4_4_ = auVar369._20_4_ + fVar286;
        fStack_608 = auVar369._24_4_ + fVar352;
        fStack_604 = auVar369._28_4_ + fVar186;
        fVar354 = fVar222 * 0.0 * auVar197._0_4_;
        fVar222 = fVar245 * 0.0 * auVar197._4_4_;
        auVar58._4_4_ = fVar222;
        auVar58._0_4_ = fVar354;
        fVar364 = fVar262 * 0.0 * auVar197._8_4_;
        auVar58._8_4_ = fVar364;
        fVar245 = fVar269 * 0.0 * auVar197._12_4_;
        auVar58._12_4_ = fVar245;
        fVar253 = fVar283 * 0.0 * auVar197._16_4_;
        auVar58._16_4_ = fVar253;
        fVar262 = fVar287 * 0.0 * auVar197._20_4_;
        auVar58._20_4_ = fVar262;
        fVar268 = fVar323 * 0.0 * auVar197._24_4_;
        auVar58._24_4_ = fVar268;
        auVar58._28_4_ = fVar387;
        auVar134._4_4_ = fStack_67c;
        auVar134._0_4_ = local_680;
        auVar134._8_4_ = fStack_678;
        auVar134._12_4_ = fStack_674;
        auVar134._16_4_ = fStack_670;
        auVar134._20_4_ = fStack_66c;
        auVar134._24_4_ = fStack_668;
        auVar134._28_4_ = fStack_664;
        auVar292._0_4_ = fVar354 + local_680;
        auVar292._4_4_ = fVar222 + fStack_67c;
        auVar292._8_4_ = fVar364 + fStack_678;
        auVar292._12_4_ = fVar245 + fStack_674;
        auVar292._16_4_ = fVar253 + fStack_670;
        auVar292._20_4_ = fVar262 + fStack_66c;
        auVar292._24_4_ = fVar268 + fStack_668;
        auVar292._28_4_ = fVar387 + fStack_664;
        fVar354 = auVar346._0_4_ * fVar362 * fVar243;
        fVar222 = auVar346._4_4_ * fVar247 * fVar250;
        auVar59._4_4_ = fVar222;
        auVar59._0_4_ = fVar354;
        fVar362 = auVar346._8_4_ * fVar264 * fVar266;
        auVar59._8_4_ = fVar362;
        fVar364 = auVar346._12_4_ * fVar270 * fVar272;
        auVar59._12_4_ = fVar364;
        fVar245 = auVar346._16_4_ * fVar284 * fVar285;
        auVar59._16_4_ = fVar245;
        fVar247 = auVar346._20_4_ * fVar321 * fVar249;
        auVar59._20_4_ = fVar247;
        fVar253 = auVar346._24_4_ * fVar325 * fVar252;
        auVar59._24_4_ = fVar253;
        auVar59._28_4_ = auVar40._28_4_;
        auVar44 = vsubps_avx(auVar331,auVar56);
        auVar347._0_4_ = auVar314._0_4_ + fVar354;
        auVar347._4_4_ = auVar314._4_4_ + fVar222;
        auVar347._8_4_ = auVar314._8_4_ + fVar362;
        auVar347._12_4_ = auVar314._12_4_ + fVar364;
        auVar347._16_4_ = auVar314._16_4_ + fVar245;
        auVar347._20_4_ = auVar314._20_4_ + fVar247;
        auVar347._24_4_ = auVar314._24_4_ + fVar253;
        auVar347._28_4_ = auVar314._28_4_ + auVar40._28_4_;
        fVar354 = auVar346._0_4_ * fVar243 * -fVar271;
        fVar222 = auVar346._4_4_ * fVar250 * -fVar298;
        auVar60._4_4_ = fVar222;
        auVar60._0_4_ = fVar354;
        fVar362 = auVar346._8_4_ * fVar266 * -fVar242;
        auVar60._8_4_ = fVar362;
        fVar364 = auVar346._12_4_ * fVar272 * -fVar244;
        auVar60._12_4_ = fVar364;
        fVar245 = auVar346._16_4_ * fVar285 * -fVar246;
        auVar60._16_4_ = fVar245;
        fVar247 = auVar346._20_4_ * fVar249 * -fVar248;
        auVar60._20_4_ = fVar247;
        fVar253 = auVar346._24_4_ * fVar252 * -fVar251;
        auVar60._24_4_ = fVar253;
        auVar60._28_4_ = fVar393;
        auVar45 = vsubps_avx(auVar369,auVar57);
        auVar360._0_4_ = fVar354 + auVar234._0_4_;
        auVar360._4_4_ = fVar222 + auVar234._4_4_;
        auVar360._8_4_ = fVar362 + auVar234._8_4_;
        auVar360._12_4_ = fVar364 + auVar234._12_4_;
        auVar360._16_4_ = fVar245 + auVar234._16_4_;
        auVar360._20_4_ = fVar247 + auVar234._20_4_;
        auVar360._24_4_ = fVar253 + auVar234._24_4_;
        auVar360._28_4_ = fVar393 + auVar234._28_4_;
        fVar354 = auVar346._0_4_ * fVar243 * 0.0;
        fVar222 = auVar346._4_4_ * fVar250 * 0.0;
        auVar61._4_4_ = fVar222;
        auVar61._0_4_ = fVar354;
        fVar362 = auVar346._8_4_ * fVar266 * 0.0;
        auVar61._8_4_ = fVar362;
        fVar243 = auVar346._12_4_ * fVar272 * 0.0;
        auVar61._12_4_ = fVar243;
        fVar364 = auVar346._16_4_ * fVar285 * 0.0;
        auVar61._16_4_ = fVar364;
        fVar245 = auVar346._20_4_ * fVar249 * 0.0;
        auVar61._20_4_ = fVar245;
        fVar247 = auVar346._24_4_ * fVar252 * 0.0;
        auVar61._24_4_ = fVar247;
        auVar61._28_4_ = fVar186;
        auVar39 = vsubps_avx(auVar134,auVar58);
        auVar396._0_4_ = (float)local_3c0._0_4_ + fVar354;
        auVar396._4_4_ = (float)local_3c0._4_4_ + fVar222;
        auVar396._8_4_ = fStack_3b8 + fVar362;
        auVar396._12_4_ = fStack_3b4 + fVar243;
        auVar396._16_4_ = fStack_3b0 + fVar364;
        auVar396._20_4_ = fStack_3ac + fVar245;
        auVar396._24_4_ = fStack_3a8 + fVar247;
        auVar396._28_4_ = fStack_3a4 + fVar186;
        auVar378 = vsubps_avx(auVar314,auVar59);
        auVar40 = vsubps_avx(auVar234,auVar60);
        auVar278 = vsubps_avx(_local_3c0,auVar61);
        auVar41 = vsubps_avx(auVar360,auVar45);
        auVar42 = vsubps_avx(auVar396,auVar39);
        auVar62._4_4_ = auVar39._4_4_ * auVar41._4_4_;
        auVar62._0_4_ = auVar39._0_4_ * auVar41._0_4_;
        auVar62._8_4_ = auVar39._8_4_ * auVar41._8_4_;
        auVar62._12_4_ = auVar39._12_4_ * auVar41._12_4_;
        auVar62._16_4_ = auVar39._16_4_ * auVar41._16_4_;
        auVar62._20_4_ = auVar39._20_4_ * auVar41._20_4_;
        auVar62._24_4_ = auVar39._24_4_ * auVar41._24_4_;
        auVar62._28_4_ = fVar393;
        auVar63._4_4_ = auVar45._4_4_ * auVar42._4_4_;
        auVar63._0_4_ = auVar45._0_4_ * auVar42._0_4_;
        auVar63._8_4_ = auVar45._8_4_ * auVar42._8_4_;
        auVar63._12_4_ = auVar45._12_4_ * auVar42._12_4_;
        auVar63._16_4_ = auVar45._16_4_ * auVar42._16_4_;
        auVar63._20_4_ = auVar45._20_4_ * auVar42._20_4_;
        auVar63._24_4_ = auVar45._24_4_ * auVar42._24_4_;
        auVar63._28_4_ = fStack_3a4;
        auVar43 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = auVar44._4_4_ * auVar42._4_4_;
        auVar64._0_4_ = auVar44._0_4_ * auVar42._0_4_;
        auVar64._8_4_ = auVar44._8_4_ * auVar42._8_4_;
        auVar64._12_4_ = auVar44._12_4_ * auVar42._12_4_;
        auVar64._16_4_ = auVar44._16_4_ * auVar42._16_4_;
        auVar64._20_4_ = auVar44._20_4_ * auVar42._20_4_;
        auVar64._24_4_ = auVar44._24_4_ * auVar42._24_4_;
        auVar64._28_4_ = auVar42._28_4_;
        auVar47 = vsubps_avx(auVar347,auVar44);
        auVar65._4_4_ = auVar39._4_4_ * auVar47._4_4_;
        auVar65._0_4_ = auVar39._0_4_ * auVar47._0_4_;
        auVar65._8_4_ = auVar39._8_4_ * auVar47._8_4_;
        auVar65._12_4_ = auVar39._12_4_ * auVar47._12_4_;
        auVar65._16_4_ = auVar39._16_4_ * auVar47._16_4_;
        auVar65._20_4_ = auVar39._20_4_ * auVar47._20_4_;
        auVar65._24_4_ = auVar39._24_4_ * auVar47._24_4_;
        auVar65._28_4_ = auVar234._28_4_;
        auVar164 = vsubps_avx(auVar65,auVar64);
        auVar66._4_4_ = auVar47._4_4_ * auVar45._4_4_;
        auVar66._0_4_ = auVar47._0_4_ * auVar45._0_4_;
        auVar66._8_4_ = auVar47._8_4_ * auVar45._8_4_;
        auVar66._12_4_ = auVar47._12_4_ * auVar45._12_4_;
        auVar66._16_4_ = auVar47._16_4_ * auVar45._16_4_;
        auVar66._20_4_ = auVar47._20_4_ * auVar45._20_4_;
        auVar66._24_4_ = auVar47._24_4_ * auVar45._24_4_;
        auVar66._28_4_ = auVar42._28_4_;
        auVar67._4_4_ = auVar44._4_4_ * auVar41._4_4_;
        auVar67._0_4_ = auVar44._0_4_ * auVar41._0_4_;
        auVar67._8_4_ = auVar44._8_4_ * auVar41._8_4_;
        auVar67._12_4_ = auVar44._12_4_ * auVar41._12_4_;
        auVar67._16_4_ = auVar44._16_4_ * auVar41._16_4_;
        auVar67._20_4_ = auVar44._20_4_ * auVar41._20_4_;
        auVar67._24_4_ = auVar44._24_4_ * auVar41._24_4_;
        auVar67._28_4_ = auVar41._28_4_;
        auVar41 = vsubps_avx(auVar67,auVar66);
        auVar168._0_4_ = auVar43._0_4_ * 0.0 + auVar41._0_4_ + auVar164._0_4_ * 0.0;
        auVar168._4_4_ = auVar43._4_4_ * 0.0 + auVar41._4_4_ + auVar164._4_4_ * 0.0;
        auVar168._8_4_ = auVar43._8_4_ * 0.0 + auVar41._8_4_ + auVar164._8_4_ * 0.0;
        auVar168._12_4_ = auVar43._12_4_ * 0.0 + auVar41._12_4_ + auVar164._12_4_ * 0.0;
        auVar168._16_4_ = auVar43._16_4_ * 0.0 + auVar41._16_4_ + auVar164._16_4_ * 0.0;
        auVar168._20_4_ = auVar43._20_4_ * 0.0 + auVar41._20_4_ + auVar164._20_4_ * 0.0;
        auVar168._24_4_ = auVar43._24_4_ * 0.0 + auVar41._24_4_ + auVar164._24_4_ * 0.0;
        auVar168._28_4_ = auVar41._28_4_ + auVar41._28_4_ + auVar164._28_4_;
        auVar47 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
        auVar218 = ZEXT3264(auVar47);
        auVar378 = vblendvps_avx(auVar378,_local_600,auVar47);
        auVar40 = vblendvps_avx(auVar40,_local_620,auVar47);
        auVar278 = vblendvps_avx(auVar278,auVar292,auVar47);
        auVar41 = vblendvps_avx(auVar44,auVar347,auVar47);
        auVar42 = vblendvps_avx(auVar45,auVar360,auVar47);
        auVar43 = vblendvps_avx(auVar39,auVar396,auVar47);
        auVar44 = vblendvps_avx(auVar347,auVar44,auVar47);
        auVar45 = vblendvps_avx(auVar360,auVar45,auVar47);
        auVar161 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auVar163 = vblendvps_avx(auVar396,auVar39,auVar47);
        auVar44 = vsubps_avx(auVar44,auVar378);
        auVar39 = vsubps_avx(auVar45,auVar40);
        auVar164 = vsubps_avx(auVar163,auVar278);
        auVar163 = vsubps_avx(auVar40,auVar42);
        fVar354 = auVar39._0_4_;
        fVar185 = auVar278._0_4_;
        fVar245 = auVar39._4_4_;
        fVar271 = auVar278._4_4_;
        auVar68._4_4_ = fVar271 * fVar245;
        auVar68._0_4_ = fVar185 * fVar354;
        fVar264 = auVar39._8_4_;
        fVar298 = auVar278._8_4_;
        auVar68._8_4_ = fVar298 * fVar264;
        fVar272 = auVar39._12_4_;
        fVar242 = auVar278._12_4_;
        auVar68._12_4_ = fVar242 * fVar272;
        fVar286 = auVar39._16_4_;
        fVar244 = auVar278._16_4_;
        auVar68._16_4_ = fVar244 * fVar286;
        fVar323 = auVar39._20_4_;
        fVar246 = auVar278._20_4_;
        auVar68._20_4_ = fVar246 * fVar323;
        fVar178 = auVar39._24_4_;
        fVar248 = auVar278._24_4_;
        auVar68._24_4_ = fVar248 * fVar178;
        auVar68._28_4_ = auVar45._28_4_;
        fVar222 = auVar40._0_4_;
        fVar326 = auVar164._0_4_;
        fVar247 = auVar40._4_4_;
        fVar337 = auVar164._4_4_;
        auVar69._4_4_ = fVar337 * fVar247;
        auVar69._0_4_ = fVar326 * fVar222;
        fVar266 = auVar40._8_4_;
        fVar338 = auVar164._8_4_;
        auVar69._8_4_ = fVar338 * fVar266;
        fVar282 = auVar40._12_4_;
        fVar339 = auVar164._12_4_;
        auVar69._12_4_ = fVar339 * fVar282;
        fVar287 = auVar40._16_4_;
        fVar340 = auVar164._16_4_;
        auVar69._16_4_ = fVar340 * fVar287;
        fVar325 = auVar40._20_4_;
        fVar158 = auVar164._20_4_;
        auVar69._20_4_ = fVar158 * fVar325;
        fVar181 = auVar40._24_4_;
        fVar159 = auVar164._24_4_;
        auVar69._24_4_ = fVar159 * fVar181;
        auVar69._28_4_ = auVar360._28_4_;
        auVar45 = vsubps_avx(auVar69,auVar68);
        fVar362 = auVar378._0_4_;
        fVar250 = auVar378._4_4_;
        auVar70._4_4_ = fVar337 * fVar250;
        auVar70._0_4_ = fVar326 * fVar362;
        fVar268 = auVar378._8_4_;
        auVar70._8_4_ = fVar338 * fVar268;
        fVar283 = auVar378._12_4_;
        auVar70._12_4_ = fVar339 * fVar283;
        fVar321 = auVar378._16_4_;
        auVar70._16_4_ = fVar340 * fVar321;
        fVar252 = auVar378._20_4_;
        auVar70._20_4_ = fVar158 * fVar252;
        fVar182 = auVar378._24_4_;
        auVar70._24_4_ = fVar159 * fVar182;
        auVar70._28_4_ = auVar360._28_4_;
        fVar243 = auVar44._0_4_;
        auVar390._0_4_ = fVar185 * fVar243;
        fVar253 = auVar44._4_4_;
        auVar390._4_4_ = fVar271 * fVar253;
        fVar269 = auVar44._8_4_;
        auVar390._8_4_ = fVar298 * fVar269;
        fVar284 = auVar44._12_4_;
        auVar390._12_4_ = fVar242 * fVar284;
        fVar249 = auVar44._16_4_;
        auVar390._16_4_ = fVar244 * fVar249;
        fVar224 = auVar44._20_4_;
        auVar390._20_4_ = fVar246 * fVar224;
        fVar183 = auVar44._24_4_;
        auVar390._24_4_ = fVar248 * fVar183;
        auVar390._28_4_ = 0;
        auVar165 = vsubps_avx(auVar390,auVar70);
        auVar71._4_4_ = fVar247 * fVar253;
        auVar71._0_4_ = fVar222 * fVar243;
        auVar71._8_4_ = fVar266 * fVar269;
        auVar71._12_4_ = fVar282 * fVar284;
        auVar71._16_4_ = fVar287 * fVar249;
        auVar71._20_4_ = fVar325 * fVar224;
        auVar71._24_4_ = fVar181 * fVar183;
        auVar71._28_4_ = auVar360._28_4_;
        auVar72._4_4_ = fVar250 * fVar245;
        auVar72._0_4_ = fVar362 * fVar354;
        auVar72._8_4_ = fVar268 * fVar264;
        auVar72._12_4_ = fVar283 * fVar272;
        auVar72._16_4_ = fVar321 * fVar286;
        auVar72._20_4_ = fVar252 * fVar323;
        auVar72._24_4_ = fVar182 * fVar178;
        auVar72._28_4_ = auVar396._28_4_;
        auVar194 = vsubps_avx(auVar72,auVar71);
        auVar195 = vsubps_avx(auVar278,auVar43);
        fVar364 = auVar194._28_4_ + auVar165._28_4_;
        auVar199._0_4_ = auVar194._0_4_ + auVar165._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
        auVar199._4_4_ = auVar194._4_4_ + auVar165._4_4_ * 0.0 + auVar45._4_4_ * 0.0;
        auVar199._8_4_ = auVar194._8_4_ + auVar165._8_4_ * 0.0 + auVar45._8_4_ * 0.0;
        auVar199._12_4_ = auVar194._12_4_ + auVar165._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
        auVar199._16_4_ = auVar194._16_4_ + auVar165._16_4_ * 0.0 + auVar45._16_4_ * 0.0;
        auVar199._20_4_ = auVar194._20_4_ + auVar165._20_4_ * 0.0 + auVar45._20_4_ * 0.0;
        auVar199._24_4_ = auVar194._24_4_ + auVar165._24_4_ * 0.0 + auVar45._24_4_ * 0.0;
        auVar199._28_4_ = fVar364 + auVar45._28_4_;
        fVar251 = auVar163._0_4_;
        fVar186 = auVar163._4_4_;
        auVar73._4_4_ = fVar186 * auVar43._4_4_;
        auVar73._0_4_ = fVar251 * auVar43._0_4_;
        fVar299 = auVar163._8_4_;
        auVar73._8_4_ = fVar299 * auVar43._8_4_;
        fVar319 = auVar163._12_4_;
        auVar73._12_4_ = fVar319 * auVar43._12_4_;
        fVar320 = auVar163._16_4_;
        auVar73._16_4_ = fVar320 * auVar43._16_4_;
        fVar322 = auVar163._20_4_;
        auVar73._20_4_ = fVar322 * auVar43._20_4_;
        fVar324 = auVar163._24_4_;
        auVar73._24_4_ = fVar324 * auVar43._24_4_;
        auVar73._28_4_ = fVar364;
        fVar364 = auVar195._0_4_;
        fVar262 = auVar195._4_4_;
        auVar74._4_4_ = auVar42._4_4_ * fVar262;
        auVar74._0_4_ = auVar42._0_4_ * fVar364;
        fVar270 = auVar195._8_4_;
        auVar74._8_4_ = auVar42._8_4_ * fVar270;
        fVar285 = auVar195._12_4_;
        auVar74._12_4_ = auVar42._12_4_ * fVar285;
        fVar352 = auVar195._16_4_;
        auVar74._16_4_ = auVar42._16_4_ * fVar352;
        fVar175 = auVar195._20_4_;
        auVar74._20_4_ = auVar42._20_4_ * fVar175;
        fVar184 = auVar195._24_4_;
        auVar74._24_4_ = auVar42._24_4_ * fVar184;
        auVar74._28_4_ = auVar194._28_4_;
        auVar163 = vsubps_avx(auVar74,auVar73);
        auVar165 = vsubps_avx(auVar378,auVar41);
        fVar173 = auVar165._0_4_;
        fVar174 = auVar165._4_4_;
        auVar75._4_4_ = fVar174 * auVar43._4_4_;
        auVar75._0_4_ = fVar173 * auVar43._0_4_;
        fVar176 = auVar165._8_4_;
        auVar75._8_4_ = fVar176 * auVar43._8_4_;
        fVar177 = auVar165._12_4_;
        auVar75._12_4_ = fVar177 * auVar43._12_4_;
        fVar179 = auVar165._16_4_;
        auVar75._16_4_ = fVar179 * auVar43._16_4_;
        fVar180 = auVar165._20_4_;
        auVar75._20_4_ = fVar180 * auVar43._20_4_;
        fVar187 = auVar165._24_4_;
        auVar75._24_4_ = fVar187 * auVar43._24_4_;
        auVar75._28_4_ = auVar43._28_4_;
        auVar76._4_4_ = auVar41._4_4_ * fVar262;
        auVar76._0_4_ = auVar41._0_4_ * fVar364;
        auVar76._8_4_ = auVar41._8_4_ * fVar270;
        auVar76._12_4_ = auVar41._12_4_ * fVar285;
        auVar76._16_4_ = auVar41._16_4_ * fVar352;
        auVar76._20_4_ = auVar41._20_4_ * fVar175;
        auVar76._24_4_ = auVar41._24_4_ * fVar184;
        auVar76._28_4_ = auVar45._28_4_;
        auVar45 = vsubps_avx(auVar75,auVar76);
        auVar77._4_4_ = auVar42._4_4_ * fVar174;
        auVar77._0_4_ = auVar42._0_4_ * fVar173;
        auVar77._8_4_ = auVar42._8_4_ * fVar176;
        auVar77._12_4_ = auVar42._12_4_ * fVar177;
        auVar77._16_4_ = auVar42._16_4_ * fVar179;
        auVar77._20_4_ = auVar42._20_4_ * fVar180;
        auVar77._24_4_ = auVar42._24_4_ * fVar187;
        auVar77._28_4_ = auVar43._28_4_;
        auVar78._4_4_ = auVar41._4_4_ * fVar186;
        auVar78._0_4_ = auVar41._0_4_ * fVar251;
        auVar78._8_4_ = auVar41._8_4_ * fVar299;
        auVar78._12_4_ = auVar41._12_4_ * fVar319;
        auVar78._16_4_ = auVar41._16_4_ * fVar320;
        auVar78._20_4_ = auVar41._20_4_ * fVar322;
        auVar78._24_4_ = auVar41._24_4_ * fVar324;
        auVar78._28_4_ = auVar41._28_4_;
        auVar41 = vsubps_avx(auVar78,auVar77);
        auVar258._0_4_ = auVar163._0_4_ * 0.0 + auVar41._0_4_ + auVar45._0_4_ * 0.0;
        auVar258._4_4_ = auVar163._4_4_ * 0.0 + auVar41._4_4_ + auVar45._4_4_ * 0.0;
        auVar258._8_4_ = auVar163._8_4_ * 0.0 + auVar41._8_4_ + auVar45._8_4_ * 0.0;
        auVar258._12_4_ = auVar163._12_4_ * 0.0 + auVar41._12_4_ + auVar45._12_4_ * 0.0;
        auVar258._16_4_ = auVar163._16_4_ * 0.0 + auVar41._16_4_ + auVar45._16_4_ * 0.0;
        auVar258._20_4_ = auVar163._20_4_ * 0.0 + auVar41._20_4_ + auVar45._20_4_ * 0.0;
        auVar258._24_4_ = auVar163._24_4_ * 0.0 + auVar41._24_4_ + auVar45._24_4_ * 0.0;
        auVar258._28_4_ = auVar41._28_4_ + auVar41._28_4_ + auVar45._28_4_;
        auVar261 = ZEXT3264(auVar258);
        auVar163 = vmaxps_avx(auVar199,auVar258);
        auVar163 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
        auVar228 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auVar161 = vpand_avx(auVar161,auVar228);
        auVar228 = vpmovsxwd_avx(auVar161);
        auVar229 = vpunpckhwd_avx(auVar161,auVar161);
        auVar236._16_16_ = auVar229;
        auVar236._0_16_ = auVar228;
        if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar236 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar236 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar236 >> 0x7f,0) == '\0') &&
              (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar229 >> 0x3f,0) == '\0') &&
            (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar229[0xf]) {
LAB_011bbe4e:
          auVar281 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar240 = ZEXT3264(auVar236);
          auVar382 = ZEXT3264(local_560);
          auVar336 = ZEXT3264(local_580);
        }
        else {
          auVar79._4_4_ = fVar262 * fVar245;
          auVar79._0_4_ = fVar364 * fVar354;
          auVar79._8_4_ = fVar270 * fVar264;
          auVar79._12_4_ = fVar285 * fVar272;
          auVar79._16_4_ = fVar352 * fVar286;
          auVar79._20_4_ = fVar175 * fVar323;
          auVar79._24_4_ = fVar184 * fVar178;
          auVar79._28_4_ = auVar229._12_4_;
          auVar370._0_4_ = fVar251 * fVar326;
          auVar370._4_4_ = fVar186 * fVar337;
          auVar370._8_4_ = fVar299 * fVar338;
          auVar370._12_4_ = fVar319 * fVar339;
          auVar370._16_4_ = fVar320 * fVar340;
          auVar370._20_4_ = fVar322 * fVar158;
          auVar370._24_4_ = fVar324 * fVar159;
          auVar370._28_4_ = 0;
          auVar163 = vsubps_avx(auVar370,auVar79);
          auVar80._4_4_ = fVar174 * fVar337;
          auVar80._0_4_ = fVar173 * fVar326;
          auVar80._8_4_ = fVar176 * fVar338;
          auVar80._12_4_ = fVar177 * fVar339;
          auVar80._16_4_ = fVar179 * fVar340;
          auVar80._20_4_ = fVar180 * fVar158;
          auVar80._24_4_ = fVar187 * fVar159;
          auVar80._28_4_ = auVar164._28_4_;
          auVar81._4_4_ = fVar262 * fVar253;
          auVar81._0_4_ = fVar364 * fVar243;
          auVar81._8_4_ = fVar270 * fVar269;
          auVar81._12_4_ = fVar285 * fVar284;
          auVar81._16_4_ = fVar352 * fVar249;
          auVar81._20_4_ = fVar175 * fVar224;
          auVar81._24_4_ = fVar184 * fVar183;
          auVar81._28_4_ = auVar195._28_4_;
          auVar42 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar186 * fVar253;
          auVar82._0_4_ = fVar251 * fVar243;
          auVar82._8_4_ = fVar299 * fVar269;
          auVar82._12_4_ = fVar319 * fVar284;
          auVar82._16_4_ = fVar320 * fVar249;
          auVar82._20_4_ = fVar322 * fVar224;
          auVar82._24_4_ = fVar324 * fVar183;
          auVar82._28_4_ = auVar199._28_4_;
          auVar83._4_4_ = fVar174 * fVar245;
          auVar83._0_4_ = fVar173 * fVar354;
          auVar83._8_4_ = fVar176 * fVar264;
          auVar83._12_4_ = fVar177 * fVar272;
          auVar83._16_4_ = fVar179 * fVar286;
          auVar83._20_4_ = fVar180 * fVar323;
          auVar83._24_4_ = fVar187 * fVar178;
          auVar83._28_4_ = auVar39._28_4_;
          auVar43 = vsubps_avx(auVar83,auVar82);
          auVar305._0_4_ = auVar163._0_4_ * 0.0 + auVar43._0_4_ + auVar42._0_4_ * 0.0;
          auVar305._4_4_ = auVar163._4_4_ * 0.0 + auVar43._4_4_ + auVar42._4_4_ * 0.0;
          auVar305._8_4_ = auVar163._8_4_ * 0.0 + auVar43._8_4_ + auVar42._8_4_ * 0.0;
          auVar305._12_4_ = auVar163._12_4_ * 0.0 + auVar43._12_4_ + auVar42._12_4_ * 0.0;
          auVar305._16_4_ = auVar163._16_4_ * 0.0 + auVar43._16_4_ + auVar42._16_4_ * 0.0;
          auVar305._20_4_ = auVar163._20_4_ * 0.0 + auVar43._20_4_ + auVar42._20_4_ * 0.0;
          auVar305._24_4_ = auVar163._24_4_ * 0.0 + auVar43._24_4_ + auVar42._24_4_ * 0.0;
          auVar305._28_4_ = auVar39._28_4_ + auVar43._28_4_ + auVar199._28_4_;
          auVar41 = vrcpps_avx(auVar305);
          fVar354 = auVar41._0_4_;
          fVar243 = auVar41._4_4_;
          auVar84._4_4_ = auVar305._4_4_ * fVar243;
          auVar84._0_4_ = auVar305._0_4_ * fVar354;
          fVar364 = auVar41._8_4_;
          auVar84._8_4_ = auVar305._8_4_ * fVar364;
          fVar245 = auVar41._12_4_;
          auVar84._12_4_ = auVar305._12_4_ * fVar245;
          fVar253 = auVar41._16_4_;
          auVar84._16_4_ = auVar305._16_4_ * fVar253;
          fVar262 = auVar41._20_4_;
          auVar84._20_4_ = auVar305._20_4_ * fVar262;
          fVar264 = auVar41._24_4_;
          auVar84._24_4_ = auVar305._24_4_ * fVar264;
          auVar84._28_4_ = auVar195._28_4_;
          auVar371._8_4_ = 0x3f800000;
          auVar371._0_8_ = 0x3f8000003f800000;
          auVar371._12_4_ = 0x3f800000;
          auVar371._16_4_ = 0x3f800000;
          auVar371._20_4_ = 0x3f800000;
          auVar371._24_4_ = 0x3f800000;
          auVar371._28_4_ = 0x3f800000;
          auVar45 = vsubps_avx(auVar371,auVar84);
          fVar354 = auVar45._0_4_ * fVar354 + fVar354;
          fVar243 = auVar45._4_4_ * fVar243 + fVar243;
          fVar364 = auVar45._8_4_ * fVar364 + fVar364;
          fVar245 = auVar45._12_4_ * fVar245 + fVar245;
          fVar253 = auVar45._16_4_ * fVar253 + fVar253;
          fVar262 = auVar45._20_4_ * fVar262 + fVar262;
          fVar264 = auVar45._24_4_ * fVar264 + fVar264;
          auVar85._4_4_ =
               (auVar163._4_4_ * fVar250 + auVar42._4_4_ * fVar247 + auVar43._4_4_ * fVar271) *
               fVar243;
          auVar85._0_4_ =
               (auVar163._0_4_ * fVar362 + auVar42._0_4_ * fVar222 + auVar43._0_4_ * fVar185) *
               fVar354;
          auVar85._8_4_ =
               (auVar163._8_4_ * fVar268 + auVar42._8_4_ * fVar266 + auVar43._8_4_ * fVar298) *
               fVar364;
          auVar85._12_4_ =
               (auVar163._12_4_ * fVar283 + auVar42._12_4_ * fVar282 + auVar43._12_4_ * fVar242) *
               fVar245;
          auVar85._16_4_ =
               (auVar163._16_4_ * fVar321 + auVar42._16_4_ * fVar287 + auVar43._16_4_ * fVar244) *
               fVar253;
          auVar85._20_4_ =
               (auVar163._20_4_ * fVar252 + auVar42._20_4_ * fVar325 + auVar43._20_4_ * fVar246) *
               fVar262;
          auVar85._24_4_ =
               (auVar163._24_4_ * fVar182 + auVar42._24_4_ * fVar181 + auVar43._24_4_ * fVar248) *
               fVar264;
          auVar85._28_4_ = auVar378._28_4_ + auVar44._28_4_ + auVar278._28_4_;
          auVar228 = vpermilps_avx(ZEXT416(uVar149),0);
          auVar237._16_16_ = auVar228;
          auVar237._0_16_ = auVar228;
          auVar163 = vcmpps_avx(auVar237,auVar85,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar276._4_4_ = uVar12;
          auVar276._0_4_ = uVar12;
          auVar276._8_4_ = uVar12;
          auVar276._12_4_ = uVar12;
          auVar276._16_4_ = uVar12;
          auVar276._20_4_ = uVar12;
          auVar276._24_4_ = uVar12;
          auVar276._28_4_ = uVar12;
          auVar378 = vcmpps_avx(auVar85,auVar276,2);
          auVar163 = vandps_avx(auVar378,auVar163);
          auVar228 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar161 = vpand_avx(auVar161,auVar228);
          auVar228 = vpmovsxwd_avx(auVar161);
          auVar229 = vpshufd_avx(auVar161,0xee);
          auVar229 = vpmovsxwd_avx(auVar229);
          auVar236._16_16_ = auVar229;
          auVar236._0_16_ = auVar228;
          if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar236 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar236 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar236 >> 0x7f,0) == '\0') &&
                (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar229 >> 0x3f,0) == '\0') &&
              (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar229[0xf]) goto LAB_011bbe4e;
          auVar163 = vcmpps_avx(ZEXT832(0) << 0x20,auVar305,4);
          auVar228 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar161 = vpand_avx(auVar161,auVar228);
          auVar228 = vpmovsxwd_avx(auVar161);
          auVar161 = vpunpckhwd_avx(auVar161,auVar161);
          auVar240 = ZEXT1664(auVar161);
          auVar293._16_16_ = auVar161;
          auVar293._0_16_ = auVar228;
          auVar281 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar382 = ZEXT3264(local_560);
          auVar336 = ZEXT3264(local_580);
          if ((((((((auVar293 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar293 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar293 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar293 >> 0x7f,0) != '\0') ||
                (auVar293 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar161 >> 0x3f,0) != '\0') ||
              (auVar293 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar161[0xf] < '\0') {
            auVar238._0_4_ = auVar199._0_4_ * fVar354;
            auVar238._4_4_ = auVar199._4_4_ * fVar243;
            auVar238._8_4_ = auVar199._8_4_ * fVar364;
            auVar238._12_4_ = auVar199._12_4_ * fVar245;
            auVar238._16_4_ = auVar199._16_4_ * fVar253;
            auVar238._20_4_ = auVar199._20_4_ * fVar262;
            auVar238._24_4_ = auVar199._24_4_ * fVar264;
            auVar238._28_4_ = 0;
            auVar86._4_4_ = auVar258._4_4_ * fVar243;
            auVar86._0_4_ = auVar258._0_4_ * fVar354;
            auVar86._8_4_ = auVar258._8_4_ * fVar364;
            auVar86._12_4_ = auVar258._12_4_ * fVar245;
            auVar86._16_4_ = auVar258._16_4_ * fVar253;
            auVar86._20_4_ = auVar258._20_4_ * fVar262;
            auVar86._24_4_ = auVar258._24_4_ * fVar264;
            auVar86._28_4_ = auVar45._28_4_ + auVar41._28_4_;
            auVar277._8_4_ = 0x3f800000;
            auVar277._0_8_ = 0x3f8000003f800000;
            auVar277._12_4_ = 0x3f800000;
            auVar277._16_4_ = 0x3f800000;
            auVar277._20_4_ = 0x3f800000;
            auVar277._24_4_ = 0x3f800000;
            auVar277._28_4_ = 0x3f800000;
            auVar163 = vsubps_avx(auVar277,auVar238);
            auVar261 = ZEXT3264(auVar163);
            auVar163 = vblendvps_avx(auVar163,auVar238,auVar47);
            auVar382 = ZEXT3264(auVar163);
            auVar163 = vsubps_avx(auVar277,auVar86);
            auVar240 = ZEXT3264(auVar163);
            _local_3e0 = vblendvps_avx(auVar163,auVar86,auVar47);
            auVar281 = ZEXT3264(auVar293);
            auVar336 = ZEXT3264(auVar85);
          }
        }
        auVar378 = auVar382._0_32_;
        auVar163 = auVar336._0_32_;
        auVar278 = auVar281._0_32_;
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar278 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar278 >> 0x7f,0) == '\0') &&
              (auVar281 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar278 >> 0xbf,0) == '\0') &&
            (auVar281 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar281[0x1f]) {
          bVar153 = false;
        }
        else {
          auVar41 = vsubps_avx(auVar346,auVar197);
          fVar222 = auVar197._0_4_ + auVar382._0_4_ * auVar41._0_4_;
          fVar362 = auVar197._4_4_ + auVar382._4_4_ * auVar41._4_4_;
          fVar243 = auVar197._8_4_ + auVar382._8_4_ * auVar41._8_4_;
          fVar364 = auVar197._12_4_ + auVar382._12_4_ * auVar41._12_4_;
          fVar245 = auVar197._16_4_ + auVar382._16_4_ * auVar41._16_4_;
          fVar247 = auVar197._20_4_ + auVar382._20_4_ * auVar41._20_4_;
          fVar250 = auVar197._24_4_ + auVar382._24_4_ * auVar41._24_4_;
          fVar253 = auVar41._28_4_ + 0.0;
          fVar354 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
          auVar87._4_4_ = (fVar362 + fVar362) * fVar354;
          auVar87._0_4_ = (fVar222 + fVar222) * fVar354;
          auVar87._8_4_ = (fVar243 + fVar243) * fVar354;
          auVar87._12_4_ = (fVar364 + fVar364) * fVar354;
          auVar87._16_4_ = (fVar245 + fVar245) * fVar354;
          auVar87._20_4_ = (fVar247 + fVar247) * fVar354;
          auVar87._24_4_ = (fVar250 + fVar250) * fVar354;
          auVar87._28_4_ = fVar253 + fVar253;
          auVar41 = vcmpps_avx(auVar163,auVar87,6);
          auVar42 = auVar278 & auVar41;
          if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar42 >> 0x7f,0) != '\0') ||
                (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar42 >> 0xbf,0) != '\0') ||
              (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar42[0x1f] < '\0') {
            local_240 = vandps_avx(auVar41,auVar278);
            local_2e0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
            fStack_2dc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
            fStack_2d8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
            fStack_2d4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
            fStack_2d0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
            fStack_2cc = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
            fStack_2c8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
            fStack_2c4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
            local_2a0 = 0;
            uStack_288 = uStack_708;
            uStack_278 = uStack_628;
            uStack_268 = uStack_638;
            auVar218 = ZEXT1664(_local_650);
            local_3e0._4_4_ = fStack_2dc;
            local_3e0._0_4_ = local_2e0;
            uStack_3d8._0_4_ = fStack_2d8;
            uStack_3d8._4_4_ = fStack_2d4;
            uStack_3d0._0_4_ = fStack_2d0;
            uStack_3d0._4_4_ = fStack_2cc;
            auVar142 = _local_3e0;
            uStack_3c8._0_4_ = fStack_2c8;
            uStack_3c8._4_4_ = fStack_2c4;
            auVar278 = _local_3e0;
            _local_3e0 = auVar278;
            if ((pGVar155->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar153 = true, pGVar155->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar210._0_4_ = 1.0 / local_4c0;
                auVar210._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar161 = vshufps_avx(auVar210,auVar210,0);
                auVar218 = ZEXT3264(CONCAT1616(auVar161,auVar161));
                local_220[0] = auVar161._0_4_ * (auVar382._0_4_ + 0.0);
                local_220[1] = auVar161._4_4_ * (auVar382._4_4_ + 1.0);
                local_220[2] = auVar161._8_4_ * (auVar382._8_4_ + 2.0);
                local_220[3] = auVar161._12_4_ * (auVar382._12_4_ + 3.0);
                fStack_210 = auVar161._0_4_ * (auVar382._16_4_ + 4.0);
                fStack_20c = auVar161._4_4_ * (auVar382._20_4_ + 5.0);
                fStack_208 = auVar161._8_4_ * (auVar382._24_4_ + 6.0);
                fStack_204 = auVar382._28_4_ + 7.0;
                uStack_3d0 = auVar142._16_8_;
                uStack_3c8 = auVar278._24_8_;
                local_200 = local_3e0;
                uStack_1f8 = uStack_3d8;
                uStack_1f0 = uStack_3d0;
                uStack_1e8 = uStack_3c8;
                local_1e0 = auVar163;
                iVar146 = vmovmskps_avx(local_240);
                uVar156 = CONCAT44((int)((ulong)lVar154 >> 0x20),iVar146);
                uVar147 = 0;
                if (uVar156 != 0) {
                  for (; (uVar156 >> uVar147 & 1) == 0; uVar147 = uVar147 + 1) {
                  }
                }
                if (iVar146 == 0) goto LAB_011bae35;
                local_6c0 = vshufps_avx(ZEXT416(uVar34),ZEXT416(uVar34),0);
                auStack_6b0 = auVar346._16_16_;
                _local_760 = vshufps_avx(ZEXT416(uVar35),ZEXT416(uVar35),0);
                _auStack_750 = auVar40._16_16_;
                _auStack_590 = auVar369._16_16_;
                _local_5a0 = *local_700;
                _auStack_5bc = auVar234._4_28_;
                local_5c0 = (undefined1  [4])*(undefined4 *)(ray + k * 4 + 0x80);
                _local_5e0 = auVar314;
                local_580 = auVar163;
                local_560 = auVar378;
                local_300 = auVar378;
                local_2c0 = auVar163;
                local_29c = uVar36;
                local_290 = local_710;
                local_280 = local_630;
                local_270 = local_640;
                local_260 = _local_650;
                do {
                  local_460 = local_220[uVar147];
                  local_450 = *(undefined4 *)((long)&local_200 + uVar147 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar147 * 4);
                  fVar222 = 1.0 - local_460;
                  fVar362 = local_460 * (fVar222 + fVar222) - fVar222 * fVar222;
                  auVar261 = ZEXT464((uint)fVar362);
                  fVar354 = local_460 * 3.0;
                  auVar161 = ZEXT416((uint)((fVar222 * -2.0 * local_460 + local_460 * local_460) *
                                           0.5));
                  auVar161 = vshufps_avx(auVar161,auVar161,0);
                  auVar228 = ZEXT416((uint)(((fVar222 + fVar222) * (fVar354 + 2.0) +
                                            fVar222 * fVar222 * -3.0) * 0.5));
                  auVar228 = vshufps_avx(auVar228,auVar228,0);
                  auVar229 = ZEXT416((uint)(((local_460 + local_460) * (fVar354 + -5.0) +
                                            local_460 * fVar354) * 0.5));
                  auVar229 = vshufps_avx(auVar229,auVar229,0);
                  local_6f0.context = context->user;
                  auVar13 = vshufps_avx(ZEXT416((uint)(fVar362 * 0.5)),
                                        ZEXT416((uint)(fVar362 * 0.5)),0);
                  auVar211._0_4_ =
                       auVar13._0_4_ * (float)local_710._0_4_ +
                       auVar229._0_4_ * (float)local_630._0_4_ +
                       auVar161._0_4_ * (float)local_650._0_4_ +
                       auVar228._0_4_ * (float)local_640._0_4_;
                  auVar211._4_4_ =
                       auVar13._4_4_ * (float)local_710._4_4_ +
                       auVar229._4_4_ * (float)local_630._4_4_ +
                       auVar161._4_4_ * (float)local_650._4_4_ +
                       auVar228._4_4_ * (float)local_640._4_4_;
                  auVar211._8_4_ =
                       auVar13._8_4_ * (float)uStack_708 +
                       auVar229._8_4_ * (float)uStack_628 +
                       auVar161._8_4_ * fStack_648 + auVar228._8_4_ * (float)uStack_638;
                  auVar211._12_4_ =
                       auVar13._12_4_ * uStack_708._4_4_ +
                       auVar229._12_4_ * uStack_628._4_4_ +
                       auVar161._12_4_ * fStack_644 + auVar228._12_4_ * uStack_638._4_4_;
                  local_490 = (RTCHitN  [16])vshufps_avx(auVar211,auVar211,0);
                  local_480 = vshufps_avx(auVar211,auVar211,0x55);
                  auVar240 = ZEXT1664(local_480);
                  local_470 = vshufps_avx(auVar211,auVar211,0xaa);
                  auVar218 = ZEXT1664(local_470);
                  local_440 = local_760;
                  uStack_438 = uStack_758;
                  local_430 = local_6c0._0_8_;
                  uStack_428 = local_6c0._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_41c = (local_6f0.context)->instID[0];
                  local_420 = uStack_41c;
                  uStack_418 = uStack_41c;
                  uStack_414 = uStack_41c;
                  uStack_410 = (local_6f0.context)->instPrimID[0];
                  uStack_40c = uStack_410;
                  uStack_408 = uStack_410;
                  uStack_404 = uStack_410;
                  local_7c0 = _local_5a0;
                  local_6f0.valid = (int *)local_7c0;
                  local_6f0.geometryUserPtr = pGVar155->userPtr;
                  local_6f0.hit = local_490;
                  local_6f0.N = 4;
                  local_6f0.ray = (RTCRayN *)ray;
                  fStack_45c = local_460;
                  fStack_458 = local_460;
                  fStack_454 = local_460;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  if (pGVar155->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar218 = ZEXT1664(local_470);
                    auVar240 = ZEXT1664(local_480);
                    auVar261 = ZEXT464((uint)fVar362);
                    (*pGVar155->occlusionFilterN)(&local_6f0);
                    auVar336 = ZEXT3264(local_580);
                    auVar382 = ZEXT3264(local_560);
                    fVar375 = (float)local_7a0._0_4_;
                    fVar383 = (float)local_7a0._4_4_;
                    fVar384 = fStack_798;
                    fVar386 = fStack_794;
                    fVar225 = fStack_790;
                    fVar223 = fStack_78c;
                    fVar241 = fStack_788;
                  }
                  if (local_7c0 == (undefined1  [16])0x0) {
                    auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar161 = auVar161 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var38 = context->args->filter;
                    if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar155->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar261 = ZEXT1664(auVar261._0_16_);
                      (*p_Var38)(&local_6f0);
                      auVar336 = ZEXT3264(local_580);
                      auVar382 = ZEXT3264(local_560);
                      fVar375 = (float)local_7a0._0_4_;
                      fVar383 = (float)local_7a0._4_4_;
                      fVar384 = fStack_798;
                      fVar386 = fStack_794;
                      fVar225 = fStack_790;
                      fVar223 = fStack_78c;
                      fVar241 = fStack_788;
                    }
                    auVar228 = vpcmpeqd_avx(local_7c0,_DAT_01f7aa10);
                    auVar161 = auVar228 ^ _DAT_01f7ae20;
                    auVar212._8_4_ = 0xff800000;
                    auVar212._0_8_ = 0xff800000ff800000;
                    auVar212._12_4_ = 0xff800000;
                    auVar218 = ZEXT1664(auVar212);
                    auVar228 = vblendvps_avx(auVar212,*(undefined1 (*) [16])(local_6f0.ray + 0x80),
                                             auVar228);
                    *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar228;
                  }
                  auVar378 = auVar382._0_32_;
                  auVar163 = auVar336._0_32_;
                  auVar193._8_8_ = 0x100000001;
                  auVar193._0_8_ = 0x100000001;
                  if ((auVar193 & auVar161) != (undefined1  [16])0x0) {
                    bVar153 = true;
                    break;
                  }
                  *(undefined1 (*) [4])(ray + k * 4 + 0x80) = local_5c0;
                  uVar156 = uVar156 ^ 1L << (uVar147 & 0x3f);
                  uVar147 = 0;
                  if (uVar156 != 0) {
                    for (; (uVar156 >> uVar147 & 1) == 0; uVar147 = uVar147 + 1) {
                    }
                  }
                  bVar153 = false;
                } while (uVar156 != 0);
              }
              goto LAB_011baf10;
            }
          }
LAB_011bae35:
          bVar153 = false;
        }
      }
LAB_011baf10:
      local_580 = auVar163;
      local_560 = auVar378;
      if (8 < (int)uVar36) {
        _local_620 = vpshufd_avx(ZEXT416(uVar36),0);
        auVar161 = vshufps_avx(local_780._0_16_,local_780._0_16_,0);
        register0x00001210 = auVar161;
        _local_3c0 = auVar161;
        auVar161 = vpermilps_avx(ZEXT416(uVar149),0);
        local_e0._16_16_ = auVar161;
        local_e0._0_16_ = auVar161;
        auVar162._0_4_ = 1.0 / local_4c0;
        auVar162._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar161 = vshufps_avx(auVar162,auVar162,0);
        register0x00001210 = auVar161;
        _local_100 = auVar161;
        local_310 = vshufps_avx(ZEXT416((uint)local_7a8),ZEXT416((uint)local_7a8),0);
        local_660 = vshufps_avx(ZEXT416((uint)local_660._0_4_),ZEXT416((uint)local_660._0_4_),0);
        lVar150 = 8;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar150 * 4 + lVar151);
          fVar354 = *(float *)*pauVar9;
          fVar222 = *(float *)(*pauVar9 + 4);
          fVar362 = *(float *)(*pauVar9 + 8);
          fVar243 = *(float *)(*pauVar9 + 0xc);
          fVar364 = *(float *)(*pauVar9 + 0x10);
          fVar245 = *(float *)(*pauVar9 + 0x14);
          fVar247 = *(float *)(*pauVar9 + 0x18);
          auVar141 = *pauVar9;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b37f0 + lVar150 * 4);
          fVar250 = *(float *)*pauVar11;
          fVar253 = *(float *)(*pauVar11 + 4);
          fVar262 = *(float *)(*pauVar11 + 8);
          fVar264 = *(float *)(*pauVar11 + 0xc);
          fVar266 = *(float *)(*pauVar11 + 0x10);
          fVar268 = *(float *)(*pauVar11 + 0x14);
          fVar269 = *(float *)(*pauVar11 + 0x18);
          auVar140 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b3c74 + lVar150 * 4);
          fVar270 = *(float *)*pauVar11;
          fVar272 = *(float *)(*pauVar11 + 4);
          fVar282 = *(float *)(*pauVar11 + 8);
          fVar283 = *(float *)(*pauVar11 + 0xc);
          fVar284 = *(float *)(*pauVar11 + 0x10);
          fVar285 = *(float *)(*pauVar11 + 0x14);
          fVar286 = *(float *)(*pauVar11 + 0x18);
          auVar139 = *pauVar11;
          pfVar1 = (float *)(lVar151 + 0x21b40f8 + lVar150 * 4);
          fVar287 = *pfVar1;
          fVar321 = pfVar1[1];
          fVar249 = pfVar1[2];
          fVar352 = pfVar1[3];
          fVar323 = pfVar1[4];
          fVar325 = pfVar1[5];
          fVar252 = pfVar1[6];
          fVar175 = auVar240._28_4_;
          fVar224 = fVar175 + auVar218._28_4_;
          fVar185 = fVar175 + fVar175 + fStack_4c4;
          fVar271 = fVar175 + fVar224;
          auVar239._0_4_ =
               (float)local_380._0_4_ * fVar354 +
               (float)local_360._0_4_ * fVar250 +
               (float)local_6a0._0_4_ * fVar270 + (float)local_4e0._0_4_ * fVar287;
          auVar239._4_4_ =
               (float)local_380._4_4_ * fVar222 +
               (float)local_360._4_4_ * fVar253 +
               (float)local_6a0._4_4_ * fVar272 + (float)local_4e0._4_4_ * fVar321;
          auVar239._8_4_ =
               fStack_378 * fVar362 +
               fStack_358 * fVar262 + fStack_698 * fVar282 + fStack_4d8 * fVar249;
          auVar239._12_4_ =
               fStack_374 * fVar243 +
               fStack_354 * fVar264 + fStack_694 * fVar283 + fStack_4d4 * fVar352;
          auVar239._16_4_ =
               fStack_370 * fVar364 +
               fStack_350 * fVar266 + fStack_690 * fVar284 + fStack_4d0 * fVar323;
          auVar239._20_4_ =
               fStack_36c * fVar245 +
               fStack_34c * fVar268 + fStack_68c * fVar285 + fStack_4cc * fVar325;
          auVar239._24_4_ =
               fStack_368 * fVar247 +
               fStack_348 * fVar269 + fStack_688 * fVar286 + fStack_4c8 * fVar252;
          auVar239._28_4_ = fVar224 + fVar185;
          auVar240 = ZEXT3264(auVar239);
          local_780._0_4_ =
               fVar394 * fVar354 +
               (float)local_120._0_4_ * fVar250 + fVar206 * fVar270 + fVar375 * fVar287;
          local_780._4_4_ =
               fVar398 * fVar222 +
               (float)local_120._4_4_ * fVar253 + fVar219 * fVar272 + fVar383 * fVar321;
          local_780._8_4_ =
               fVar399 * fVar362 + fStack_118 * fVar262 + fVar220 * fVar282 + fVar384 * fVar249;
          local_780._12_4_ =
               fVar400 * fVar243 + fStack_114 * fVar264 + fVar221 * fVar283 + fVar386 * fVar352;
          local_780._16_4_ =
               fVar394 * fVar364 + fStack_110 * fVar266 + fVar206 * fVar284 + fVar225 * fVar323;
          local_780._20_4_ =
               fVar398 * fVar245 + fStack_10c * fVar268 + fVar219 * fVar285 + fVar223 * fVar325;
          local_780._24_4_ =
               fVar399 * fVar247 + fStack_108 * fVar269 + fVar220 * fVar286 + fVar241 * fVar252;
          local_780._28_4_ = fVar185 + fVar175 + fVar175 + auVar261._28_4_;
          fVar224 = fVar354 * (float)local_180._0_4_ +
                    fVar250 * (float)local_160._0_4_ +
                    (float)local_a0._0_4_ * fVar270 + fVar287 * (float)local_140._0_4_;
          fVar175 = fVar222 * (float)local_180._4_4_ +
                    fVar253 * (float)local_160._4_4_ +
                    (float)local_a0._4_4_ * fVar272 + fVar321 * (float)local_140._4_4_;
          fVar178 = fVar362 * fStack_178 +
                    fVar262 * fStack_158 + fStack_98 * fVar282 + fVar249 * fStack_138;
          fVar181 = fVar243 * fStack_174 +
                    fVar264 * fStack_154 + fStack_94 * fVar283 + fVar352 * fStack_134;
          fVar182 = fVar364 * fStack_170 +
                    fVar266 * fStack_150 + fStack_90 * fVar284 + fVar323 * fStack_130;
          fVar183 = fVar245 * fStack_16c +
                    fVar268 * fStack_14c + fStack_8c * fVar285 + fVar325 * fStack_12c;
          fVar184 = fVar247 * fStack_168 +
                    fVar269 * fStack_148 + fStack_88 * fVar286 + fVar252 * fStack_128;
          fVar185 = fVar185 + fVar271;
          auVar142 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar150 * 4 + lVar151);
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b5c10 + lVar150 * 4);
          fVar354 = *(float *)*pauVar11;
          fVar222 = *(float *)(*pauVar11 + 4);
          fVar362 = *(float *)(*pauVar11 + 8);
          fVar243 = *(float *)(*pauVar11 + 0xc);
          fVar364 = *(float *)(*pauVar11 + 0x10);
          fVar245 = *(float *)(*pauVar11 + 0x14);
          fVar247 = *(float *)(*pauVar11 + 0x18);
          auVar144 = *pauVar11;
          pfVar1 = (float *)(lVar151 + 0x21b6094 + lVar150 * 4);
          fVar250 = *pfVar1;
          fVar253 = pfVar1[1];
          fVar262 = pfVar1[2];
          fVar264 = pfVar1[3];
          fVar266 = pfVar1[4];
          fVar268 = pfVar1[5];
          fVar269 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b6518 + lVar150 * 4);
          fVar270 = *(float *)*pauVar11;
          fVar272 = *(float *)(*pauVar11 + 4);
          fVar282 = *(float *)(*pauVar11 + 8);
          fVar283 = *(float *)(*pauVar11 + 0xc);
          fVar284 = *(float *)(*pauVar11 + 0x10);
          fVar285 = *(float *)(*pauVar11 + 0x14);
          fVar286 = *(float *)(*pauVar11 + 0x18);
          auVar143 = *pauVar11;
          fVar298 = fStack_4c4 + *(float *)pauVar11[1];
          fVar271 = fStack_4c4 + fStack_4c4 + fVar271;
          local_800._0_4_ = auVar142._0_4_;
          local_800._4_4_ = auVar142._4_4_;
          fStack_7f8 = auVar142._8_4_;
          fStack_7f4 = auVar142._12_4_;
          fStack_7f0 = auVar142._16_4_;
          fStack_7ec = auVar142._20_4_;
          fStack_7e8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(catmullrom_basis1 + lVar150 * 4 + lVar151))[1]
          ;
          auVar379._0_4_ =
               (float)local_380._0_4_ * (float)local_800 +
               (float)local_360._0_4_ * fVar354 +
               (float)local_6a0._0_4_ * fVar250 + (float)local_4e0._0_4_ * fVar270;
          auVar379._4_4_ =
               (float)local_380._4_4_ * local_800._4_4_ +
               (float)local_360._4_4_ * fVar222 +
               (float)local_6a0._4_4_ * fVar253 + (float)local_4e0._4_4_ * fVar272;
          auVar379._8_4_ =
               fStack_378 * fStack_7f8 +
               fStack_358 * fVar362 + fStack_698 * fVar262 + fStack_4d8 * fVar282;
          auVar379._12_4_ =
               fStack_374 * fStack_7f4 +
               fStack_354 * fVar243 + fStack_694 * fVar264 + fStack_4d4 * fVar283;
          auVar379._16_4_ =
               fStack_370 * fStack_7f0 +
               fStack_350 * fVar364 + fStack_690 * fVar266 + fStack_4d0 * fVar284;
          auVar379._20_4_ =
               fStack_36c * fStack_7ec +
               fStack_34c * fVar245 + fStack_68c * fVar268 + fStack_4cc * fVar285;
          auVar379._24_4_ =
               fStack_368 * fStack_7e8 +
               fStack_348 * fVar247 + fStack_688 * fVar269 + fStack_4c8 * fVar286;
          auVar379._28_4_ = fVar298 + fVar271;
          auVar279._0_4_ =
               fVar394 * (float)local_800 +
               (float)local_120._0_4_ * fVar354 + fVar206 * fVar250 + fVar375 * fVar270;
          auVar279._4_4_ =
               fVar398 * local_800._4_4_ +
               (float)local_120._4_4_ * fVar222 + fVar219 * fVar253 + fVar383 * fVar272;
          auVar279._8_4_ =
               fVar399 * fStack_7f8 + fStack_118 * fVar362 + fVar220 * fVar262 + fVar384 * fVar282;
          auVar279._12_4_ =
               fVar400 * fStack_7f4 + fStack_114 * fVar243 + fVar221 * fVar264 + fVar386 * fVar283;
          auVar279._16_4_ =
               fVar394 * fStack_7f0 + fStack_110 * fVar364 + fVar206 * fVar266 + fVar225 * fVar284;
          auVar279._20_4_ =
               fVar398 * fStack_7ec + fStack_10c * fVar245 + fVar219 * fVar268 + fVar223 * fVar285;
          auVar279._24_4_ =
               fVar399 * fStack_7e8 + fStack_108 * fVar247 + fVar220 * fVar269 + fVar241 * fVar286;
          auVar279._28_4_ = fVar271 + fStack_4c4 + fStack_4c4 + *(float *)pauVar9[1];
          auVar333._0_4_ =
               fVar354 * (float)local_160._0_4_ +
               (float)local_a0._0_4_ * fVar250 + fVar270 * (float)local_140._0_4_ +
               (float)local_800 * (float)local_180._0_4_;
          auVar333._4_4_ =
               fVar222 * (float)local_160._4_4_ +
               (float)local_a0._4_4_ * fVar253 + fVar272 * (float)local_140._4_4_ +
               local_800._4_4_ * (float)local_180._4_4_;
          auVar333._8_4_ =
               fVar362 * fStack_158 + fStack_98 * fVar262 + fVar282 * fStack_138 +
               fStack_7f8 * fStack_178;
          auVar333._12_4_ =
               fVar243 * fStack_154 + fStack_94 * fVar264 + fVar283 * fStack_134 +
               fStack_7f4 * fStack_174;
          auVar333._16_4_ =
               fVar364 * fStack_150 + fStack_90 * fVar266 + fVar284 * fStack_130 +
               fStack_7f0 * fStack_170;
          auVar333._20_4_ =
               fVar245 * fStack_14c + fStack_8c * fVar268 + fVar285 * fStack_12c +
               fStack_7ec * fStack_16c;
          auVar333._24_4_ =
               fVar247 * fStack_148 + fStack_88 * fVar269 + fVar286 * fStack_128 +
               fStack_7e8 * fStack_168;
          auVar333._28_4_ = fStack_4c4 + fVar298 + fVar271;
          auVar378 = vsubps_avx(auVar379,auVar239);
          auVar40 = vsubps_avx(auVar279,local_780);
          fVar225 = auVar378._0_4_;
          fVar223 = auVar378._4_4_;
          auVar88._4_4_ = fVar223 * local_780._4_4_;
          auVar88._0_4_ = fVar225 * local_780._0_4_;
          fVar241 = auVar378._8_4_;
          auVar88._8_4_ = fVar241 * local_780._8_4_;
          fVar354 = auVar378._12_4_;
          auVar88._12_4_ = fVar354 * local_780._12_4_;
          fVar222 = auVar378._16_4_;
          auVar88._16_4_ = fVar222 * local_780._16_4_;
          fVar362 = auVar378._20_4_;
          auVar88._20_4_ = fVar362 * local_780._20_4_;
          fVar243 = auVar378._24_4_;
          auVar88._24_4_ = fVar243 * local_780._24_4_;
          auVar88._28_4_ = fVar271;
          fVar364 = auVar40._0_4_;
          fVar245 = auVar40._4_4_;
          auVar89._4_4_ = fVar245 * auVar239._4_4_;
          auVar89._0_4_ = fVar364 * auVar239._0_4_;
          fVar247 = auVar40._8_4_;
          auVar89._8_4_ = fVar247 * auVar239._8_4_;
          fVar270 = auVar40._12_4_;
          auVar89._12_4_ = fVar270 * auVar239._12_4_;
          fVar272 = auVar40._16_4_;
          auVar89._16_4_ = fVar272 * auVar239._16_4_;
          fVar282 = auVar40._20_4_;
          auVar89._20_4_ = fVar282 * auVar239._20_4_;
          fVar283 = auVar40._24_4_;
          auVar89._24_4_ = fVar283 * auVar239._24_4_;
          auVar89._28_4_ = auVar279._28_4_;
          auVar278 = vsubps_avx(auVar88,auVar89);
          auVar133._4_4_ = fVar175;
          auVar133._0_4_ = fVar224;
          auVar133._8_4_ = fVar178;
          auVar133._12_4_ = fVar181;
          auVar133._16_4_ = fVar182;
          auVar133._20_4_ = fVar183;
          auVar133._24_4_ = fVar184;
          auVar133._28_4_ = fVar185;
          auVar163 = vmaxps_avx(auVar133,auVar333);
          auVar90._4_4_ = auVar163._4_4_ * auVar163._4_4_ * (fVar223 * fVar223 + fVar245 * fVar245);
          auVar90._0_4_ = auVar163._0_4_ * auVar163._0_4_ * (fVar225 * fVar225 + fVar364 * fVar364);
          auVar90._8_4_ = auVar163._8_4_ * auVar163._8_4_ * (fVar241 * fVar241 + fVar247 * fVar247);
          auVar90._12_4_ =
               auVar163._12_4_ * auVar163._12_4_ * (fVar354 * fVar354 + fVar270 * fVar270);
          auVar90._16_4_ =
               auVar163._16_4_ * auVar163._16_4_ * (fVar222 * fVar222 + fVar272 * fVar272);
          auVar90._20_4_ =
               auVar163._20_4_ * auVar163._20_4_ * (fVar362 * fVar362 + fVar282 * fVar282);
          auVar90._24_4_ =
               auVar163._24_4_ * auVar163._24_4_ * (fVar243 * fVar243 + fVar283 * fVar283);
          auVar90._28_4_ = fVar298 + auVar279._28_4_;
          auVar91._4_4_ = auVar278._4_4_ * auVar278._4_4_;
          auVar91._0_4_ = auVar278._0_4_ * auVar278._0_4_;
          auVar91._8_4_ = auVar278._8_4_ * auVar278._8_4_;
          auVar91._12_4_ = auVar278._12_4_ * auVar278._12_4_;
          auVar91._16_4_ = auVar278._16_4_ * auVar278._16_4_;
          auVar91._20_4_ = auVar278._20_4_ * auVar278._20_4_;
          auVar91._24_4_ = auVar278._24_4_ * auVar278._24_4_;
          auVar91._28_4_ = auVar278._28_4_;
          auVar261 = ZEXT3264(auVar91);
          auVar163 = vcmpps_avx(auVar91,auVar90,2);
          local_2a0 = (uint)lVar150;
          auVar228 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar161 = vpor_avx(auVar228,_DAT_01f7fcf0);
          auVar228 = vpor_avx(auVar228,_DAT_01fafea0);
          auVar161 = vpcmpgtd_avx(_local_620,auVar161);
          auVar228 = vpcmpgtd_avx(_local_620,auVar228);
          auVar217._16_16_ = auVar228;
          auVar217._0_16_ = auVar161;
          auVar218 = ZEXT3264(auVar217);
          auVar278 = auVar217 & auVar163;
          fVar375 = (float)local_7a0._0_4_;
          fVar383 = (float)local_7a0._4_4_;
          fVar384 = fStack_798;
          fVar386 = fStack_794;
          fVar225 = fStack_790;
          fVar223 = fStack_78c;
          fVar241 = fStack_788;
          if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar278 >> 0x7f,0) != '\0') ||
                (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0xbf,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar278[0x1f] < '\0') {
            local_5e0._0_4_ = auVar144._0_4_;
            local_5e0._4_4_ = auVar144._4_4_;
            fStack_5d8 = auVar144._8_4_;
            fStack_5d4 = auVar144._12_4_;
            fStack_5d0 = auVar144._16_4_;
            fStack_5cc = auVar144._20_4_;
            fStack_5c8 = auVar144._24_4_;
            local_600._0_4_ = auVar143._0_4_;
            local_600._4_4_ = auVar143._4_4_;
            fStack_5f8 = auVar143._8_4_;
            fStack_5f4 = auVar143._12_4_;
            fStack_5f0 = auVar143._16_4_;
            fStack_5ec = auVar143._20_4_;
            fStack_5e8 = auVar143._24_4_;
            local_600._0_4_ =
                 (float)local_800 * (float)local_3a0._0_4_ +
                 (float)local_340._0_4_ * (float)local_5e0._0_4_ +
                 (float)local_c0._0_4_ * fVar250 + (float)local_740._0_4_ * (float)local_600._0_4_;
            local_600._4_4_ =
                 local_800._4_4_ * (float)local_3a0._4_4_ +
                 (float)local_340._4_4_ * (float)local_5e0._4_4_ +
                 (float)local_c0._4_4_ * fVar253 + (float)local_740._4_4_ * (float)local_600._4_4_;
            fStack_5f8 = fStack_7f8 * fStack_398 +
                         fStack_338 * fStack_5d8 + fStack_b8 * fVar262 + fStack_738 * fStack_5f8;
            fStack_5f4 = fStack_7f4 * fStack_394 +
                         fStack_334 * fStack_5d4 + fStack_b4 * fVar264 + fStack_734 * fStack_5f4;
            fStack_5f0 = fStack_7f0 * fStack_390 +
                         fStack_330 * fStack_5d0 + fStack_b0 * fVar266 + fStack_730 * fStack_5f0;
            fStack_5ec = fStack_7ec * fStack_38c +
                         fStack_32c * fStack_5cc + fStack_ac * fVar268 + fStack_72c * fStack_5ec;
            fStack_5e8 = fStack_7e8 * fStack_388 +
                         fStack_328 * fStack_5c8 + fStack_a8 * fVar269 + fStack_728 * fStack_5e8;
            fStack_5e4 = auVar333._28_4_ + pfVar1[7] + auVar163._28_4_ + 0.0;
            local_5a0._0_4_ = auVar140._0_4_;
            local_5a0._4_4_ = auVar140._4_4_;
            fStack_598 = auVar140._8_4_;
            fStack_594 = auVar140._12_4_;
            auStack_590._0_4_ = auVar140._16_4_;
            auStack_590._4_4_ = auVar140._20_4_;
            fStack_588 = auVar140._24_4_;
            local_5c0 = auVar139._0_4_;
            auStack_5bc._0_4_ = auVar139._4_4_;
            auStack_5bc._4_4_ = auVar139._8_4_;
            fStack_5b4 = auVar139._12_4_;
            fStack_5b0 = auVar139._16_4_;
            fStack_5ac = auVar139._20_4_;
            fStack_5a8 = auVar139._24_4_;
            pfVar1 = (float *)(lVar151 + 0x21b4e84 + lVar150 * 4);
            fVar354 = *pfVar1;
            fVar222 = pfVar1[1];
            fVar362 = pfVar1[2];
            fVar243 = pfVar1[3];
            fVar364 = pfVar1[4];
            fVar245 = pfVar1[5];
            fVar247 = pfVar1[6];
            pfVar2 = (float *)(lVar151 + 0x21b5308 + lVar150 * 4);
            fVar250 = *pfVar2;
            fVar253 = pfVar2[1];
            fVar262 = pfVar2[2];
            fVar264 = pfVar2[3];
            fVar266 = pfVar2[4];
            fVar268 = pfVar2[5];
            fVar269 = pfVar2[6];
            pfVar3 = (float *)(lVar151 + 0x21b4a00 + lVar150 * 4);
            fVar270 = *pfVar3;
            fVar272 = pfVar3[1];
            fVar282 = pfVar3[2];
            fVar283 = pfVar3[3];
            fVar284 = pfVar3[4];
            fVar285 = pfVar3[5];
            fVar286 = pfVar3[6];
            fVar186 = pfVar1[7] + pfVar2[7];
            fStack_4a4 = pfVar2[7] + fVar221 + 0.0;
            fVar299 = fVar221 + auVar379._28_4_ + fVar221 + 0.0;
            pfVar1 = (float *)(lVar151 + 0x21b457c + lVar150 * 4);
            fVar271 = *pfVar1;
            fVar298 = pfVar1[1];
            fVar242 = pfVar1[2];
            fVar244 = pfVar1[3];
            fVar246 = pfVar1[4];
            fVar248 = pfVar1[5];
            fVar251 = pfVar1[6];
            local_500 = (float)local_380._0_4_ * fVar271 +
                        (float)local_360._0_4_ * fVar270 +
                        fVar354 * (float)local_6a0._0_4_ + (float)local_4e0._0_4_ * fVar250;
            fStack_4fc = (float)local_380._4_4_ * fVar298 +
                         (float)local_360._4_4_ * fVar272 +
                         fVar222 * (float)local_6a0._4_4_ + (float)local_4e0._4_4_ * fVar253;
            fStack_4f8 = fStack_378 * fVar242 +
                         fStack_358 * fVar282 + fVar362 * fStack_698 + fStack_4d8 * fVar262;
            fStack_4f4 = fStack_374 * fVar244 +
                         fStack_354 * fVar283 + fVar243 * fStack_694 + fStack_4d4 * fVar264;
            fStack_4f0 = fStack_370 * fVar246 +
                         fStack_350 * fVar284 + fVar364 * fStack_690 + fStack_4d0 * fVar266;
            fStack_4ec = fStack_36c * fVar248 +
                         fStack_34c * fVar285 + fVar245 * fStack_68c + fStack_4cc * fVar268;
            fStack_4e8 = fStack_368 * fVar251 +
                         fStack_348 * fVar286 + fVar247 * fStack_688 + fStack_4c8 * fVar269;
            fStack_4e4 = fVar186 + fStack_4a4;
            local_4c0 = fVar271 * fVar394 +
                        fVar354 * fVar206 + (float)local_7a0._0_4_ * fVar250 +
                        (float)local_120._0_4_ * fVar270;
            fStack_4bc = fVar298 * fVar398 +
                         fVar222 * fVar219 + (float)local_7a0._4_4_ * fVar253 +
                         (float)local_120._4_4_ * fVar272;
            fStack_4b8 = fVar242 * fVar399 +
                         fVar362 * fVar220 + fStack_798 * fVar262 + fStack_118 * fVar282;
            fStack_4b4 = fVar244 * fVar400 +
                         fVar243 * fVar221 + fStack_794 * fVar264 + fStack_114 * fVar283;
            fStack_4b0 = fVar246 * fVar394 +
                         fVar364 * fVar206 + fStack_790 * fVar266 + fStack_110 * fVar284;
            fStack_4ac = fVar248 * fVar398 +
                         fVar245 * fVar219 + fStack_78c * fVar268 + fStack_10c * fVar285;
            fStack_4a8 = fVar251 * fVar399 +
                         fVar247 * fVar220 + fStack_788 * fVar269 + fStack_108 * fVar286;
            fStack_4a4 = fStack_4a4 + fVar299;
            auVar380._0_4_ =
                 fVar270 * (float)local_340._0_4_ +
                 (float)local_c0._0_4_ * fVar354 + (float)local_740._0_4_ * fVar250 +
                 fVar271 * (float)local_3a0._0_4_;
            auVar380._4_4_ =
                 fVar272 * (float)local_340._4_4_ +
                 (float)local_c0._4_4_ * fVar222 + (float)local_740._4_4_ * fVar253 +
                 fVar298 * (float)local_3a0._4_4_;
            auVar380._8_4_ =
                 fVar282 * fStack_338 + fStack_b8 * fVar362 + fStack_738 * fVar262 +
                 fVar242 * fStack_398;
            auVar380._12_4_ =
                 fVar283 * fStack_334 + fStack_b4 * fVar243 + fStack_734 * fVar264 +
                 fVar244 * fStack_394;
            auVar380._16_4_ =
                 fVar284 * fStack_330 + fStack_b0 * fVar364 + fStack_730 * fVar266 +
                 fVar246 * fStack_390;
            auVar380._20_4_ =
                 fVar285 * fStack_32c + fStack_ac * fVar245 + fStack_72c * fVar268 +
                 fVar248 * fStack_38c;
            auVar380._24_4_ =
                 fVar286 * fStack_328 + fStack_a8 * fVar247 + fStack_728 * fVar269 +
                 fVar251 * fStack_388;
            auVar380._28_4_ = pfVar3[7] + fVar186 + fVar299;
            pfVar1 = (float *)(lVar151 + 0x21b72a4 + lVar150 * 4);
            fVar354 = *pfVar1;
            fVar222 = pfVar1[1];
            fVar362 = pfVar1[2];
            fVar243 = pfVar1[3];
            fVar364 = pfVar1[4];
            fVar245 = pfVar1[5];
            fVar247 = pfVar1[6];
            pfVar2 = (float *)(lVar151 + 0x21b7728 + lVar150 * 4);
            fVar250 = *pfVar2;
            fVar253 = pfVar2[1];
            fVar262 = pfVar2[2];
            fVar264 = pfVar2[3];
            fVar266 = pfVar2[4];
            fVar268 = pfVar2[5];
            fVar269 = pfVar2[6];
            pfVar3 = (float *)(lVar151 + 0x21b6e20 + lVar150 * 4);
            fVar270 = *pfVar3;
            fVar272 = pfVar3[1];
            fVar282 = pfVar3[2];
            fVar283 = pfVar3[3];
            fVar284 = pfVar3[4];
            fVar285 = pfVar3[5];
            fVar286 = pfVar3[6];
            pfVar4 = (float *)(lVar151 + 0x21b699c + lVar150 * 4);
            fVar271 = *pfVar4;
            fVar298 = pfVar4[1];
            fVar242 = pfVar4[2];
            fVar244 = pfVar4[3];
            fVar246 = pfVar4[4];
            fVar248 = pfVar4[5];
            fVar251 = pfVar4[6];
            auVar334._0_4_ =
                 fVar271 * (float)local_380._0_4_ +
                 (float)local_360._0_4_ * fVar270 +
                 fVar354 * (float)local_6a0._0_4_ + (float)local_4e0._0_4_ * fVar250;
            auVar334._4_4_ =
                 fVar298 * (float)local_380._4_4_ +
                 (float)local_360._4_4_ * fVar272 +
                 fVar222 * (float)local_6a0._4_4_ + (float)local_4e0._4_4_ * fVar253;
            auVar334._8_4_ =
                 fVar242 * fStack_378 +
                 fStack_358 * fVar282 + fVar362 * fStack_698 + fStack_4d8 * fVar262;
            auVar334._12_4_ =
                 fVar244 * fStack_374 +
                 fStack_354 * fVar283 + fVar243 * fStack_694 + fStack_4d4 * fVar264;
            auVar334._16_4_ =
                 fVar246 * fStack_370 +
                 fStack_350 * fVar284 + fVar364 * fStack_690 + fStack_4d0 * fVar266;
            auVar334._20_4_ =
                 fVar248 * fStack_36c +
                 fStack_34c * fVar285 + fVar245 * fStack_68c + fStack_4cc * fVar268;
            auVar334._24_4_ =
                 fVar251 * fStack_368 +
                 fStack_348 * fVar286 + fVar247 * fStack_688 + fStack_4c8 * fVar269;
            auVar334._28_4_ = fStack_364 + fStack_364 + fStack_4c4 + fStack_4a4;
            auVar372._0_4_ =
                 fVar271 * fVar394 +
                 fVar270 * (float)local_120._0_4_ +
                 fVar354 * fVar206 + fVar250 * (float)local_7a0._0_4_;
            auVar372._4_4_ =
                 fVar298 * fVar398 +
                 fVar272 * (float)local_120._4_4_ +
                 fVar222 * fVar219 + fVar253 * (float)local_7a0._4_4_;
            auVar372._8_4_ =
                 fVar242 * fVar399 + fVar282 * fStack_118 + fVar362 * fVar220 + fVar262 * fStack_798
            ;
            auVar372._12_4_ =
                 fVar244 * fVar400 + fVar283 * fStack_114 + fVar243 * fVar221 + fVar264 * fStack_794
            ;
            auVar372._16_4_ =
                 fVar246 * fVar394 + fVar284 * fStack_110 + fVar364 * fVar206 + fVar266 * fStack_790
            ;
            auVar372._20_4_ =
                 fVar248 * fVar398 + fVar285 * fStack_10c + fVar245 * fVar219 + fVar268 * fStack_78c
            ;
            auVar372._24_4_ =
                 fVar251 * fVar399 + fVar286 * fStack_108 + fVar247 * fVar220 + fVar269 * fStack_788
            ;
            auVar372._28_4_ = fStack_364 + fStack_364 + fStack_104 + fStack_4a4;
            auVar280._8_4_ = 0x7fffffff;
            auVar280._0_8_ = 0x7fffffff7fffffff;
            auVar280._12_4_ = 0x7fffffff;
            auVar280._16_4_ = 0x7fffffff;
            auVar280._20_4_ = 0x7fffffff;
            auVar280._24_4_ = 0x7fffffff;
            auVar280._28_4_ = 0x7fffffff;
            auVar137._4_4_ = fStack_4fc;
            auVar137._0_4_ = local_500;
            auVar137._8_4_ = fStack_4f8;
            auVar137._12_4_ = fStack_4f4;
            auVar137._16_4_ = fStack_4f0;
            auVar137._20_4_ = fStack_4ec;
            auVar137._24_4_ = fStack_4e8;
            auVar137._28_4_ = fStack_4e4;
            auVar278 = vandps_avx(auVar137,auVar280);
            auVar138._4_4_ = fStack_4bc;
            auVar138._0_4_ = local_4c0;
            auVar138._8_4_ = fStack_4b8;
            auVar138._12_4_ = fStack_4b4;
            auVar138._16_4_ = fStack_4b0;
            auVar138._20_4_ = fStack_4ac;
            auVar138._24_4_ = fStack_4a8;
            auVar138._28_4_ = fStack_4a4;
            auVar41 = vandps_avx(auVar138,auVar280);
            auVar41 = vmaxps_avx(auVar278,auVar41);
            auVar278 = vandps_avx(auVar380,auVar280);
            auVar41 = vmaxps_avx(auVar41,auVar278);
            auVar41 = vcmpps_avx(auVar41,_local_3c0,1);
            auVar42 = vblendvps_avx(auVar137,auVar378,auVar41);
            auVar170._0_4_ =
                 fVar271 * (float)local_3a0._0_4_ +
                 fVar270 * (float)local_340._0_4_ +
                 fVar250 * (float)local_740._0_4_ + (float)local_c0._0_4_ * fVar354;
            auVar170._4_4_ =
                 fVar298 * (float)local_3a0._4_4_ +
                 fVar272 * (float)local_340._4_4_ +
                 fVar253 * (float)local_740._4_4_ + (float)local_c0._4_4_ * fVar222;
            auVar170._8_4_ =
                 fVar242 * fStack_398 +
                 fVar282 * fStack_338 + fVar262 * fStack_738 + fStack_b8 * fVar362;
            auVar170._12_4_ =
                 fVar244 * fStack_394 +
                 fVar283 * fStack_334 + fVar264 * fStack_734 + fStack_b4 * fVar243;
            auVar170._16_4_ =
                 fVar246 * fStack_390 +
                 fVar284 * fStack_330 + fVar266 * fStack_730 + fStack_b0 * fVar364;
            auVar170._20_4_ =
                 fVar248 * fStack_38c +
                 fVar285 * fStack_32c + fVar268 * fStack_72c + fStack_ac * fVar245;
            auVar170._24_4_ =
                 fVar251 * fStack_388 +
                 fVar286 * fStack_328 + fVar269 * fStack_728 + fStack_a8 * fVar247;
            auVar170._28_4_ = auVar278._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar43 = vblendvps_avx(auVar138,auVar40,auVar41);
            auVar278 = vandps_avx(auVar334,auVar280);
            auVar41 = vandps_avx(auVar372,auVar280);
            auVar41 = vmaxps_avx(auVar278,auVar41);
            auVar278 = vandps_avx(auVar170,auVar280);
            auVar278 = vmaxps_avx(auVar41,auVar278);
            local_760._0_4_ = auVar141._0_4_;
            local_760._4_4_ = auVar141._4_4_;
            uStack_758._0_4_ = auVar141._8_4_;
            uStack_758._4_4_ = auVar141._12_4_;
            auStack_750._0_4_ = auVar141._16_4_;
            auStack_750._4_4_ = auVar141._20_4_;
            fStack_748 = auVar141._24_4_;
            auVar278 = vcmpps_avx(auVar278,_local_3c0,1);
            auVar378 = vblendvps_avx(auVar334,auVar378,auVar278);
            auVar171._0_4_ =
                 (float)local_3a0._0_4_ * (float)local_760._0_4_ +
                 (float)local_340._0_4_ * (float)local_5a0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_5c0 + (float)local_740._0_4_ * fVar287;
            auVar171._4_4_ =
                 (float)local_3a0._4_4_ * (float)local_760._4_4_ +
                 (float)local_340._4_4_ * (float)local_5a0._4_4_ +
                 (float)local_c0._4_4_ * (float)auStack_5bc._0_4_ + (float)local_740._4_4_ * fVar321
            ;
            auVar171._8_4_ =
                 fStack_398 * (float)uStack_758 +
                 fStack_338 * fStack_598 +
                 fStack_b8 * (float)auStack_5bc._4_4_ + fStack_738 * fVar249;
            auVar171._12_4_ =
                 fStack_394 * uStack_758._4_4_ +
                 fStack_334 * fStack_594 + fStack_b4 * fStack_5b4 + fStack_734 * fVar352;
            auVar171._16_4_ =
                 fStack_390 * (float)auStack_750._0_4_ +
                 fStack_330 * (float)auStack_590._0_4_ +
                 fStack_b0 * fStack_5b0 + fStack_730 * fVar323;
            auVar171._20_4_ =
                 fStack_38c * (float)auStack_750._4_4_ +
                 fStack_32c * (float)auStack_590._4_4_ +
                 fStack_ac * fStack_5ac + fStack_72c * fVar325;
            auVar171._24_4_ =
                 fStack_388 * fStack_748 +
                 fStack_328 * fStack_588 + fStack_a8 * fStack_5a8 + fStack_728 * fVar252;
            auVar171._28_4_ = auVar41._28_4_ + fStack_5e4 + auVar163._28_4_ + 0.0;
            auVar278 = vblendvps_avx(auVar372,auVar40,auVar278);
            fVar186 = auVar42._0_4_;
            fVar299 = auVar42._4_4_;
            fVar319 = auVar42._8_4_;
            fVar320 = auVar42._12_4_;
            fVar322 = auVar42._16_4_;
            fVar324 = auVar42._20_4_;
            fVar326 = auVar42._24_4_;
            fVar337 = auVar42._28_4_;
            fVar270 = auVar378._0_4_;
            fVar282 = auVar378._4_4_;
            fVar284 = auVar378._8_4_;
            fVar286 = auVar378._12_4_;
            fVar321 = auVar378._16_4_;
            fVar352 = auVar378._20_4_;
            fVar325 = auVar378._24_4_;
            fVar354 = auVar43._0_4_;
            fVar362 = auVar43._4_4_;
            fVar364 = auVar43._8_4_;
            fVar247 = auVar43._12_4_;
            fVar253 = auVar43._16_4_;
            fVar264 = auVar43._20_4_;
            fVar268 = auVar43._24_4_;
            auVar348._0_4_ = fVar354 * fVar354 + fVar186 * fVar186;
            auVar348._4_4_ = fVar362 * fVar362 + fVar299 * fVar299;
            auVar348._8_4_ = fVar364 * fVar364 + fVar319 * fVar319;
            auVar348._12_4_ = fVar247 * fVar247 + fVar320 * fVar320;
            auVar348._16_4_ = fVar253 * fVar253 + fVar322 * fVar322;
            auVar348._20_4_ = fVar264 * fVar264 + fVar324 * fVar324;
            auVar348._24_4_ = fVar268 * fVar268 + fVar326 * fVar326;
            auVar348._28_4_ = fStack_344 + auVar40._28_4_;
            auVar40 = vrsqrtps_avx(auVar348);
            fVar222 = auVar40._0_4_;
            fVar243 = auVar40._4_4_;
            auVar92._4_4_ = fVar243 * 1.5;
            auVar92._0_4_ = fVar222 * 1.5;
            fVar245 = auVar40._8_4_;
            auVar92._8_4_ = fVar245 * 1.5;
            fVar250 = auVar40._12_4_;
            auVar92._12_4_ = fVar250 * 1.5;
            fVar262 = auVar40._16_4_;
            auVar92._16_4_ = fVar262 * 1.5;
            fVar266 = auVar40._20_4_;
            auVar92._20_4_ = fVar266 * 1.5;
            fVar269 = auVar40._24_4_;
            auVar92._24_4_ = fVar269 * 1.5;
            auVar92._28_4_ = auVar372._28_4_;
            auVar93._4_4_ = fVar243 * fVar243 * fVar243 * auVar348._4_4_ * 0.5;
            auVar93._0_4_ = fVar222 * fVar222 * fVar222 * auVar348._0_4_ * 0.5;
            auVar93._8_4_ = fVar245 * fVar245 * fVar245 * auVar348._8_4_ * 0.5;
            auVar93._12_4_ = fVar250 * fVar250 * fVar250 * auVar348._12_4_ * 0.5;
            auVar93._16_4_ = fVar262 * fVar262 * fVar262 * auVar348._16_4_ * 0.5;
            auVar93._20_4_ = fVar266 * fVar266 * fVar266 * auVar348._20_4_ * 0.5;
            auVar93._24_4_ = fVar269 * fVar269 * fVar269 * auVar348._24_4_ * 0.5;
            auVar93._28_4_ = auVar348._28_4_;
            auVar41 = vsubps_avx(auVar92,auVar93);
            fVar271 = auVar41._0_4_;
            fVar298 = auVar41._4_4_;
            fVar242 = auVar41._8_4_;
            fVar244 = auVar41._12_4_;
            fVar246 = auVar41._16_4_;
            fVar248 = auVar41._20_4_;
            fVar251 = auVar41._24_4_;
            fVar222 = auVar278._0_4_;
            fVar243 = auVar278._4_4_;
            fVar245 = auVar278._8_4_;
            fVar250 = auVar278._12_4_;
            fVar262 = auVar278._16_4_;
            fVar266 = auVar278._20_4_;
            fVar269 = auVar278._24_4_;
            auVar315._0_4_ = fVar222 * fVar222 + fVar270 * fVar270;
            auVar315._4_4_ = fVar243 * fVar243 + fVar282 * fVar282;
            auVar315._8_4_ = fVar245 * fVar245 + fVar284 * fVar284;
            auVar315._12_4_ = fVar250 * fVar250 + fVar286 * fVar286;
            auVar315._16_4_ = fVar262 * fVar262 + fVar321 * fVar321;
            auVar315._20_4_ = fVar266 * fVar266 + fVar352 * fVar352;
            auVar315._24_4_ = fVar269 * fVar269 + fVar325 * fVar325;
            auVar315._28_4_ = auVar40._28_4_ + auVar378._28_4_;
            auVar378 = vrsqrtps_avx(auVar315);
            fVar272 = auVar378._0_4_;
            fVar283 = auVar378._4_4_;
            auVar94._4_4_ = fVar283 * 1.5;
            auVar94._0_4_ = fVar272 * 1.5;
            fVar285 = auVar378._8_4_;
            auVar94._8_4_ = fVar285 * 1.5;
            fVar287 = auVar378._12_4_;
            auVar94._12_4_ = fVar287 * 1.5;
            fVar249 = auVar378._16_4_;
            auVar94._16_4_ = fVar249 * 1.5;
            fVar323 = auVar378._20_4_;
            auVar94._20_4_ = fVar323 * 1.5;
            fVar252 = auVar378._24_4_;
            auVar94._24_4_ = fVar252 * 1.5;
            auVar94._28_4_ = auVar372._28_4_;
            auVar95._4_4_ = fVar283 * fVar283 * fVar283 * auVar315._4_4_ * 0.5;
            auVar95._0_4_ = fVar272 * fVar272 * fVar272 * auVar315._0_4_ * 0.5;
            auVar95._8_4_ = fVar285 * fVar285 * fVar285 * auVar315._8_4_ * 0.5;
            auVar95._12_4_ = fVar287 * fVar287 * fVar287 * auVar315._12_4_ * 0.5;
            auVar95._16_4_ = fVar249 * fVar249 * fVar249 * auVar315._16_4_ * 0.5;
            auVar95._20_4_ = fVar323 * fVar323 * fVar323 * auVar315._20_4_ * 0.5;
            auVar95._24_4_ = fVar252 * fVar252 * fVar252 * auVar315._24_4_ * 0.5;
            auVar95._28_4_ = auVar315._28_4_;
            auVar40 = vsubps_avx(auVar94,auVar95);
            fVar272 = auVar40._0_4_;
            fVar283 = auVar40._4_4_;
            fVar285 = auVar40._8_4_;
            fVar287 = auVar40._12_4_;
            fVar249 = auVar40._16_4_;
            fVar323 = auVar40._20_4_;
            fVar252 = auVar40._24_4_;
            fVar354 = fVar224 * fVar271 * fVar354;
            fVar362 = fVar175 * fVar298 * fVar362;
            auVar96._4_4_ = fVar362;
            auVar96._0_4_ = fVar354;
            fVar364 = fVar178 * fVar242 * fVar364;
            auVar96._8_4_ = fVar364;
            fVar247 = fVar181 * fVar244 * fVar247;
            auVar96._12_4_ = fVar247;
            fVar253 = fVar182 * fVar246 * fVar253;
            auVar96._16_4_ = fVar253;
            fVar264 = fVar183 * fVar248 * fVar264;
            auVar96._20_4_ = fVar264;
            fVar268 = fVar184 * fVar251 * fVar268;
            auVar96._24_4_ = fVar268;
            auVar96._28_4_ = auVar378._28_4_;
            local_760._4_4_ = fVar362 + auVar239._4_4_;
            local_760._0_4_ = fVar354 + auVar239._0_4_;
            uStack_758._0_4_ = fVar364 + auVar239._8_4_;
            uStack_758._4_4_ = fVar247 + auVar239._12_4_;
            auStack_750._0_4_ = fVar253 + auVar239._16_4_;
            auStack_750._4_4_ = fVar264 + auVar239._20_4_;
            fStack_748 = fVar268 + auVar239._24_4_;
            fStack_744 = auVar378._28_4_ + auVar239._28_4_;
            local_680 = fVar224 * fVar271 * -fVar186;
            fStack_67c = fVar175 * fVar298 * -fVar299;
            auVar97._4_4_ = fStack_67c;
            auVar97._0_4_ = local_680;
            fStack_678 = fVar178 * fVar242 * -fVar319;
            auVar97._8_4_ = fStack_678;
            fStack_674 = fVar181 * fVar244 * -fVar320;
            auVar97._12_4_ = fStack_674;
            fStack_670 = fVar182 * fVar246 * -fVar322;
            auVar97._16_4_ = fStack_670;
            fStack_66c = fVar183 * fVar248 * -fVar324;
            auVar97._20_4_ = fStack_66c;
            fStack_668 = fVar184 * fVar251 * -fVar326;
            auVar97._24_4_ = fStack_668;
            auVar97._28_4_ = -fVar337;
            local_680 = local_780._0_4_ + local_680;
            fStack_67c = local_780._4_4_ + fStack_67c;
            fStack_678 = local_780._8_4_ + fStack_678;
            fStack_674 = local_780._12_4_ + fStack_674;
            fStack_670 = local_780._16_4_ + fStack_670;
            fStack_66c = local_780._20_4_ + fStack_66c;
            fStack_668 = local_780._24_4_ + fStack_668;
            fStack_664 = local_780._28_4_ + -fVar337;
            fVar354 = fVar271 * 0.0 * fVar224;
            fVar362 = fVar298 * 0.0 * fVar175;
            auVar98._4_4_ = fVar362;
            auVar98._0_4_ = fVar354;
            fVar364 = fVar242 * 0.0 * fVar178;
            auVar98._8_4_ = fVar364;
            fVar247 = fVar244 * 0.0 * fVar181;
            auVar98._12_4_ = fVar247;
            fVar253 = fVar246 * 0.0 * fVar182;
            auVar98._16_4_ = fVar253;
            fVar264 = fVar248 * 0.0 * fVar183;
            auVar98._20_4_ = fVar264;
            fVar268 = fVar251 * 0.0 * fVar184;
            auVar98._24_4_ = fVar268;
            auVar98._28_4_ = fVar337;
            auVar44 = vsubps_avx(auVar239,auVar96);
            auVar397._0_4_ = fVar354 + auVar171._0_4_;
            auVar397._4_4_ = fVar362 + auVar171._4_4_;
            auVar397._8_4_ = fVar364 + auVar171._8_4_;
            auVar397._12_4_ = fVar247 + auVar171._12_4_;
            auVar397._16_4_ = fVar253 + auVar171._16_4_;
            auVar397._20_4_ = fVar264 + auVar171._20_4_;
            auVar397._24_4_ = fVar268 + auVar171._24_4_;
            auVar397._28_4_ = fVar337 + auVar171._28_4_;
            fVar354 = auVar333._0_4_ * fVar272 * fVar222;
            fVar222 = auVar333._4_4_ * fVar283 * fVar243;
            auVar99._4_4_ = fVar222;
            auVar99._0_4_ = fVar354;
            fVar362 = auVar333._8_4_ * fVar285 * fVar245;
            auVar99._8_4_ = fVar362;
            fVar243 = auVar333._12_4_ * fVar287 * fVar250;
            auVar99._12_4_ = fVar243;
            fVar364 = auVar333._16_4_ * fVar249 * fVar262;
            auVar99._16_4_ = fVar364;
            fVar245 = auVar333._20_4_ * fVar323 * fVar266;
            auVar99._20_4_ = fVar245;
            fVar247 = auVar333._24_4_ * fVar252 * fVar269;
            auVar99._24_4_ = fVar247;
            auVar99._28_4_ = fVar185;
            auVar164 = vsubps_avx(local_780,auVar97);
            auVar381._0_4_ = auVar379._0_4_ + fVar354;
            auVar381._4_4_ = auVar379._4_4_ + fVar222;
            auVar381._8_4_ = auVar379._8_4_ + fVar362;
            auVar381._12_4_ = auVar379._12_4_ + fVar243;
            auVar381._16_4_ = auVar379._16_4_ + fVar364;
            auVar381._20_4_ = auVar379._20_4_ + fVar245;
            auVar381._24_4_ = auVar379._24_4_ + fVar247;
            auVar381._28_4_ = auVar379._28_4_ + fVar185;
            fVar354 = fVar272 * -fVar270 * auVar333._0_4_;
            fVar222 = fVar283 * -fVar282 * auVar333._4_4_;
            auVar100._4_4_ = fVar222;
            auVar100._0_4_ = fVar354;
            fVar362 = fVar285 * -fVar284 * auVar333._8_4_;
            auVar100._8_4_ = fVar362;
            fVar243 = fVar287 * -fVar286 * auVar333._12_4_;
            auVar100._12_4_ = fVar243;
            fVar364 = fVar249 * -fVar321 * auVar333._16_4_;
            auVar100._16_4_ = fVar364;
            fVar245 = fVar323 * -fVar352 * auVar333._20_4_;
            auVar100._20_4_ = fVar245;
            fVar247 = fVar252 * -fVar325 * auVar333._24_4_;
            auVar100._24_4_ = fVar247;
            auVar100._28_4_ = auVar239._28_4_;
            auVar165 = vsubps_avx(auVar171,auVar98);
            auVar259._0_4_ = auVar279._0_4_ + fVar354;
            auVar259._4_4_ = auVar279._4_4_ + fVar222;
            auVar259._8_4_ = auVar279._8_4_ + fVar362;
            auVar259._12_4_ = auVar279._12_4_ + fVar243;
            auVar259._16_4_ = auVar279._16_4_ + fVar364;
            auVar259._20_4_ = auVar279._20_4_ + fVar245;
            auVar259._24_4_ = auVar279._24_4_ + fVar247;
            auVar259._28_4_ = auVar279._28_4_ + auVar239._28_4_;
            fVar354 = fVar272 * 0.0 * auVar333._0_4_;
            fVar222 = fVar283 * 0.0 * auVar333._4_4_;
            auVar101._4_4_ = fVar222;
            auVar101._0_4_ = fVar354;
            fVar362 = fVar285 * 0.0 * auVar333._8_4_;
            auVar101._8_4_ = fVar362;
            fVar243 = fVar287 * 0.0 * auVar333._12_4_;
            auVar101._12_4_ = fVar243;
            fVar364 = fVar249 * 0.0 * auVar333._16_4_;
            auVar101._16_4_ = fVar364;
            fVar245 = fVar323 * 0.0 * auVar333._20_4_;
            auVar101._20_4_ = fVar245;
            fVar247 = fVar252 * 0.0 * auVar333._24_4_;
            auVar101._24_4_ = fVar247;
            auVar101._28_4_ = auVar171._28_4_;
            auVar378 = vsubps_avx(auVar379,auVar99);
            auVar335._0_4_ = (float)local_600._0_4_ + fVar354;
            auVar335._4_4_ = (float)local_600._4_4_ + fVar222;
            auVar335._8_4_ = fStack_5f8 + fVar362;
            auVar335._12_4_ = fStack_5f4 + fVar243;
            auVar335._16_4_ = fStack_5f0 + fVar364;
            auVar335._20_4_ = fStack_5ec + fVar245;
            auVar335._24_4_ = fStack_5e8 + fVar247;
            auVar335._28_4_ = fStack_5e4 + auVar171._28_4_;
            auVar278 = vsubps_avx(auVar279,auVar100);
            auVar41 = vsubps_avx(_local_600,auVar101);
            auVar42 = vsubps_avx(auVar259,auVar164);
            auVar43 = vsubps_avx(auVar335,auVar165);
            auVar102._4_4_ = auVar165._4_4_ * auVar42._4_4_;
            auVar102._0_4_ = auVar165._0_4_ * auVar42._0_4_;
            auVar102._8_4_ = auVar165._8_4_ * auVar42._8_4_;
            auVar102._12_4_ = auVar165._12_4_ * auVar42._12_4_;
            auVar102._16_4_ = auVar165._16_4_ * auVar42._16_4_;
            auVar102._20_4_ = auVar165._20_4_ * auVar42._20_4_;
            auVar102._24_4_ = auVar165._24_4_ * auVar42._24_4_;
            auVar102._28_4_ = auVar372._28_4_;
            auVar103._4_4_ = auVar164._4_4_ * auVar43._4_4_;
            auVar103._0_4_ = auVar164._0_4_ * auVar43._0_4_;
            auVar103._8_4_ = auVar164._8_4_ * auVar43._8_4_;
            auVar103._12_4_ = auVar164._12_4_ * auVar43._12_4_;
            auVar103._16_4_ = auVar164._16_4_ * auVar43._16_4_;
            auVar103._20_4_ = auVar164._20_4_ * auVar43._20_4_;
            auVar103._24_4_ = auVar164._24_4_ * auVar43._24_4_;
            auVar103._28_4_ = auVar279._28_4_;
            auVar45 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = auVar44._4_4_ * auVar43._4_4_;
            auVar104._0_4_ = auVar44._0_4_ * auVar43._0_4_;
            auVar104._8_4_ = auVar44._8_4_ * auVar43._8_4_;
            auVar104._12_4_ = auVar44._12_4_ * auVar43._12_4_;
            auVar104._16_4_ = auVar44._16_4_ * auVar43._16_4_;
            auVar104._20_4_ = auVar44._20_4_ * auVar43._20_4_;
            auVar104._24_4_ = auVar44._24_4_ * auVar43._24_4_;
            auVar104._28_4_ = auVar43._28_4_;
            auVar43 = vsubps_avx(auVar381,auVar44);
            auVar105._4_4_ = auVar165._4_4_ * auVar43._4_4_;
            auVar105._0_4_ = auVar165._0_4_ * auVar43._0_4_;
            auVar105._8_4_ = auVar165._8_4_ * auVar43._8_4_;
            auVar105._12_4_ = auVar165._12_4_ * auVar43._12_4_;
            auVar105._16_4_ = auVar165._16_4_ * auVar43._16_4_;
            auVar105._20_4_ = auVar165._20_4_ * auVar43._20_4_;
            auVar105._24_4_ = auVar165._24_4_ * auVar43._24_4_;
            auVar105._28_4_ = auVar40._28_4_;
            auVar47 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = auVar164._4_4_ * auVar43._4_4_;
            auVar106._0_4_ = auVar164._0_4_ * auVar43._0_4_;
            auVar106._8_4_ = auVar164._8_4_ * auVar43._8_4_;
            auVar106._12_4_ = auVar164._12_4_ * auVar43._12_4_;
            auVar106._16_4_ = auVar164._16_4_ * auVar43._16_4_;
            auVar106._20_4_ = auVar164._20_4_ * auVar43._20_4_;
            auVar106._24_4_ = auVar164._24_4_ * auVar43._24_4_;
            auVar106._28_4_ = auVar40._28_4_;
            auVar107._4_4_ = auVar44._4_4_ * auVar42._4_4_;
            auVar107._0_4_ = auVar44._0_4_ * auVar42._0_4_;
            auVar107._8_4_ = auVar44._8_4_ * auVar42._8_4_;
            auVar107._12_4_ = auVar44._12_4_ * auVar42._12_4_;
            auVar107._16_4_ = auVar44._16_4_ * auVar42._16_4_;
            auVar107._20_4_ = auVar44._20_4_ * auVar42._20_4_;
            auVar107._24_4_ = auVar44._24_4_ * auVar42._24_4_;
            auVar107._28_4_ = auVar42._28_4_;
            auVar40 = vsubps_avx(auVar107,auVar106);
            auVar200._0_4_ = auVar45._0_4_ * 0.0 + auVar40._0_4_ + auVar47._0_4_ * 0.0;
            auVar200._4_4_ = auVar45._4_4_ * 0.0 + auVar40._4_4_ + auVar47._4_4_ * 0.0;
            auVar200._8_4_ = auVar45._8_4_ * 0.0 + auVar40._8_4_ + auVar47._8_4_ * 0.0;
            auVar200._12_4_ = auVar45._12_4_ * 0.0 + auVar40._12_4_ + auVar47._12_4_ * 0.0;
            auVar200._16_4_ = auVar45._16_4_ * 0.0 + auVar40._16_4_ + auVar47._16_4_ * 0.0;
            auVar200._20_4_ = auVar45._20_4_ * 0.0 + auVar40._20_4_ + auVar47._20_4_ * 0.0;
            auVar200._24_4_ = auVar45._24_4_ * 0.0 + auVar40._24_4_ + auVar47._24_4_ * 0.0;
            auVar200._28_4_ = auVar45._28_4_ + auVar40._28_4_ + auVar47._28_4_;
            auVar39 = vcmpps_avx(auVar200,ZEXT832(0) << 0x20,2);
            auVar218 = ZEXT3264(auVar39);
            auVar378 = vblendvps_avx(auVar378,_local_760,auVar39);
            auVar240 = ZEXT3264(auVar378);
            auVar135._4_4_ = fStack_67c;
            auVar135._0_4_ = local_680;
            auVar135._8_4_ = fStack_678;
            auVar135._12_4_ = fStack_674;
            auVar135._16_4_ = fStack_670;
            auVar135._20_4_ = fStack_66c;
            auVar135._24_4_ = fStack_668;
            auVar135._28_4_ = fStack_664;
            auVar40 = vblendvps_avx(auVar278,auVar135,auVar39);
            auVar278 = vblendvps_avx(auVar41,auVar397,auVar39);
            auVar41 = vblendvps_avx(auVar44,auVar381,auVar39);
            auVar42 = vblendvps_avx(auVar164,auVar259,auVar39);
            auVar43 = vblendvps_avx(auVar165,auVar335,auVar39);
            auVar44 = vblendvps_avx(auVar381,auVar44,auVar39);
            auVar45 = vblendvps_avx(auVar259,auVar164,auVar39);
            auVar47 = vblendvps_avx(auVar335,auVar165,auVar39);
            local_780 = vandps_avx(auVar217,auVar163);
            auVar44 = vsubps_avx(auVar44,auVar378);
            auVar194 = vsubps_avx(auVar45,auVar40);
            auVar47 = vsubps_avx(auVar47,auVar278);
            auVar195 = vsubps_avx(auVar40,auVar42);
            fVar354 = auVar194._0_4_;
            fVar174 = auVar278._0_4_;
            fVar250 = auVar194._4_4_;
            fVar176 = auVar278._4_4_;
            auVar108._4_4_ = fVar176 * fVar250;
            auVar108._0_4_ = fVar174 * fVar354;
            fVar270 = auVar194._8_4_;
            fVar177 = auVar278._8_4_;
            auVar108._8_4_ = fVar177 * fVar270;
            fVar287 = auVar194._12_4_;
            fVar179 = auVar278._12_4_;
            auVar108._12_4_ = fVar179 * fVar287;
            fVar271 = auVar194._16_4_;
            fVar180 = auVar278._16_4_;
            auVar108._16_4_ = fVar180 * fVar271;
            fVar186 = auVar194._20_4_;
            fVar187 = auVar278._20_4_;
            auVar108._20_4_ = fVar187 * fVar186;
            fVar337 = auVar194._24_4_;
            fVar203 = auVar278._24_4_;
            auVar108._24_4_ = fVar203 * fVar337;
            auVar108._28_4_ = auVar45._28_4_;
            fVar222 = auVar40._0_4_;
            fVar204 = auVar47._0_4_;
            fVar253 = auVar40._4_4_;
            fVar205 = auVar47._4_4_;
            auVar109._4_4_ = fVar205 * fVar253;
            auVar109._0_4_ = fVar204 * fVar222;
            fVar272 = auVar40._8_4_;
            fVar254 = auVar47._8_4_;
            auVar109._8_4_ = fVar254 * fVar272;
            fVar321 = auVar40._12_4_;
            fVar263 = auVar47._12_4_;
            auVar109._12_4_ = fVar263 * fVar321;
            fVar298 = auVar40._16_4_;
            fVar265 = auVar47._16_4_;
            auVar109._16_4_ = fVar265 * fVar298;
            fVar299 = auVar40._20_4_;
            fVar267 = auVar47._20_4_;
            auVar109._20_4_ = fVar267 * fVar299;
            fVar338 = auVar40._24_4_;
            fVar288 = auVar47._24_4_;
            uVar12 = auVar164._28_4_;
            auVar109._24_4_ = fVar288 * fVar338;
            auVar109._28_4_ = uVar12;
            auVar45 = vsubps_avx(auVar109,auVar108);
            fVar362 = auVar378._0_4_;
            fVar262 = auVar378._4_4_;
            auVar110._4_4_ = fVar205 * fVar262;
            auVar110._0_4_ = fVar204 * fVar362;
            fVar282 = auVar378._8_4_;
            auVar110._8_4_ = fVar254 * fVar282;
            fVar249 = auVar378._12_4_;
            auVar110._12_4_ = fVar263 * fVar249;
            fVar242 = auVar378._16_4_;
            auVar110._16_4_ = fVar265 * fVar242;
            fVar319 = auVar378._20_4_;
            auVar110._20_4_ = fVar267 * fVar319;
            fVar339 = auVar378._24_4_;
            auVar110._24_4_ = fVar288 * fVar339;
            auVar110._28_4_ = uVar12;
            fVar243 = auVar44._0_4_;
            fVar264 = auVar44._4_4_;
            auVar111._4_4_ = fVar176 * fVar264;
            auVar111._0_4_ = fVar174 * fVar243;
            fVar283 = auVar44._8_4_;
            auVar111._8_4_ = fVar177 * fVar283;
            fVar352 = auVar44._12_4_;
            auVar111._12_4_ = fVar179 * fVar352;
            fVar244 = auVar44._16_4_;
            auVar111._16_4_ = fVar180 * fVar244;
            fVar320 = auVar44._20_4_;
            auVar111._20_4_ = fVar187 * fVar320;
            fVar340 = auVar44._24_4_;
            auVar111._24_4_ = fVar203 * fVar340;
            auVar111._28_4_ = auVar381._28_4_;
            auVar164 = vsubps_avx(auVar111,auVar110);
            auVar112._4_4_ = fVar253 * fVar264;
            auVar112._0_4_ = fVar222 * fVar243;
            auVar112._8_4_ = fVar272 * fVar283;
            auVar112._12_4_ = fVar321 * fVar352;
            auVar112._16_4_ = fVar298 * fVar244;
            auVar112._20_4_ = fVar299 * fVar320;
            auVar112._24_4_ = fVar338 * fVar340;
            auVar112._28_4_ = uVar12;
            auVar113._4_4_ = fVar262 * fVar250;
            auVar113._0_4_ = fVar362 * fVar354;
            auVar113._8_4_ = fVar282 * fVar270;
            auVar113._12_4_ = fVar249 * fVar287;
            auVar113._16_4_ = fVar242 * fVar271;
            auVar113._20_4_ = fVar319 * fVar186;
            auVar113._24_4_ = fVar339 * fVar337;
            auVar113._28_4_ = auVar165._28_4_;
            auVar165 = vsubps_avx(auVar113,auVar112);
            auVar196 = vsubps_avx(auVar278,auVar43);
            fVar245 = auVar165._28_4_ + auVar164._28_4_;
            auVar349._0_4_ = auVar165._0_4_ + auVar164._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
            auVar349._4_4_ = auVar165._4_4_ + auVar164._4_4_ * 0.0 + auVar45._4_4_ * 0.0;
            auVar349._8_4_ = auVar165._8_4_ + auVar164._8_4_ * 0.0 + auVar45._8_4_ * 0.0;
            auVar349._12_4_ = auVar165._12_4_ + auVar164._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
            auVar349._16_4_ = auVar165._16_4_ + auVar164._16_4_ * 0.0 + auVar45._16_4_ * 0.0;
            auVar349._20_4_ = auVar165._20_4_ + auVar164._20_4_ * 0.0 + auVar45._20_4_ * 0.0;
            auVar349._24_4_ = auVar165._24_4_ + auVar164._24_4_ * 0.0 + auVar45._24_4_ * 0.0;
            auVar349._28_4_ = fVar245 + auVar45._28_4_;
            fVar364 = auVar195._0_4_;
            fVar266 = auVar195._4_4_;
            auVar114._4_4_ = auVar43._4_4_ * fVar266;
            auVar114._0_4_ = auVar43._0_4_ * fVar364;
            fVar284 = auVar195._8_4_;
            auVar114._8_4_ = auVar43._8_4_ * fVar284;
            fVar323 = auVar195._12_4_;
            auVar114._12_4_ = auVar43._12_4_ * fVar323;
            fVar246 = auVar195._16_4_;
            auVar114._16_4_ = auVar43._16_4_ * fVar246;
            fVar322 = auVar195._20_4_;
            auVar114._20_4_ = auVar43._20_4_ * fVar322;
            fVar158 = auVar195._24_4_;
            auVar114._24_4_ = auVar43._24_4_ * fVar158;
            auVar114._28_4_ = fVar245;
            fVar245 = auVar196._0_4_;
            fVar268 = auVar196._4_4_;
            auVar115._4_4_ = auVar42._4_4_ * fVar268;
            auVar115._0_4_ = auVar42._0_4_ * fVar245;
            fVar285 = auVar196._8_4_;
            auVar115._8_4_ = auVar42._8_4_ * fVar285;
            fVar325 = auVar196._12_4_;
            auVar115._12_4_ = auVar42._12_4_ * fVar325;
            fVar248 = auVar196._16_4_;
            auVar115._16_4_ = auVar42._16_4_ * fVar248;
            fVar324 = auVar196._20_4_;
            auVar115._20_4_ = auVar42._20_4_ * fVar324;
            fVar159 = auVar196._24_4_;
            auVar115._24_4_ = auVar42._24_4_ * fVar159;
            auVar115._28_4_ = auVar165._28_4_;
            auVar164 = vsubps_avx(auVar115,auVar114);
            auVar165 = vsubps_avx(auVar378,auVar41);
            fVar247 = auVar165._0_4_;
            fVar269 = auVar165._4_4_;
            auVar116._4_4_ = auVar43._4_4_ * fVar269;
            auVar116._0_4_ = auVar43._0_4_ * fVar247;
            fVar286 = auVar165._8_4_;
            auVar116._8_4_ = auVar43._8_4_ * fVar286;
            fVar252 = auVar165._12_4_;
            auVar116._12_4_ = auVar43._12_4_ * fVar252;
            fVar251 = auVar165._16_4_;
            auVar116._16_4_ = auVar43._16_4_ * fVar251;
            fVar326 = auVar165._20_4_;
            auVar116._20_4_ = auVar43._20_4_ * fVar326;
            fVar173 = auVar165._24_4_;
            auVar116._24_4_ = auVar43._24_4_ * fVar173;
            auVar116._28_4_ = auVar43._28_4_;
            auVar117._4_4_ = fVar268 * auVar41._4_4_;
            auVar117._0_4_ = fVar245 * auVar41._0_4_;
            auVar117._8_4_ = fVar285 * auVar41._8_4_;
            auVar117._12_4_ = fVar325 * auVar41._12_4_;
            auVar117._16_4_ = fVar248 * auVar41._16_4_;
            auVar117._20_4_ = fVar324 * auVar41._20_4_;
            auVar117._24_4_ = fVar159 * auVar41._24_4_;
            auVar117._28_4_ = auVar45._28_4_;
            auVar43 = vsubps_avx(auVar116,auVar117);
            auVar118._4_4_ = auVar42._4_4_ * fVar269;
            auVar118._0_4_ = auVar42._0_4_ * fVar247;
            auVar118._8_4_ = auVar42._8_4_ * fVar286;
            auVar118._12_4_ = auVar42._12_4_ * fVar252;
            auVar118._16_4_ = auVar42._16_4_ * fVar251;
            auVar118._20_4_ = auVar42._20_4_ * fVar326;
            auVar118._24_4_ = auVar42._24_4_ * fVar173;
            auVar118._28_4_ = auVar42._28_4_;
            auVar119._4_4_ = fVar266 * auVar41._4_4_;
            auVar119._0_4_ = fVar364 * auVar41._0_4_;
            auVar119._8_4_ = fVar284 * auVar41._8_4_;
            auVar119._12_4_ = fVar323 * auVar41._12_4_;
            auVar119._16_4_ = fVar246 * auVar41._16_4_;
            auVar119._20_4_ = fVar322 * auVar41._20_4_;
            auVar119._24_4_ = fVar158 * auVar41._24_4_;
            auVar119._28_4_ = auVar41._28_4_;
            auVar41 = vsubps_avx(auVar119,auVar118);
            auVar172._0_4_ = auVar164._0_4_ * 0.0 + auVar41._0_4_ + auVar43._0_4_ * 0.0;
            auVar172._4_4_ = auVar164._4_4_ * 0.0 + auVar41._4_4_ + auVar43._4_4_ * 0.0;
            auVar172._8_4_ = auVar164._8_4_ * 0.0 + auVar41._8_4_ + auVar43._8_4_ * 0.0;
            auVar172._12_4_ = auVar164._12_4_ * 0.0 + auVar41._12_4_ + auVar43._12_4_ * 0.0;
            auVar172._16_4_ = auVar164._16_4_ * 0.0 + auVar41._16_4_ + auVar43._16_4_ * 0.0;
            auVar172._20_4_ = auVar164._20_4_ * 0.0 + auVar41._20_4_ + auVar43._20_4_ * 0.0;
            auVar172._24_4_ = auVar164._24_4_ * 0.0 + auVar41._24_4_ + auVar43._24_4_ * 0.0;
            auVar172._28_4_ = auVar43._28_4_ + auVar41._28_4_ + auVar43._28_4_;
            auVar41 = vmaxps_avx(auVar349,auVar172);
            auVar41 = vcmpps_avx(auVar41,ZEXT832(0) << 0x20,2);
            auVar261 = ZEXT3264(local_780);
            auVar42 = local_780 & auVar41;
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar42 >> 0x7f,0) == '\0') &&
                  (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0xbf,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar42[0x1f]) {
LAB_011bbdd9:
              auVar202._8_8_ = uStack_518;
              auVar202._0_8_ = local_520;
              auVar202._16_8_ = uStack_510;
              auVar202._24_8_ = uStack_508;
              auVar374._4_4_ = fVar175;
              auVar374._0_4_ = fVar224;
              auVar374._8_4_ = fVar178;
              auVar374._12_4_ = fVar181;
              auVar374._16_4_ = fVar182;
              auVar374._20_4_ = fVar183;
              auVar374._24_4_ = fVar184;
              auVar374._28_4_ = fVar185;
            }
            else {
              auVar42 = vandps_avx(auVar41,local_780);
              auVar120._4_4_ = fVar268 * fVar250;
              auVar120._0_4_ = fVar245 * fVar354;
              auVar120._8_4_ = fVar285 * fVar270;
              auVar120._12_4_ = fVar325 * fVar287;
              auVar120._16_4_ = fVar248 * fVar271;
              auVar120._20_4_ = fVar324 * fVar186;
              auVar120._24_4_ = fVar159 * fVar337;
              auVar120._28_4_ = local_780._28_4_;
              auVar121._4_4_ = fVar266 * fVar205;
              auVar121._0_4_ = fVar364 * fVar204;
              auVar121._8_4_ = fVar284 * fVar254;
              auVar121._12_4_ = fVar323 * fVar263;
              auVar121._16_4_ = fVar246 * fVar265;
              auVar121._20_4_ = fVar322 * fVar267;
              auVar121._24_4_ = fVar158 * fVar288;
              auVar121._28_4_ = auVar41._28_4_;
              auVar43 = vsubps_avx(auVar121,auVar120);
              auVar122._4_4_ = fVar269 * fVar205;
              auVar122._0_4_ = fVar247 * fVar204;
              auVar122._8_4_ = fVar286 * fVar254;
              auVar122._12_4_ = fVar252 * fVar263;
              auVar122._16_4_ = fVar251 * fVar265;
              auVar122._20_4_ = fVar326 * fVar267;
              auVar122._24_4_ = fVar173 * fVar288;
              auVar122._28_4_ = auVar47._28_4_;
              auVar123._4_4_ = fVar268 * fVar264;
              auVar123._0_4_ = fVar245 * fVar243;
              auVar123._8_4_ = fVar285 * fVar283;
              auVar123._12_4_ = fVar325 * fVar352;
              auVar123._16_4_ = fVar248 * fVar244;
              auVar123._20_4_ = fVar324 * fVar320;
              auVar123._24_4_ = fVar159 * fVar340;
              auVar123._28_4_ = auVar196._28_4_;
              auVar45 = vsubps_avx(auVar123,auVar122);
              auVar124._4_4_ = fVar266 * fVar264;
              auVar124._0_4_ = fVar364 * fVar243;
              auVar124._8_4_ = fVar284 * fVar283;
              auVar124._12_4_ = fVar323 * fVar352;
              auVar124._16_4_ = fVar246 * fVar244;
              auVar124._20_4_ = fVar322 * fVar320;
              auVar124._24_4_ = fVar158 * fVar340;
              auVar124._28_4_ = auVar44._28_4_;
              auVar125._4_4_ = fVar269 * fVar250;
              auVar125._0_4_ = fVar247 * fVar354;
              auVar125._8_4_ = fVar286 * fVar270;
              auVar125._12_4_ = fVar252 * fVar287;
              auVar125._16_4_ = fVar251 * fVar271;
              auVar125._20_4_ = fVar326 * fVar186;
              auVar125._24_4_ = fVar173 * fVar337;
              auVar125._28_4_ = auVar194._28_4_;
              auVar47 = vsubps_avx(auVar125,auVar124);
              auVar201._0_4_ = auVar43._0_4_ * 0.0 + auVar47._0_4_ + auVar45._0_4_ * 0.0;
              auVar201._4_4_ = auVar43._4_4_ * 0.0 + auVar47._4_4_ + auVar45._4_4_ * 0.0;
              auVar201._8_4_ = auVar43._8_4_ * 0.0 + auVar47._8_4_ + auVar45._8_4_ * 0.0;
              auVar201._12_4_ = auVar43._12_4_ * 0.0 + auVar47._12_4_ + auVar45._12_4_ * 0.0;
              auVar201._16_4_ = auVar43._16_4_ * 0.0 + auVar47._16_4_ + auVar45._16_4_ * 0.0;
              auVar201._20_4_ = auVar43._20_4_ * 0.0 + auVar47._20_4_ + auVar45._20_4_ * 0.0;
              auVar201._24_4_ = auVar43._24_4_ * 0.0 + auVar47._24_4_ + auVar45._24_4_ * 0.0;
              auVar201._28_4_ = auVar194._28_4_ + auVar47._28_4_ + auVar44._28_4_;
              auVar41 = vrcpps_avx(auVar201);
              fVar354 = auVar41._0_4_;
              fVar243 = auVar41._4_4_;
              auVar126._4_4_ = auVar201._4_4_ * fVar243;
              auVar126._0_4_ = auVar201._0_4_ * fVar354;
              fVar364 = auVar41._8_4_;
              auVar126._8_4_ = auVar201._8_4_ * fVar364;
              fVar245 = auVar41._12_4_;
              auVar126._12_4_ = auVar201._12_4_ * fVar245;
              fVar247 = auVar41._16_4_;
              auVar126._16_4_ = auVar201._16_4_ * fVar247;
              fVar250 = auVar41._20_4_;
              auVar126._20_4_ = auVar201._20_4_ * fVar250;
              fVar264 = auVar41._24_4_;
              auVar126._24_4_ = auVar201._24_4_ * fVar264;
              auVar126._28_4_ = auVar196._28_4_;
              auVar373._8_4_ = 0x3f800000;
              auVar373._0_8_ = 0x3f8000003f800000;
              auVar373._12_4_ = 0x3f800000;
              auVar373._16_4_ = 0x3f800000;
              auVar373._20_4_ = 0x3f800000;
              auVar373._24_4_ = 0x3f800000;
              auVar373._28_4_ = 0x3f800000;
              auVar41 = vsubps_avx(auVar373,auVar126);
              fVar354 = auVar41._0_4_ * fVar354 + fVar354;
              fVar243 = auVar41._4_4_ * fVar243 + fVar243;
              fVar364 = auVar41._8_4_ * fVar364 + fVar364;
              fVar245 = auVar41._12_4_ * fVar245 + fVar245;
              fVar247 = auVar41._16_4_ * fVar247 + fVar247;
              fVar250 = auVar41._20_4_ * fVar250 + fVar250;
              fVar264 = auVar41._24_4_ * fVar264 + fVar264;
              auVar127._4_4_ =
                   (fVar262 * auVar43._4_4_ + auVar45._4_4_ * fVar253 + auVar47._4_4_ * fVar176) *
                   fVar243;
              auVar127._0_4_ =
                   (fVar362 * auVar43._0_4_ + auVar45._0_4_ * fVar222 + auVar47._0_4_ * fVar174) *
                   fVar354;
              auVar127._8_4_ =
                   (fVar282 * auVar43._8_4_ + auVar45._8_4_ * fVar272 + auVar47._8_4_ * fVar177) *
                   fVar364;
              auVar127._12_4_ =
                   (fVar249 * auVar43._12_4_ + auVar45._12_4_ * fVar321 + auVar47._12_4_ * fVar179)
                   * fVar245;
              auVar127._16_4_ =
                   (fVar242 * auVar43._16_4_ + auVar45._16_4_ * fVar298 + auVar47._16_4_ * fVar180)
                   * fVar247;
              auVar127._20_4_ =
                   (fVar319 * auVar43._20_4_ + auVar45._20_4_ * fVar299 + auVar47._20_4_ * fVar187)
                   * fVar250;
              auVar127._24_4_ =
                   (fVar339 * auVar43._24_4_ + auVar45._24_4_ * fVar338 + auVar47._24_4_ * fVar203)
                   * fVar264;
              auVar127._28_4_ = auVar378._28_4_ + auVar40._28_4_ + auVar278._28_4_;
              auVar240 = ZEXT3264(auVar127);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar260._4_4_ = uVar12;
              auVar260._0_4_ = uVar12;
              auVar260._8_4_ = uVar12;
              auVar260._12_4_ = uVar12;
              auVar260._16_4_ = uVar12;
              auVar260._20_4_ = uVar12;
              auVar260._24_4_ = uVar12;
              auVar260._28_4_ = uVar12;
              auVar378 = vcmpps_avx(local_e0,auVar127,2);
              auVar40 = vcmpps_avx(auVar127,auVar260,2);
              auVar261 = ZEXT3264(auVar40);
              auVar378 = vandps_avx(auVar378,auVar40);
              auVar278 = auVar42 & auVar378;
              if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar278 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar278 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar278 >> 0x7f,0) == '\0') &&
                    (auVar278 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar278 >> 0xbf,0) == '\0') &&
                  (auVar278 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar278[0x1f]) goto LAB_011bbdd9;
              auVar378 = vandps_avx(auVar42,auVar378);
              auVar278 = vcmpps_avx(ZEXT832(0) << 0x20,auVar201,4);
              auVar41 = auVar378 & auVar278;
              auVar202._8_8_ = uStack_518;
              auVar202._0_8_ = local_520;
              auVar202._16_8_ = uStack_510;
              auVar202._24_8_ = uStack_508;
              auVar374._4_4_ = fVar175;
              auVar374._0_4_ = fVar224;
              auVar374._8_4_ = fVar178;
              auVar374._12_4_ = fVar181;
              auVar374._16_4_ = fVar182;
              auVar374._20_4_ = fVar183;
              auVar374._24_4_ = fVar184;
              auVar374._28_4_ = fVar185;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                auVar202 = vandps_avx(auVar278,auVar378);
                auVar128._4_4_ = fVar243 * auVar349._4_4_;
                auVar128._0_4_ = fVar354 * auVar349._0_4_;
                auVar128._8_4_ = fVar364 * auVar349._8_4_;
                auVar128._12_4_ = fVar245 * auVar349._12_4_;
                auVar128._16_4_ = fVar247 * auVar349._16_4_;
                auVar128._20_4_ = fVar250 * auVar349._20_4_;
                auVar128._24_4_ = fVar264 * auVar349._24_4_;
                auVar128._28_4_ = auVar40._28_4_;
                auVar129._4_4_ = auVar172._4_4_ * fVar243;
                auVar129._0_4_ = auVar172._0_4_ * fVar354;
                auVar129._8_4_ = auVar172._8_4_ * fVar364;
                auVar129._12_4_ = auVar172._12_4_ * fVar245;
                auVar129._16_4_ = auVar172._16_4_ * fVar247;
                auVar129._20_4_ = auVar172._20_4_ * fVar250;
                auVar129._24_4_ = auVar172._24_4_ * fVar264;
                auVar129._28_4_ = auVar172._28_4_;
                auVar294._8_4_ = 0x3f800000;
                auVar294._0_8_ = 0x3f8000003f800000;
                auVar294._12_4_ = 0x3f800000;
                auVar294._16_4_ = 0x3f800000;
                auVar294._20_4_ = 0x3f800000;
                auVar294._24_4_ = 0x3f800000;
                auVar294._28_4_ = 0x3f800000;
                auVar378 = vsubps_avx(auVar294,auVar128);
                local_1a0 = vblendvps_avx(auVar378,auVar128,auVar39);
                auVar378 = vsubps_avx(auVar294,auVar129);
                auVar261 = ZEXT3264(auVar378);
                _local_400 = vblendvps_avx(auVar378,auVar129,auVar39);
                local_1c0 = auVar127;
              }
            }
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar202 >> 0x7f,0) != '\0') ||
                  (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar202 >> 0xbf,0) != '\0') ||
                (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar202[0x1f] < '\0') {
              auVar378 = vsubps_avx(auVar333,auVar374);
              auVar240 = ZEXT3264(local_1a0);
              fVar222 = auVar374._0_4_ + auVar378._0_4_ * local_1a0._0_4_;
              fVar362 = auVar374._4_4_ + auVar378._4_4_ * local_1a0._4_4_;
              fVar243 = auVar374._8_4_ + auVar378._8_4_ * local_1a0._8_4_;
              fVar364 = auVar374._12_4_ + auVar378._12_4_ * local_1a0._12_4_;
              fVar245 = auVar374._16_4_ + auVar378._16_4_ * local_1a0._16_4_;
              fVar247 = auVar374._20_4_ + auVar378._20_4_ * local_1a0._20_4_;
              fVar250 = auVar374._24_4_ + auVar378._24_4_ * local_1a0._24_4_;
              fVar253 = auVar374._28_4_ + auVar378._28_4_;
              fVar354 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
              auVar218 = ZEXT3264(CONCAT428(fVar354,CONCAT424(fVar354,CONCAT420(fVar354,CONCAT416(
                                                  fVar354,CONCAT412(fVar354,CONCAT48(fVar354,
                                                  CONCAT44(fVar354,fVar354))))))));
              auVar130._4_4_ = (fVar362 + fVar362) * fVar354;
              auVar130._0_4_ = (fVar222 + fVar222) * fVar354;
              auVar130._8_4_ = (fVar243 + fVar243) * fVar354;
              auVar130._12_4_ = (fVar364 + fVar364) * fVar354;
              auVar130._16_4_ = (fVar245 + fVar245) * fVar354;
              auVar130._20_4_ = (fVar247 + fVar247) * fVar354;
              auVar130._24_4_ = (fVar250 + fVar250) * fVar354;
              auVar130._28_4_ = fVar253 + fVar253;
              auVar261 = ZEXT3264(local_1c0);
              auVar378 = vcmpps_avx(local_1c0,auVar130,6);
              auVar40 = auVar202 & auVar378;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                local_240 = vandps_avx(auVar378,auVar202);
                local_2e0 = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                fStack_2dc = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                fStack_2d8 = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                fStack_2d4 = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                fStack_2d0 = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                fStack_2cc = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                fStack_2c4 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_300 = local_1a0;
                local_2c0 = local_1c0;
                local_290 = local_710;
                uStack_288 = uStack_708;
                local_280 = local_630;
                uStack_278 = uStack_628;
                local_270 = local_640;
                uStack_268 = uStack_638;
                auVar218 = ZEXT1664(_local_650);
                local_260 = _local_650;
                pGVar155 = (context->scene->geometries).items[local_7a8].ptr;
                local_400._4_4_ = fStack_2dc;
                local_400._0_4_ = local_2e0;
                uStack_3f8._0_4_ = fStack_2d8;
                uStack_3f8._4_4_ = fStack_2d4;
                uStack_3f0._0_4_ = fStack_2d0;
                uStack_3f0._4_4_ = fStack_2cc;
                auVar142 = _local_400;
                uStack_3e8._0_4_ = fStack_2c8;
                uStack_3e8._4_4_ = fStack_2c4;
                auVar378 = _local_400;
                if ((pGVar155->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar148 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar148 = context->args;
                  if ((pRVar148->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar148 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar148 >> 8),1),
                     pGVar155->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_780._0_8_ = pGVar155;
                    auVar191._0_4_ = (float)(int)local_2a0;
                    auVar191._4_8_ = SUB128(ZEXT812(0),4);
                    auVar191._12_4_ = 0;
                    fVar225 = local_1a0._0_4_ + 0.0;
                    fVar223 = local_1a0._4_4_ + 1.0;
                    fVar241 = local_1a0._8_4_ + 2.0;
                    fVar354 = local_1a0._12_4_ + 3.0;
                    fVar222 = local_1a0._16_4_ + 4.0;
                    fVar362 = local_1a0._20_4_ + 5.0;
                    fVar243 = local_1a0._24_4_ + 6.0;
                    auVar218 = ZEXT3264(CONCAT428((float)local_1a0._28_4_ + 7.0,
                                                  CONCAT424(fVar243,CONCAT420(fVar362,CONCAT416(
                                                  fVar222,CONCAT412(fVar354,CONCAT48(fVar241,
                                                  CONCAT44(fVar223,fVar225))))))));
                    auVar161 = vshufps_avx(auVar191,auVar191,0);
                    local_220[0] = (auVar161._0_4_ + fVar225) * (float)local_100._0_4_;
                    local_220[1] = (auVar161._4_4_ + fVar223) * (float)local_100._4_4_;
                    local_220[2] = (auVar161._8_4_ + fVar241) * fStack_f8;
                    local_220[3] = (auVar161._12_4_ + fVar354) * fStack_f4;
                    fStack_210 = (auVar161._0_4_ + fVar222) * fStack_f0;
                    fStack_20c = (auVar161._4_4_ + fVar362) * fStack_ec;
                    fStack_208 = (auVar161._8_4_ + fVar243) * fStack_e8;
                    fStack_204 = auVar161._12_4_ + (float)local_1a0._28_4_ + 7.0;
                    uStack_3f0 = auVar142._16_8_;
                    uStack_3e8 = auVar378._24_8_;
                    local_200 = local_400;
                    uStack_1f8 = uStack_3f8;
                    uStack_1f0 = uStack_3f0;
                    uStack_1e8 = uStack_3e8;
                    local_1e0 = local_1c0;
                    iVar146 = vmovmskps_avx(local_240);
                    local_800 = CONCAT44((int)((ulong)pRVar148 >> 0x20),iVar146);
                    lVar157 = 0;
                    if (local_800 != 0) {
                      for (; (local_800 >> lVar157 & 1) == 0; lVar157 = lVar157 + 1) {
                      }
                    }
                    local_7e0 = (uint)lVar157;
                    uStack_7dc = (undefined4)((ulong)lVar157 >> 0x20);
                    _local_400 = auVar378;
                    if (iVar146 == 0) {
                      pRVar148 = (RTCIntersectArguments *)0x0;
LAB_011bbe02:
                    }
                    else {
                      auStack_6b0 = auVar279._16_16_;
                      local_6c0 = *local_700;
                      local_760._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      _local_5e0 = auVar163;
                      _local_5c0 = auVar379;
                      _local_5a0 = auVar217;
                      local_29c = uVar36;
                      do {
                        lVar157 = CONCAT44(uStack_7dc,local_7e0);
                        local_460 = local_220[lVar157];
                        local_450 = *(undefined4 *)((long)&local_200 + lVar157 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1e0 + lVar157 * 4);
                        fVar223 = 1.0 - local_460;
                        fVar241 = local_460 * (fVar223 + fVar223) - fVar223 * fVar223;
                        auVar261 = ZEXT464((uint)fVar241);
                        fVar225 = local_460 * 3.0;
                        auVar161 = ZEXT416((uint)((fVar223 * -2.0 * local_460 +
                                                  local_460 * local_460) * 0.5));
                        auVar161 = vshufps_avx(auVar161,auVar161,0);
                        auVar228 = ZEXT416((uint)(((fVar223 + fVar223) * (fVar225 + 2.0) +
                                                  fVar223 * fVar223 * -3.0) * 0.5));
                        auVar228 = vshufps_avx(auVar228,auVar228,0);
                        auVar229 = ZEXT416((uint)(((local_460 + local_460) * (fVar225 + -5.0) +
                                                  local_460 * fVar225) * 0.5));
                        auVar229 = vshufps_avx(auVar229,auVar229,0);
                        local_6f0.context = context->user;
                        auVar13 = vshufps_avx(ZEXT416((uint)(fVar241 * 0.5)),
                                              ZEXT416((uint)(fVar241 * 0.5)),0);
                        auVar208._0_4_ =
                             auVar13._0_4_ * (float)local_710._0_4_ +
                             auVar229._0_4_ * (float)local_630._0_4_ +
                             auVar161._0_4_ * (float)local_650._0_4_ +
                             auVar228._0_4_ * (float)local_640._0_4_;
                        auVar208._4_4_ =
                             auVar13._4_4_ * (float)local_710._4_4_ +
                             auVar229._4_4_ * (float)local_630._4_4_ +
                             auVar161._4_4_ * (float)local_650._4_4_ +
                             auVar228._4_4_ * (float)local_640._4_4_;
                        auVar208._8_4_ =
                             auVar13._8_4_ * (float)uStack_708 +
                             auVar229._8_4_ * (float)uStack_628 +
                             auVar161._8_4_ * fStack_648 + auVar228._8_4_ * (float)uStack_638;
                        auVar208._12_4_ =
                             auVar13._12_4_ * uStack_708._4_4_ +
                             auVar229._12_4_ * uStack_628._4_4_ +
                             auVar161._12_4_ * fStack_644 + auVar228._12_4_ * uStack_638._4_4_;
                        local_490 = (RTCHitN  [16])vshufps_avx(auVar208,auVar208,0);
                        local_480 = vshufps_avx(auVar208,auVar208,0x55);
                        auVar240 = ZEXT1664(local_480);
                        local_470 = vshufps_avx(auVar208,auVar208,0xaa);
                        auVar218 = ZEXT1664(local_470);
                        local_440 = local_660._0_8_;
                        uStack_438 = local_660._8_8_;
                        local_430 = local_310._0_8_;
                        uStack_428 = local_310._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_41c = (local_6f0.context)->instID[0];
                        local_420 = uStack_41c;
                        uStack_418 = uStack_41c;
                        uStack_414 = uStack_41c;
                        uStack_410 = (local_6f0.context)->instPrimID[0];
                        uStack_40c = uStack_410;
                        uStack_408 = uStack_410;
                        uStack_404 = uStack_410;
                        local_7c0 = local_6c0;
                        local_6f0.valid = (int *)local_7c0;
                        local_6f0.geometryUserPtr = pGVar155->userPtr;
                        local_6f0.hit = local_490;
                        local_6f0.N = 4;
                        local_6f0.ray = (RTCRayN *)ray;
                        fStack_45c = local_460;
                        fStack_458 = local_460;
                        fStack_454 = local_460;
                        uStack_44c = local_450;
                        uStack_448 = local_450;
                        uStack_444 = local_450;
                        if (pGVar155->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar218 = ZEXT1664(local_470);
                          auVar240 = ZEXT1664(local_480);
                          auVar261 = ZEXT464((uint)fVar241);
                          (*pGVar155->occlusionFilterN)(&local_6f0);
                        }
                        if (local_7c0 == (undefined1  [16])0x0) {
                          auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar161 = auVar161 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var38 = context->args->filter;
                          if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            (*p_Var38)(&local_6f0);
                          }
                          auVar228 = vpcmpeqd_avx(local_7c0,_DAT_01f7aa10);
                          auVar161 = auVar228 ^ _DAT_01f7ae20;
                          auVar209._8_4_ = 0xff800000;
                          auVar209._0_8_ = 0xff800000ff800000;
                          auVar209._12_4_ = 0xff800000;
                          auVar218 = ZEXT1664(auVar209);
                          auVar228 = vblendvps_avx(auVar209,*(undefined1 (*) [16])
                                                             (local_6f0.ray + 0x80),auVar228);
                          *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar228;
                        }
                        auVar192._8_8_ = 0x100000001;
                        auVar192._0_8_ = 0x100000001;
                        if ((auVar192 & auVar161) != (undefined1  [16])0x0) {
                          pRVar148 = (RTCIntersectArguments *)0x1;
                          goto LAB_011bbe02;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_760._0_4_;
                        local_800 = local_800 ^ 1L << ((ulong)local_7e0 & 0x3f);
                        lVar157 = 0;
                        if (local_800 != 0) {
                          for (; (local_800 >> lVar157 & 1) == 0; lVar157 = lVar157 + 1) {
                          }
                        }
                        local_7e0 = (uint)lVar157;
                        uStack_7dc = (undefined4)((ulong)lVar157 >> 0x20);
                        pRVar148 = (RTCIntersectArguments *)0x0;
                        pGVar155 = (Geometry *)local_780._0_8_;
                      } while (local_800 != 0);
                    }
                  }
                }
                bVar153 = (bool)(bVar153 | (byte)pRVar148);
                fVar375 = (float)local_7a0._0_4_;
                fVar383 = (float)local_7a0._4_4_;
                fVar384 = fStack_798;
                fVar386 = fStack_794;
                fVar225 = fStack_790;
                fVar223 = fStack_78c;
                fVar241 = fStack_788;
              }
            }
          }
          lVar150 = lVar150 + 8;
        } while ((int)lVar150 < (int)uVar36);
      }
      if (bVar153 != false) {
        return bVar153;
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar169._4_4_ = uVar12;
      auVar169._0_4_ = uVar12;
      auVar169._8_4_ = uVar12;
      auVar169._12_4_ = uVar12;
      auVar169._16_4_ = uVar12;
      auVar169._20_4_ = uVar12;
      auVar169._24_4_ = uVar12;
      auVar169._28_4_ = uVar12;
      auVar163 = vcmpps_avx(local_80,auVar169,2);
      uVar149 = vmovmskps_avx(auVar163);
      uVar145 = uVar145 & uVar145 + 0xff & uVar149;
    } while (uVar145 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }